

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverLines.cpp
# Opt level: O2

void setupAction<float>(vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                        *L1,vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                            *L2,Matrix<float,_64,_64,_0,_64,_64> *Action)

{
  pointer pMVar1;
  pointer pMVar2;
  Matrix<float,_64,_64,_0,_64,_64> *xpr;
  int iVar3;
  int primI;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int secI;
  int row;
  ulong uVar7;
  int iVar8;
  int iVar9;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
  aCStack_25758 [2];
  PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *pPStack_25748;
  undefined8 uStack_25740;
  undefined8 uStack_25738;
  undefined8 uStack_25730;
  Matrix<float,_15,_84,_0,_15,_84> M1;
  BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true> BStack_24378;
  float fStack_24344;
  float fStack_24340;
  float fStack_2433c;
  float fStack_24338;
  float fStack_24334;
  float fStack_24330;
  float fStack_2432c;
  float fStack_24328;
  float fStack_24324;
  float fStack_24320;
  float fStack_2431c;
  float fStack_24318;
  float fStack_24314;
  float fStack_24310;
  float fStack_2430c;
  float fStack_24308;
  float fStack_24304;
  float fStack_24300;
  float fStack_242fc;
  float fStack_242f8;
  float fStack_242f4;
  float fStack_242f0;
  float fStack_242ec;
  float fStack_242e8;
  float fStack_242e4;
  float fStack_242e0;
  float fStack_242dc;
  float fStack_242d8;
  float fStack_242d4;
  float fStack_242d0;
  float fStack_242cc;
  float fStack_242c8;
  float fStack_242c4;
  float fStack_242c0;
  float fStack_242bc;
  float fStack_242b8;
  float fStack_242b4;
  float fStack_242b0;
  float fStack_242ac;
  float fStack_242a8;
  float fStack_242a4;
  float fStack_242a0;
  float fStack_2429c;
  float fStack_24298;
  float fStack_24294;
  float fStack_24290;
  float fStack_2428c;
  float fStack_24288;
  float fStack_24284;
  float fStack_24280;
  float fStack_2427c;
  float fStack_24278;
  float fStack_24274;
  float fStack_24270;
  float fStack_2426c;
  Matrix<float,_64,_64,_0,_64,_64> *pMStack_24268;
  Matrix<float,_93,_157,_0,_93,_157> M2;
  vector<float,_std::allocator<float>_> m [6] [5] [3];
  Matrix<float,_15,_15,_0,_15,_15> BtB;
  Matrix<float,_93,_64,_0,_93,_64> M3;
  Matrix<float,_15,_60,_0,_15,_60> Bt;
  Matrix<float,_60,_15,_0,_60,_15> B;
  PartialPivLU<Eigen::Matrix<float,_93,_93,_0,_93,_93>_> lu;
  Matrix<float,_60,_84,_0,_60,_84> M1p;
  
  pMStack_24268 = Action;
  memset(m,0,0x870);
  for (uVar5 = 0; uVar5 != 6; uVar5 = uVar5 + 1) {
    for (uVar7 = 0; uVar7 != 6; uVar7 = uVar7 + 1) {
      if (uVar7 != uVar5) {
        pMVar1 = (L1->
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pMVar2 = (L2->
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar3 = (int)uVar7 - (uint)(uVar5 < uVar7);
        fillRow1<float>(pMVar1 + uVar5,pMVar2 + uVar5,pMVar1 + uVar7,pMVar2 + uVar7,m[uVar5][iVar3],
                        m[uVar5][iVar3] + 1,m[uVar5][iVar3] + 2);
      }
    }
  }
  Eigen::DenseBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<float,60,84,0,60,84>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,60,84,0,60,84>>>
            ((PlainObjectBase<Eigen::Matrix<float,60,84,0,60,84>> *)&M1p,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_60,_84,_0,_60,_84>_>_>
              *)&M2);
  iVar9 = 2;
  iVar8 = 0;
  iVar4 = 0;
  iVar3 = 1;
  for (row = 0; row != 0x3c; row = row + 1) {
    fillRow2<float>(&M1p,row,m[iVar8] + iVar4,m[iVar8] + iVar3,m[iVar8] + iVar9);
    if (iVar9 < 4) {
      iVar9 = iVar9 + 1;
    }
    else if (iVar3 < 3) {
      iVar9 = iVar3 + 2;
      iVar3 = iVar3 + 1;
    }
    else if (iVar4 < 2) {
      iVar3 = iVar4 + 2;
      iVar9 = iVar4 + 3;
      iVar4 = iVar4 + 1;
    }
    else {
      iVar8 = iVar8 + 1;
      iVar4 = 0;
      iVar9 = 2;
      iVar3 = 1;
    }
  }
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[6] =
       0.0;
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[7] =
       0.0;
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[8] =
       0.0;
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[9] =
       0.0;
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[10] =
       8.40779e-44;
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb] =
       0.0;
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array._0_8_
       = &M1p;
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array._16_8_
       = &M1p;
  Eigen::PlainObjectBase<Eigen::Matrix<float,60,15,0,60,15>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<float,60,84,0,60,84>,60,15,false>>
            ((PlainObjectBase<Eigen::Matrix<float,60,15,0,60,15>> *)&B,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_60,_15,_false>_> *)&M2
            );
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array._0_8_
       = (PlainObjectBase<Eigen::Matrix<float,60,15,0,60,15>> *)&B;
  Eigen::PlainObjectBase<Eigen::Matrix<float,15,60,0,15,60>>::
  _set_noalias<Eigen::Transpose<Eigen::Matrix<float,60,15,0,60,15>>>
            ((PlainObjectBase<Eigen::Matrix<float,15,60,0,15,60>> *)&Bt,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_60,_15,_0,_60,_15>_>_> *)&M2);
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array._0_8_
       = (PlainObjectBase<Eigen::Matrix<float,15,60,0,15,60>> *)&Bt;
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array._8_8_
       = (PlainObjectBase<Eigen::Matrix<float,60,15,0,60,15>> *)&B;
  Eigen::PlainObjectBase<Eigen::Matrix<float,15,15,0,15,15>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<float,15,60,0,15,60>,Eigen::Matrix<float,60,15,0,60,15>,0>>
            ((PlainObjectBase<Eigen::Matrix<float,15,15,0,15,15>> *)&BtB,
             (DenseBase<Eigen::Product<Eigen::Matrix<float,_15,_60,_0,_15,_60>,_Eigen::Matrix<float,_60,_15,_0,_60,_15>,_0>_>
              *)&M2);
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array._0_8_
       = (PlainObjectBase<Eigen::Matrix<float,15,15,0,15,15>> *)&BtB;
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array._8_8_
       = (PlainObjectBase<Eigen::Matrix<float,15,60,0,15,60>> *)&Bt;
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array._16_8_
       = &M1p;
  Eigen::PlainObjectBase<Eigen::Matrix<float,15,84,0,15,84>>::
  _set_noalias<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,15,15,0,15,15>>,Eigen::Matrix<float,15,60,0,15,60>,0>,Eigen::Matrix<float,60,84,0,60,84>,0>>
            ((PlainObjectBase<Eigen::Matrix<float,15,84,0,15,84>> *)&M1,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_15,_15,_0,_15,_15>_>,_Eigen::Matrix<float,_15,_60,_0,_15,_60>,_0>,_Eigen::Matrix<float,_60,_84,_0,_60,_84>,_0>_>
              *)&M2);
  Eigen::DenseBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>::Zero();
  xpr = pMStack_24268;
  Eigen::PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,93,157,0,93,157>>>
            ((PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M2,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_93,_157,_0,_93,_157>_>_>
              *)&lu);
  fStack_2426c = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0xe0];
  fStack_24270 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0xef];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x85b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xe0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8b8]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xef];
  fStack_24274 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0xfe];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x915]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xfe];
  fStack_24278 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x10d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x972]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x10d];
  fStack_2427c = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x11c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9cf]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x11c];
  fStack_24280 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[299];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa2c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [299];
  fStack_24284 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x13a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa89]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x13a];
  fStack_24288 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x149];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xae6]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x149];
  fStack_2428c = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x158];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb43]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x158];
  fStack_24290 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x167];
  fStack_24294 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x176];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xba0]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x167];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbfd]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x176];
  fStack_24298 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x185];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xc5a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x185];
  fStack_2429c = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x194];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xcb7]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x194];
  fStack_242a0 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x1a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xd14]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a3];
  fStack_242a4 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x1b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x12e4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b2];
  fStack_242a8 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x1c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1341] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c1];
  fStack_242ac = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x1d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x139e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d0];
  fStack_242b0 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x1df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13fb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1df];
  fStack_242b4 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x1ee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1458] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ee];
  fStack_242b8 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x1fd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14b5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fd];
  fStack_242bc = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x20c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1512] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20c];
  fStack_242c0 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x21b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x156f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21b];
  fStack_242c4 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x22a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15cc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22a];
  fStack_242c8 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x239];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1629] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x239];
  fStack_242cc = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x248];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1686] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x248];
  fStack_242d0 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[599];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16e3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[599];
  fStack_242d4 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x266];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1740] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x266];
  fStack_242d8 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x275];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x179d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x275];
  fStack_242dc = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x284];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17fa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x284];
  fStack_242e0 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x293];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1857] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x293];
  fStack_242e4 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x2a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18b4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a2];
  fStack_242e8 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x2b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1911] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b1];
  fStack_242ec = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x2c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x196e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c0];
  fStack_242f0 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x2cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19cb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cf];
  fStack_242f4 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x2ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ee1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ed];
  fStack_242f8 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x2fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f3e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fc];
  fStack_242fc = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x30b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f9b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30b];
  fStack_24300 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x31a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ff8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31a];
  fStack_24304 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x329];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2055] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x329];
  fStack_24308 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x338];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20b2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x338];
  fStack_2430c = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x347];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x210f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x347];
  fStack_24310 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x356];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x216c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x356];
  fStack_24330 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x2de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21c9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2de];
  fStack_24314 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x365];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2226] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x365];
  fStack_24318 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x374];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2283] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x374];
  fStack_2431c = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[899];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22e0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[899];
  fStack_24320 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x392];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x233d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x392];
  fStack_24324 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x3a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x239a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a1];
  fStack_24328 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x3b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23f7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b0];
  fStack_2432c = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x3bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2454] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bf];
  fStack_24334 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x3ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28b0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ce];
  fStack_24338 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x3dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x290d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3dd];
  fStack_2433c = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x3ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x296a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ec];
  fStack_24340 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x3fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29c7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fb];
  fStack_24344 = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data
                 .array[0x40a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a24] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a81] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x419];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ade] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x428];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b3b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x437];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b98] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x446];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bf5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x455];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f97] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x464];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ff4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x473];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3051] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x482];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x491];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x310b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3168] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3450] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x350a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3738] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x68b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xe0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6e8]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xef];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x745]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xfe];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x7a2]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x10d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x85c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x11c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8b9]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [299];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x916]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x13a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x973]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x149];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa2d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x158];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa8a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x167];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xae7]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x176];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xba1]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x185];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbfe]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x194];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xcb8]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10b7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1114] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1171] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11ce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x122b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1288] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1342] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x139f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13fc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1459] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x239];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14b6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x248];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1570] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[599];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15cd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x266];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x162a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x275];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1687] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x284];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1741] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x293];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x179e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17fb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18b5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1912] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19cc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d11] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d6e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dcb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e28] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e85] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x329];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[7999]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x338];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f9c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x347];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ff9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x356];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2056] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x365];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2110] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x374];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x216d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[899];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2227] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x392];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22e1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x233e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23f8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x273d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x279a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27f7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2854] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x290e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x296b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x419];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29c8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x428];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a82] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x437];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2adf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x446];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b99] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x455];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e81] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x464];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ede] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x473];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f3b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x482];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ff5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x491];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3052] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x310c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3397] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33f4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x230]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x80];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6e9]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x125];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x746]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x134];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x7a3]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x143];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8ba]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x152];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x917]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x161];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x974]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x170];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa8b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x17f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xae8]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x18e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbff]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x19d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe2d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe8a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xee7]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf44]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfa1]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xffe]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1115] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x206];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1172] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x215];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11cf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x224];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x122c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x233];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1289] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x242];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13a0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x251];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13fd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x260];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x145a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14b7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15ce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x162b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1688] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x179f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17fc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1913] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ae4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b41] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b9e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x305];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bfb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x314];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c58] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x323];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d6f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x332];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dcc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x341];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e29] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x350];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e86] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f9d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ffa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2057] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x216e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2228] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x233f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x256d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25ca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2627] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2684] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x279b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x404];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27f8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x413];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2855] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x422];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x296c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x431];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29c9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x440];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ae0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d0e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d6b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dc8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[11999]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x48b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f3c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3053] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3281] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33f5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3623] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x28e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x90];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6ea]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x126];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x747]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x135];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x7a4]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x144];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8bb]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x153];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x918]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x162];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x975]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x171];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa8c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x180];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xae9]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [399];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xc00]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x19e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe2e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe8b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xee8]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf45]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfa2]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfff]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1116] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x207];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1173] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x216];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11d0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x225];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x122d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x234];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x128a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x243];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13a1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x252];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13fe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x261];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x145b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x270];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14b8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15cf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x162c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1689] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17a0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[699];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17fd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1914] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ae5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b42] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b9f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x306];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bfc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x315];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c59] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x324];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d70] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x333];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dcd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x342];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e2a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x351];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e87] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x360];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f9e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ffb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2058] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x216f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2229] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2340] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x256e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25cb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2628] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[999];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2685] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x279c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x405];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27f9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x414];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2856] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x423];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x296d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x432];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29ca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x441];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ae1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x450];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d0f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d6c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dc9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[12000]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x48c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f3d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3054] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3282] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32df] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33f6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3624] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x2ec]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xa0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x68e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x118];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6eb]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x127];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x748]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x136];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x7a5]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x145];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8bc]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x154];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x919]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x163];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x976]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x172];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa8d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x181];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xaea]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [400];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xc01]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x19f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe2f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe8c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xee9]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf46]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfa3]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1000] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1117] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x208];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1174] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x217];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11d1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x226];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x122e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x235];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x128b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x244];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13a2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x253];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x262];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x145c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x271];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14b9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x280];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15d0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x162d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x168a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17a1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[700];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17fe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1915] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ae6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b43] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ba0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x307];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bfd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x316];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c5a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x325];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d71] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x334];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x343];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e2b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x352];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e88] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x361];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f9f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x370];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ffc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2059] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2170] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x222a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2341] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x256f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25cc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2629] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[1000];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2686] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x279d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x406];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27fa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x415];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2857] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x424];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x296e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x433];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29cb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x442];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ae2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x451];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d10] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x460];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d6d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ee1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f3e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3055] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3283] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32e0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33f7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3625] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x34a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xb0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x68f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x119];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6ec]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x128];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x749]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x137];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x7a6]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x146];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8bd]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x155];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x91a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x164];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x977]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x173];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa8e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x182];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xaeb]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x191];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xc02]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe30]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe8d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xeea]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf47]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfa4]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1001] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1118] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x209];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1175] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x218];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11d2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x227];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x122f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x236];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x128c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x245];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x254];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1400] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x263];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x145d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x272];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14ba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x281];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15d1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x290];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x162e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x168b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17a2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1916] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ae7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b44] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ba1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x308];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bfe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x317];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c5b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x326];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d72] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x335];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dcf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x344];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e2c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x353];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e89] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x362];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fa0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x371];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ffd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x380];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x205a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2171] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x222b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2342] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2570] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25cd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x262a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2687] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x279e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x407];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27fb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x416];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2858] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x425];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x296f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x434];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29cc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x443];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ae3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x452];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d11] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x461];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d6e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x470];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dcb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ee2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f3f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3056] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3284] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32e1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33f8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3626] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x405]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xd0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x690]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x11b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6ed]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x12a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x74a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x139];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x7a7]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x148];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8be]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x157];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x91b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x166];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x978]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x175];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa8f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x184];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xaec]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x193];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xc03]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe31]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe8e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xeeb]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf48]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfa5]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1002] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1119] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1176] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11d3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x229];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1230] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x238];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x128d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x247];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x256];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1401] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x265];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x145e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x274];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14bb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x283];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15d2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x292];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x162f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x168c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1800] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1917] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ae8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b45] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ba2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x319];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c5c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x328];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d73] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x337];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dd0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x346];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e2d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x355];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e8a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x364];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fa1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x373];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ffe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x382];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x205b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x391];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2172] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x222c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2343] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2571] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25ce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x262b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2688] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x279f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x409];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27fc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x418];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2859] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x427];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2970] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x436];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29cd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x445];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ae4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x454];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d12] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x463];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d6f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x472];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dcc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x481];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ee3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x490];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f40] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3057] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3285] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32e2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33f9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3627] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x463]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xe0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x691]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x11c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6ee]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [299];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x74b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x13a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x7a8]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x149];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8bf]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x158];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x91c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x167];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x979]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x176];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa90]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x185];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xaed]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x194];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xc04]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe32]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe8f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xeec]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf49]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfa6]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1003] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x111a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1177] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11d4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1231] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x239];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x128e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x248];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[599];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1402] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x266];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x145f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x275];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14bc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x284];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15d3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x293];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1630] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x168d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1801] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1918] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ae9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b46] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ba3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c00] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c5d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x329];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d74] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x338];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dd1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x347];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e2e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x356];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e8b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x365];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fa2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x374];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[899];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x205c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x392];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2173] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x222d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2344] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2572] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25cf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x262c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2689] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27a0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27fd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x419];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x285a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x428];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2971] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x437];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29ce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x446];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ae5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x455];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d13] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x464];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d70] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x473];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dcd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x482];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ee4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x491];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f41] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3058] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3286] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32e3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33fa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3628] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x3aa]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x80];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x692]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xe9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6ef]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xf8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x74c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x107];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x806]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x116];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x863]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x125];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8c0]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x134];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x91d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x143];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9d7]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x152];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa34]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x161];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa91]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x170];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb4b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x17f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xba8]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x18e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xc62]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x19d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1061] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10be] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x111b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1178] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11d5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1232] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x12ec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x206];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1349] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x215];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x224];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1403] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x233];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1460] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x242];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x151a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x251];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1577] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x260];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15d4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1631] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16eb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1748] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x185f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18bc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1976] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cbb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d18] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d75] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x305];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dd2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x314];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e2f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x323];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ee9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x332];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f46] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x341];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fa3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x350];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2000] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20ba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2117] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2174] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x228b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22e8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23a2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26e7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2744] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27a1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27fe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28b8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x404];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2915] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x413];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2972] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x422];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a2c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x431];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a89] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x440];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b43] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e2b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e88] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ee5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f9f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ffc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30b6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3341] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x339e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3458] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3686] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x408]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x90];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x693]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6f0]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xf9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x74d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x108];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x807]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x117];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x864]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x126];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8c1]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x135];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x91e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x144];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9d8]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x153];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa35]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x162];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa92]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x171];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb4c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x180];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xba9]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [399];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xc63]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x19e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1062] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10bf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x111c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1179] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11d6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1233] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x12ed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x207];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x134a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x216];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x225];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1404] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x234];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1461] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x243];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x151b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x252];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1578] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x261];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15d5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x270];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1632] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16ec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1749] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1860] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[699];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18bd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1977] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cbc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d19] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d76] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x306];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dd3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x315];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e30] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x324];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x333];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f47] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x342];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fa4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x351];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2001] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x360];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20bb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2118] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2175] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x228c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22e9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26e8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2745] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27a2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[999];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28b9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x405];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2916] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x414];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2973] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x423];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a2d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x432];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a8a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x441];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b44] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x450];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e2c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e89] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ee6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fa0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ffd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30b7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3342] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x339f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3459] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3687] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x466]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xa0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x694]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xeb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6f1]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xfa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x74e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x109];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x808]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x118];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x865]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x127];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8c2]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x136];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x91f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x145];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9d9]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x154];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa36]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x163];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa93]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x172];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb4d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x181];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbaa]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [400];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xc64]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x19f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1063] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10c0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x111d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x117a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11d7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1234] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x12ee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x208];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x134b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x217];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x226];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1405] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x235];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1462] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x244];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x151c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x253];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1579] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x262];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15d6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x271];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1633] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x280];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16ed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x174a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1861] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[700];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18be] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1978] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cbd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d1a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d77] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x307];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dd4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x316];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e31] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x325];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eeb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x334];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f48] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x343];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fa5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x352];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2002] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x361];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20bc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x370];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2119] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2176] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x228d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22ea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26e9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2746] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[1000];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2800] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28ba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x406];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2917] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x415];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2974] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x424];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a2e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x433];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a8b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x442];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b45] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x451];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e2d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x460];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e8a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ee7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fa1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ffe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30b8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3343] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33a0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x345a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3688] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x4c4]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xb0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x695]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6f2]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xfb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x74f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x10a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x809]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x119];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x866]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x128];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8c3]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x137];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x920]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x146];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9da]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x155];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa37]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x164];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa94]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x173];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb4e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x182];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbab]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x191];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xc65]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1064] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10c1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x111e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x117b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11d8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1235] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x12ef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x209];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x134c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x218];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x227];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1406] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x236];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1463] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x245];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x151d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x254];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x157a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x263];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15d7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x272];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1634] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x281];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16ee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x290];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x174b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1862] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18bf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1979] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cbe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d1b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d78] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x308];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dd5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x317];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e32] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x326];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x335];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f49] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x344];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fa6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x353];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2003] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x362];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20bd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x371];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x211a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x380];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2177] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x228e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22eb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26ea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2747] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2801] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28bb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x407];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2918] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x416];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2975] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x425];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a2f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x434];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a8c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x443];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b46] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x452];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e2e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x461];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e8b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x470];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ee8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fa2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30b9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3344] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33a1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x345b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3689] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x522]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xc0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x696]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6f3]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xfc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x750]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x10b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x80a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x11a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x867]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x129];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8c4]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x138];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x921]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x147];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9db]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x156];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa38]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x165];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa95]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x174];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb4f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x183];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbac]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x192];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xc66]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1065] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10c2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x111f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x117c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1236] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x12f0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x134d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x219];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13aa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x228];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1407] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x237];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1464] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x246];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x151e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x255];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x157b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x264];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15d8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x273];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1635] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x282];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16ef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x291];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x174c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1863] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18c0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x197a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cbf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d1c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d79] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x309];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dd6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x318];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e33] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x327];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x336];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f4a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x345];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fa7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x354];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2004] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x363];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20be] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x372];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x211b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x381];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2178] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x390];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x228f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22ec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26eb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2748] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2802] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28bc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x408];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2919] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x417];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2976] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x426];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a30] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x435];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a8d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x444];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b47] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x453];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e2f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x462];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e8c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x471];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ee9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x480];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fa3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3000] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30ba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3345] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33a2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x345c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x368a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x5dd]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xd0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x697]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6f4]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xfd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x751]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x10c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x80b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x11b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x868]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x12a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8c5]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x139];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x922]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x148];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9dc]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x157];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa39]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x166];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa96]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x175];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb50]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x184];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbad]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x193];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xc67]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1066] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10c3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1120] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x117d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1237] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x12f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x134e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x229];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1408] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x238];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1465] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x247];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x151f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x256];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x157c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x265];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x274];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1636] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x283];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16f0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x292];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x174d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17aa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1864] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18c1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x197b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cc0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d1d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d7a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dd7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x319];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e34] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x328];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x337];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f4b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x346];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fa8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x355];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2005] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x364];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20bf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x373];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x211c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x382];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2179] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x391];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2290] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22ed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26ec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2749] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2803] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28bd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x409];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x291a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x418];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2977] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x427];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a31] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x436];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a8e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x445];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b48] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x454];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e30] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x463];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e8d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x472];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x481];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fa4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x490];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3001] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30bb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3346] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x345d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x368b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x63b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xe0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x698]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xef];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6f5]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xfe];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x752]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x10d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x80c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x11c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x869]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [299];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8c6]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x13a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x923]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x149];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9dd]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x158];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa3a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x167];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa97]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x176];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb51]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x185];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbae]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x194];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xc68]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1067] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10c4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1121] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x117e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11db] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1238] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x12f2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x134f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13ac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1409] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x239];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1466] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x248];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1520] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[599];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x157d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x266];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x275];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1637] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x284];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x293];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x174e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1865] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18c2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x197c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cc1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d1e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d7b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dd8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e35] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x329];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x338];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f4c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x347];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fa9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x356];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2006] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x365];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20c0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x374];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x211d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[899];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x217a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x392];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2291] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22ee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26ed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x274a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2804] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28be] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x291b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x419];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2978] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x428];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a32] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x437];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a8f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x446];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b49] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x455];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e31] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x464];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e8e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x473];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eeb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x482];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fa5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x491];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3002] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30bc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3347] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x345e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x368c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf] =
       M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
       [0x20];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x699]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x11f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6f6]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x12e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x753]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x13d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x86a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x14c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8c7]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x15b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x924]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x16a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa3b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x179];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa98]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x188];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbaf]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x197];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xddd]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe3a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe97]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xef4]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf51]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfae]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1f1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10c5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x200];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1122] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x117f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1239] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1350] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x140a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x269];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1467] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x278];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x157e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x287];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15db] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x296];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1638] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x174f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17ac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18c3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a94] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1af1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b4e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ff];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c08] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d1f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d7c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dd9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e36] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x359];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f4d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x368];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1faa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x377];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2007] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x386];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x211e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x395];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x217b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22ef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x251d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x257a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25d7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2634] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ef];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x274b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fe];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2805] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x291c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2979] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a90] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x449];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cbe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x458];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d1b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x467];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d78] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x476];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e8f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x485];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x494];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3003] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3231] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x328e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35d3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x30];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x69a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x120];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6f7]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x12f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x754]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x13e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x86b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x14d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8c8]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x15c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x925]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x16b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa3c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x17a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa99]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x189];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbb0]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x198];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xdde]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe3b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe98]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xef5]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf52]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfaf]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10c6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x201];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1123] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x210];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1180] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11dd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x123a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1351] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x140b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1468] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x279];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x157f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x288];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x297];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1639] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1750] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18c4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a95] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1af2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b4f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x300];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c09] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d20] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d7d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dda] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e37] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f4e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x369];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x378];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2008] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x387];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x211f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x396];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x217c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22f0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x251e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x257b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25d8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2635] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x274c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ff];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2806] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x291d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x297a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a91] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cbf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x459];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d1c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x468];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d79] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x477];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e90] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x486];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x495];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3004] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3232] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x328f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35d4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xcb]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x40];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x69b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x121];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6f8]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x130];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x755]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x13f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x86c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x14e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8c9]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x15d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x926]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x16c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa3d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x17b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa9a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x18a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbb1]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x199];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xddf]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe3c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe99]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xef6]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf53]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfb0]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [499];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10c7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x202];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1124] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x211];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1181] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x220];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x123b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1352] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13af] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x140c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1469] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1580] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x289];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15dd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x298];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x163a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1751] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18c5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a96] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1af3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b50] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x301];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x310];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c0a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[799];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d21] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d7e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ddb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e38] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f4f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x379];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2009] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x388];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2120] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x397];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x217d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x251f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x257c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2636] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x274d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x400];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27aa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2807] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x291e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x297b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a92] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[1099];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cc0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d1d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x469];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d7a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x478];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e91] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x487];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x496];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3005] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3233] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3290] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35d5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x129]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x50];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x69c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x122];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6f9]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x131];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x756]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x140];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x86d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x14f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8ca]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x15e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x927]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x16d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa3e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x17c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa9b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x18b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbb2]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x19a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xde0]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe3d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe9a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xef7]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf54]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfb1]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [500];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10c8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x203];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1125] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x212];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1182] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x221];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11df] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x230];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x123c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1353] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13b0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x140d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x146a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1581] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x299];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x163b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1752] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17af] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18c6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a97] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1af4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b51] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x302];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x311];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c0b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[800];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d22] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d7f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ddc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e39] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f50] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x200a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x389];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2121] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x398];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x217e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22f2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2520] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x257d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2637] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x274e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x401];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x410];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2808] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x291f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x297c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a93] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cc1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d1e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d7b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x479];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e92] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x488];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x497];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3006] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3234] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3291] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35d6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x187]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x70];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x69d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x124];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6fa]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x133];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x757]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x142];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x86e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x151];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8cb]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x160];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x928]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x16f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa3f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x17e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa9c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x18d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbb3]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x19c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xde1]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe3e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe9b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xef8]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf55]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfb2]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10c9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x205];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1126] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x214];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1183] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x223];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11e0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x232];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x123d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x241];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1354] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x250];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13b1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x140e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x146b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1582] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15df] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x163c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1753] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17b0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18c7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a98] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1af5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b52] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x304];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1baf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x313];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c0c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x322];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d23] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x331];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d80] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x340];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ddd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e3a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f51] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x200b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2122] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x217f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22f3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2521] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x257e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25db] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2638] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x274f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x403];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27ac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x412];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2809] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x421];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2920] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x430];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x297d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a94] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cc2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d1f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d7c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e93] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ef0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x499];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3007] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3235] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3292] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35d7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x1e5]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x80];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x69e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x125];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6fb]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x134];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x758]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x143];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x86f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x152];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8cc]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x161];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x929]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x170];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa40]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x17f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa9d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x18e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbb4]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x19d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xde2]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe3f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe9c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xef9]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf56]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfb3]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10ca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x206];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1127] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x215];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1184] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x224];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11e1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x233];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x123e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x242];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1355] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x251];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13b2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x260];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x140f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x146c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1583] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15e0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x163d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1754] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17b1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18c8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a99] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1af6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b53] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x305];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bb0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x314];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c0d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x323];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d24] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x332];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d81] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x341];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dde] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x350];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e3b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f52] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1faf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x200c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2123] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2180] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22f4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2522] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x257f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2639] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2750] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x404];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x413];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x280a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x422];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2921] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x431];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x297e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x440];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a95] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cc3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d20] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d7d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e94] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ef1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3008] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3236] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3293] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33aa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35d8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x243]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x90];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x69f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x126];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6fc]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x135];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x759]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x144];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x870]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x153];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8cd]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x162];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x92a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x171];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa41]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x180];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa9e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [399];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbb5]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x19e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xde3]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe40]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe9d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xefa]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf57]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfb4]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10cb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x207];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1128] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x216];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1185] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x225];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11e2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x234];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x123f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x243];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1356] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x252];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13b3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x261];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1410] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x270];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x146d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1584] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15e1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x163e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1755] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[699];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17b2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18c9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a9a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1af7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b54] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x306];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bb1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x315];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c0e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x324];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d25] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x333];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d82] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x342];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ddf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x351];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e3c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x360];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f53] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fb0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x200d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2124] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2181] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22f5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2523] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2580] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25dd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[999];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x263a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2751] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x405];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x414];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x280b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x423];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2922] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x432];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x297f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x441];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a96] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x450];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cc4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d21] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d7e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e95] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ef2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3009] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3237] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3294] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x2a1]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xa0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6a0]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x127];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6fd]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x136];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x75a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x145];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x871]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x154];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8ce]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x163];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x92b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x172];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa42]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x181];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa9f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [400];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbb6]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x19f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xde4]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe41]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe9e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xefb]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf58]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfb5]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10cc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x208];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1129] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x217];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1186] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x226];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11e3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x235];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1240] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x244];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1357] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x253];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13b4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x262];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1411] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x271];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x146e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x280];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1585] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15e2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x163f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1756] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[700];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17b3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18ca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a9b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1af8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b55] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x307];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bb2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x316];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c0f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x325];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d26] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x334];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d83] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x343];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1de0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x352];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e3d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x361];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f54] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x370];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fb1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x200e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2125] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2182] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22f6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2524] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2581] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[1000];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x263b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2752] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x406];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27af] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x415];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x280c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x424];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2923] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x433];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2980] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x442];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a97] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x451];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cc5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x460];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d22] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d7f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e96] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ef3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x300a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3238] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3295] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33ac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x2ff]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xb0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6a1]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x128];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6fe]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x137];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x75b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x146];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x872]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x155];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8cf]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x164];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x92c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x173];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa43]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x182];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xaa0]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x191];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[2999]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xde5]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe42]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe9f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xefc]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf59]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfb6]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10cd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x209];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x112a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x218];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1187] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x227];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11e4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x236];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1241] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x245];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1358] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x254];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13b5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x263];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1412] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x272];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x146f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x281];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1586] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x290];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15e3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1640] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1757] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17b4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18cb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a9c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1af9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b56] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x308];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bb3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x317];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c10] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x326];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d27] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x335];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d84] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x344];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1de1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x353];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e3e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x362];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f55] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x371];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fb2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x380];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x200f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2126] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2183] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22f7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2525] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2582] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25df] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x263c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2753] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x407];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27b0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x416];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x280d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x425];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2924] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x434];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2981] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x443];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a98] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x452];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cc6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x461];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d23] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x470];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d80] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e97] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ef4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x300b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3239] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3296] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35db] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x35d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xc0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6a2]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x129];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6ff]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x138];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x75c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x147];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x873]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x156];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8d0]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x165];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x92d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x174];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa44]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x183];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xaa1]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x192];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[3000]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xde6]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe43]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xea0]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xefd]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf5a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfb7]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10ce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x112b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x219];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1188] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x228];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11e5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x237];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1242] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x246];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1359] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x255];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13b6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x264];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1413] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x273];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1470] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x282];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1587] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x291];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15e4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1641] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1758] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17b5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18cc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a9d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1afa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[6999]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x309];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bb4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x318];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c11] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x327];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d28] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x336];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d85] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x345];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1de2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x354];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e3f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x363];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f56] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x372];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fb3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x381];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2010] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x390];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2127] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2184] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22f8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2526] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2583] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25e0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x263d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2754] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x408];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27b1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x417];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x280e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x426];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2925] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x435];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2982] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x444];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a99] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x453];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cc7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x462];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d24] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x471];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d81] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x480];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e98] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ef5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x300c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x323a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3297] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x3bb]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xd0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6a3]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x12a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x700]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x139];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x75d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x148];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x874]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x157];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8d1]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x166];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x92e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x175];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa45]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x184];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xaa2]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x193];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbb9]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xde7]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe44]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xea1]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xefe]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf5b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfb8]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10cf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x112c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1189] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x229];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11e6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x238];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1243] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x247];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x135a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x256];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13b7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x265];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1414] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x274];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1471] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x283];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1588] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x292];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15e5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1642] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1759] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17b6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18cd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a9e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1afb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[7000]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x30a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bb5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x319];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c12] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x328];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d29] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x337];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d86] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x346];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1de3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x355];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e40] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x364];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f57] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x373];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fb4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x382];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2011] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x391];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2128] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2185] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22f9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2527] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2584] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25e1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x263e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2755] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x409];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27b2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x418];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x280f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x427];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2926] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x436];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2983] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x445];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a9a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x454];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cc8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x463];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d25] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x472];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d82] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x481];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e99] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x490];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ef6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x300d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x323b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3298] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33af] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35dd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x419]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xe0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6a4]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [299];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x701]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x13a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x75e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x149];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x875]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x158];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8d2]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x167];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x92f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x176];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa46]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x185];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xaa3]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x194];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xbba]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xde8]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe45]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xea2]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xeff]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf5c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfb9]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1fd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10d0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x112d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x118a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11e7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x239];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1244] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x248];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x135b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[599];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13b8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x266];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1415] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x275];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1472] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x284];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1589] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x293];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15e6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1643] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x175a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17b7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18ce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a9f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1afc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b59] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bb6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c13] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x329];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d2a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x338];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d87] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x347];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1de4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x356];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e41] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x365];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f58] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x374];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fb5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[899];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2012] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x392];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2129] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2186] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22fa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2528] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2585] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25e2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x263f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2756] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27b3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x419];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2810] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x428];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2927] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x437];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2984] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x446];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a9b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x455];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cc9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x464];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d26] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x473];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d83] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x482];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e9a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x491];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ef7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x300e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x323c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3299] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33b0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x1b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x30];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6a5]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x12f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x702]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x13e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x819]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x14d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x876]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x15c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8d3]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x16b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9ea]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x17a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa47]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x189];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb5e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x198];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xd8c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xde9]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe46]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xea3]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf00]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf5d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1074] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x201];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10d1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x210];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x112e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x118b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11e8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x12ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x135c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13b9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1416] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x279];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x152d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x288];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x158a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x297];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15e7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16fe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x175b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1872] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a43] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1aa0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1afd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x300];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b5a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bb7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d2b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d88] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1de5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1efc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x369];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f59] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x378];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fb6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x387];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20cd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x396];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x212a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x229e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24cc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2529] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2586] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25e3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26fa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ff];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2757] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27b4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28cb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2928] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a3f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c6d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x459];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x468];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d27] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x477];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e3e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x486];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e9b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x495];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fb2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31e0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x323d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3354] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3582] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x79]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x40];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6a6]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x130];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x703]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x13f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x81a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x14e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x877]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x15d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8d4]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x16c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9eb]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x17b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa48]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x18a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb5f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x199];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xd8d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xdea]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe47]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xea4]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf01]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf5e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [499];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1075] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x202];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10d2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x211];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x112f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x220];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x118c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11e9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1300] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x135d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13ba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1417] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x152e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x289];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x158b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x298];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15e8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x175c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1873] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a44] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1aa1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1afe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x301];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b5b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x310];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bb8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[799];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ccf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d2c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d89] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1de6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1efd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f5a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x379];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fb7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x388];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20ce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x397];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x212b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x229f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24cd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x252a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2587] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25e4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26fb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x400];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2758] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27b5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28cc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2929] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a40] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[1099];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c6e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ccb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x469];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d28] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x478];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e3f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x487];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e9c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x496];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fb3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31e1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x323e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3355] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3583] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xd7]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x50];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6a7]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x131];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x704]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x140];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x81b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x14f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x878]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x15e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8d5]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x16d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9ec]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x17c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa49]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x18b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb60]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x19a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xd8e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xdeb]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe48]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xea5]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf02]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf5f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [500];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1076] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x203];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10d3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x212];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1130] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x221];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x118d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x230];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11ea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1301] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x135e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13bb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1418] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x152f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x158c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x299];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15e9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1700] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x175d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1874] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a45] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1aa2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1aff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x302];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b5c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x311];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bb9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[800];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cd0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d2d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d8a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1de7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1efe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f5b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fb8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x389];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20cf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x398];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x212c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22a0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24ce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x252b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2588] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25e5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26fc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x401];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2759] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x410];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27b6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28cd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x292a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a41] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c6f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ccc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d29] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x479];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e40] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x488];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e9d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x497];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fb4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31e2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x323f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3356] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3584] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x135]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x60];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6a8]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x132];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x705]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x141];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x81c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x150];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x879]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x15f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8d6]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x16e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9ed]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x17d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa4a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x18c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb61]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x19b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xd8f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xdec]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe49]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xea6]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf03]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf60]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1077] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x204];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10d4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x213];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1131] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x222];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x118e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x231];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11eb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x240];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1302] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x135f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13bc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1419] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1530] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x158d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15ea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1701] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x175e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1875] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a46] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1aa3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b00] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x303];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b5d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x312];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x321];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cd1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x330];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d2e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d8b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1de8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f5c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fb9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20d0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x399];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x212d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22a1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24cf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x252c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2589] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25e6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26fd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x402];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x275a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x411];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27b7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x420];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28ce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x292b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a42] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c70] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ccd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d2a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e41] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x489];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e9e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x498];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fb5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31e3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3240] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3357] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3585] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x193]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x80];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6a9]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x134];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x706]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x143];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x81d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x152];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x87a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x161];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8d7]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x170];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9ee]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x17f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa4b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x18e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb62]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x19d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xd90]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xded]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe4a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xea7]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf04]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf61]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1078] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x206];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10d5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x215];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1132] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x224];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x118f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x233];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11ec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x242];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1303] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x251];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1360] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x260];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13bd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x141a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1531] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x158e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15eb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1702] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x175f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1876] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a47] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1aa4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b01] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x305];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b5e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x314];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bbb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x323];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cd2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x332];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d2f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x341];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d8c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x350];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1de9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f00] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f5d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20d1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x212e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22a2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24d0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x252d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x258a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25e7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26fe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x404];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x275b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x413];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27b8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x422];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28cf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x431];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x292c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x440];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a43] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c71] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d2b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e42] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e9f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fb6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31e4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3241] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3358] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3586] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x1f1]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x90];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6aa]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x135];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x707]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x144];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x81e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x153];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x87b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x162];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8d8]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x171];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9ef]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x180];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa4c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [399];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb63]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x19e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xd91]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xdee]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe4b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xea8]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf05]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf62]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1079] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x207];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10d6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x216];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1133] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x225];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1190] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x234];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11ed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x243];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1304] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x252];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1361] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x261];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13be] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x270];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x141b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1532] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x158f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15ec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1703] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[699];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1760] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1877] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a48] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1aa5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b02] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x306];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b5f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x315];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bbc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x324];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cd3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x333];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d30] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x342];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d8d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x351];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x360];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f01] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f5e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fbb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20d2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x212f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24d1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x252e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x258b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[999];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25e8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x405];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x275c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x414];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27b9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x423];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28d0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x432];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x292d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x441];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a44] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x450];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c72] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ccf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d2c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e43] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ea0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fb7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31e5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3242] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3359] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3587] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x24f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xa0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6ab]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x136];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x708]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x145];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x81f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x154];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x87c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x163];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8d9]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x172];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9f0]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x181];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa4d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [400];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb64]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x19f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xd92]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xdef]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe4c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xea9]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf06]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf63]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x107a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x208];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10d7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x217];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1134] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x226];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1191] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x235];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11ee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x244];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1305] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x253];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1362] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x262];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13bf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x271];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x141c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x280];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1533] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1590] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15ed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1704] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[700];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1761] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1878] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a49] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1aa6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b03] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x307];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b60] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x316];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bbd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x325];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cd4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x334];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d31] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x343];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d8e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x352];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1deb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x361];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f02] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x370];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f5f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fbc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20d3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2130] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24d2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x252f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x258c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[1000];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25e9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2700] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x406];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x275d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x415];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27ba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x424];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28d1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x433];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x292e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x442];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a45] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x451];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c73] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x460];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cd0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d2d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e44] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ea1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fb8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31e6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3243] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x335a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3588] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x2ad]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xb0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6ac]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x137];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x709]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x146];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x820]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x155];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x87d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x164];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8da]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x173];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9f1]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x182];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa4e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x191];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb65]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xd93]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xdf0]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe4d]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xeaa]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf07]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf64]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x107b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x209];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10d8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x218];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1135] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x227];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1192] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x236];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11ef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x245];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1306] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x254];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1363] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x263];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13c0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x272];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x141d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x281];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1534] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x290];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1591] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15ee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1705] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1762] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1879] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a4a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1aa7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b04] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x308];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b61] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x317];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bbe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x326];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cd5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x335];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d32] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x344];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d8f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x353];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x362];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f03] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x371];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f60] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x380];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fbd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20d4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2131] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24d3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2530] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x258d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25ea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2701] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x407];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x275e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x416];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27bb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x425];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28d2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x434];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x292f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x443];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a46] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x452];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c74] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x461];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cd1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x470];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d2e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e45] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ea2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fb9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31e7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3244] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x335b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3589] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x30b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xc0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x422]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x47f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xfc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x4dc]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x10b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x5f3]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x11a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x650]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x129];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6ad]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x138];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x70a]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x147];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x821]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x156];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x87e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x165];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8db]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x174];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9f2]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x183];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa4f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x192];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb66]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xd94]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xdf1]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe4e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xeab]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf08]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf65]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x107c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x219];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1136] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x228];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1193] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x237];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11f0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x246];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1307] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x255];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1364] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x264];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13c1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x273];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x141e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x282];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1535] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x291];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1592] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15ef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1706] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1763] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x187a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a4b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1aa8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b05] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x309];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b62] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x318];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bbf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x327];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cd6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x336];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d33] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x345];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d90] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x354];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ded] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x363];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f04] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x372];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f61] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x381];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fbe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x390];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20d5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2132] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24d4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2531] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x258e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25eb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2702] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x408];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x275f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x417];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27bc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x426];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28d3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x435];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2930] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x444];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a47] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x453];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c75] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x462];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cd2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x471];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d2f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x480];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e46] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ea3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31e8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3245] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x335c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x358a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x3c6]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xe0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x423]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xef];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x480]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0xfe];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x4dd]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x10d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x5f4]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x11c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x651]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [299];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x6ae]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x13a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x70b]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x149];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x822]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x158];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x87f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x167];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x8dc]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x176];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0x9f3]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x185];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xa50]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x194];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xb67]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xd95]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xdf2]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe4f]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xeac]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf09]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1ee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf66]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x1fd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x107d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1137] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1194] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x239];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x248];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1308] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[599];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1365] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x266];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13c2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x275];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x141f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x284];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1536] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x293];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1593] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15f0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1707] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1764] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x187b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a4c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1aa9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b06] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b63] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bc0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x329];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cd7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x338];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d34] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x347];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d91] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x356];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x365];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f05] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x374];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f62] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[899];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fbf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x392];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20d6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2133] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24d5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2532] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x258f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25ec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2703] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2760] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x419];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27bd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x428];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28d4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x437];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2931] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x446];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a48] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x455];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c76] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x464];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cd3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x473];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d30] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x482];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e47] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x491];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ea4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fbb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31e9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3246] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x335d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x358b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1195] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x164e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x102];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1708] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x111];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1765] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x120];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17c2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x12f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x181f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x187c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1936] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1993] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19f0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x189];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cd8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d35] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d92] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1def] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e4c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ea9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f06] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x201];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f63] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x210];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fc0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x201d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x207a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20d7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2134] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2191] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21ee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x198];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x224b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x279];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x288];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2305] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x297];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2362] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23bf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x241c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2479] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2704] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2761] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27be] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x300];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x281b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2878] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28d5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2932] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x298f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29ec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a49] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x369];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2aa6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x378];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b03] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x387];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b60] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x396];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bbd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c1a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e48] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ea5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f02] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f5f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fbc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ff];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3019] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3076] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30d3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3130] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x318d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x335e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x459];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33bb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x468];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3418] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x477];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3475] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x486];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34d2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x495];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x352f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3700] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x375d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3874] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11f3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15f2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x164f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16ac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x103];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1709] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x112];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1766] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x121];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17c3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x130];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1820] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x187d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1937] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1994] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cd9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d36] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d93] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1df0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e4d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eaa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[499];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f07] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x202];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f64] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x211];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fc1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x220];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x201e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x207b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20d8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2135] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2192] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21ef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x199];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x224c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x289];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2306] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x298];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2363] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23c0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x241d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x247a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2705] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2762] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27bf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x301];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x281c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x310];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2879] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[799];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28d6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2933] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2990] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29ed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a4a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2aa7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x379];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b04] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x388];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b61] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x397];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bbe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c1b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e49] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ea6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f03] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f60] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fbd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x400];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x301a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3077] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30d4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3131] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x318e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[1099];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x335f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33bc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x469];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3419] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x478];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3476] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x487];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34d3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x496];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3530] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3701] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x375e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3875] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1251] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x50];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15f3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1650] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x104];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x170a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x113];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1767] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x122];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17c4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x131];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1821] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x140];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x187e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18db] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1938] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1995] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19f2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cda] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d37] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d94] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1df1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e4e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[500];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f08] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x203];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f65] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x212];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fc2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x221];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x201f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x230];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x207c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2136] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2193] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21f0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x224d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22aa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2307] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x299];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2364] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23c1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x241e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x247b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2706] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2763] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27c0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x302];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x281d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x311];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x287a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[800];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28d7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2934] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2991] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29ee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a4b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2aa8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b05] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x389];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b62] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x398];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bbf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c1c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e4a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ea7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f04] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f61] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fbe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x401];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x301b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x410];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3078] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30d5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3132] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x318f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3360] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33bd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x341a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x479];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3477] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x488];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34d4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x497];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3531] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3702] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x375f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3876] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x12af] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x60];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15f4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1651] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x105];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x170b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x114];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1768] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x123];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17c5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x132];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1822] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x141];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x187f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x150];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1939] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1996] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19f3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cdb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d38] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d95] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1df2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e4f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f09] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x204];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f66] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x213];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fc3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x222];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2020] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x231];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x207d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x240];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2137] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2194] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x224e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2308] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2365] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23c2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x241f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x247c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2707] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2764] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27c1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x303];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x281e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x312];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x287b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x321];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28d8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x330];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2935] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2992] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29ef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a4c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2aa9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b06] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b63] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x399];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bc0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c1d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e4b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ea8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f05] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f62] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fbf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x402];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x301c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x411];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3079] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x420];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30d6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3133] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3190] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3361] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33be] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x341b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3478] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x489];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34d5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x498];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3532] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3703] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3760] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3877] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x130d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x70];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15f5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1652] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16af] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x106];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x170c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x115];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1769] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x124];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17c6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x133];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1823] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x142];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1880] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x151];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18dd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x160];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x193a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1997] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19f4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cdc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d39] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d96] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1df3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e50] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ead] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f0a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x205];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f67] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x214];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fc4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x223];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2021] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x232];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x207e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x241];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20db] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x250];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2138] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2195] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21f2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x224f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22ac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2309] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2366] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23c3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2420] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x247d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2708] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2765] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27c2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x304];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x281f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x313];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x287c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x322];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x331];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2936] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x340];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2993] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29f0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a4d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2aaa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b07] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b64] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bc1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c1e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e4c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ea9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f06] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f63] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fc0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x403];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x301d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x412];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x307a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x421];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30d7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x430];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3134] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3191] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3362] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33bf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x341c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3479] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34d6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x499];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3533] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3704] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3761] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3878] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x136b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x80];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15f6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1653] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16b0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x107];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x170d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x116];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x176a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x125];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17c7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x134];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1824] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x143];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1881] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x152];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x161];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x193b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x170];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1998] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19f5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cdd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d3a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d97] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1df4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e51] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f0b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x206];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f68] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x215];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fc5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x224];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2022] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x233];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x207f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x242];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x251];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2139] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x260];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2196] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21f3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2250] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x230a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2367] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23c4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2421] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x247e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2709] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2766] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27c3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x305];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2820] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x314];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x287d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x323];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x332];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2937] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x341];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2994] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x350];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a4e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2aab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b08] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b65] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bc2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c1f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e4d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eaa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f07] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f64] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fc1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x404];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x301e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x413];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x307b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x422];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30d8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x431];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3135] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x440];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3192] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3363] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33c0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x341d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x347a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34d7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3534] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3705] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3762] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3879] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13c9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x90];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15f7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1654] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16b1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x108];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x170e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x117];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x176b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x126];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17c8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x135];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1825] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x144];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1882] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x153];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18df] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x162];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x193c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x171];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1999] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x180];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19f6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[399];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cde] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d3b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d98] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1df5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e52] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eaf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f0c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x207];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f69] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x216];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fc6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x225];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2023] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x234];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2080] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x243];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20dd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x252];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x213a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x261];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2197] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x270];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21f4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2251] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x230b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2368] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23c5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[699];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2422] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x247f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x270a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2767] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27c4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x306];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2821] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x315];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x287e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x324];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28db] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x333];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2938] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x342];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2995] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x351];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29f2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x360];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a4f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2aac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b09] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b66] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bc3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c20] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e4e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f08] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[999];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f65] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fc2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x405];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x301f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x414];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x307c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x423];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x432];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3136] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x441];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3193] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x450];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3364] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33c1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x341e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x347b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34d8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3535] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3706] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3763] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x387a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1427] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xa0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15f8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xeb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1655] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16b2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x109];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x170f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x118];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x176c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x127];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17c9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x136];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1826] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x145];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1883] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x154];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18e0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x163];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x193d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x172];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x199a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x181];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19f7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[400];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cdf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d3c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d99] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1df6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e53] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eb0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f0d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x208];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f6a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x217];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fc7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x226];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2024] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x235];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2081] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x244];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x253];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x213b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x262];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2198] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x271];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21f5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2252] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x280];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22af] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x230c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2369] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23c6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[700];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2423] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2480] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x270b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2768] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27c5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x307];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2822] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x316];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x287f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x325];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x334];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2939] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x343];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2996] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x352];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29f3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x361];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a50] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x370];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2aad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b0a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b67] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bc4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c21] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e4f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f09] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[1000];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f66] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fc3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x406];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3020] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x415];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x307d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x424];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x433];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3137] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x442];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3194] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x451];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3365] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x460];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33c2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x341f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x347c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3536] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36aa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3707] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3764] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x387b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1485] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xb0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15f9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1656] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16b3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1710] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x119];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x176d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x128];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17ca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x137];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1827] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x146];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1884] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x155];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18e1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x164];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x193e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x173];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x199b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x182];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19f8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x191];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ce0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d3d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d9a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1df7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e54] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eb1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f0e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x209];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f6b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x218];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fc8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x227];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2025] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x236];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2082] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x245];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20df] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x254];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x213c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x263];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2199] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x272];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21f6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2253] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x281];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22b0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x290];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x230d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x236a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23c7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2424] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2481] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x270c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2769] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27c6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x308];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2823] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x317];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2880] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x326];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28dd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x335];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x293a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x344];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2997] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x353];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29f4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x362];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a51] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x371];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2aae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x380];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b0b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b68] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bc5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c22] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e50] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ead] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f0a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f67] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fc4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x407];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3021] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x416];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x307e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x425];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30db] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x434];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3138] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x443];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3195] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x452];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3366] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x461];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33c3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x470];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3420] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x347d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3537] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3708] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3765] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x387c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14e3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xc0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15fa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1657] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16b4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1711] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x176e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x129];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17cb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x138];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1828] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x147];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1885] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x156];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18e2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x165];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x193f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x174];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x199c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x183];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19f9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x192];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ce1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d3e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d9b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1df8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e55] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eb2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f0f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f6c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x219];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fc9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x228];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2026] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x237];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2083] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x246];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20e0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x255];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x213d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x264];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x219a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x273];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21f7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2254] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x282];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22b1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x291];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x230e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x236b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23c8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2425] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2482] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x270d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x276a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27c7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x309];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2824] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x318];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2881] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x327];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x336];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x293b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x345];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2998] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x354];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29f5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x363];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a52] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x372];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2aaf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x381];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b0c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x390];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b69] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bc6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c23] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e51] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f0b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f68] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fc5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x408];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3022] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x417];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x307f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x426];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x435];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3139] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x444];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3196] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x453];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3367] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x462];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33c4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x471];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3421] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x480];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x347e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34db] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3538] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36ac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3709] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3766] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x387d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1541] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xd0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15fb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1658] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16b5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1712] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[5999]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x12a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17cc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x139];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1829] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x148];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1886] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x157];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18e3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x166];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1940] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x175];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x199d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x184];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19fa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x193];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ce2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d3f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d9c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1df9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e56] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eb3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f10] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f6d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x229];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2027] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x238];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2084] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x247];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20e1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x256];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x213e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x265];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x219b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x274];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21f8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2255] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x283];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22b2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x292];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x230f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x236c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23c9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2426] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2483] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x270e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x276b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27c8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2825] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x319];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2882] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x328];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28df] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x337];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x293c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x346];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2999] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x355];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29f6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x364];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a53] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x373];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ab0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x382];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b0d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x391];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b6a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bc7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c24] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e52] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eaf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f0c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f69] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fc6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x409];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3023] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x418];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3080] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x427];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30dd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x436];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x313a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x445];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3197] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x454];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3368] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x463];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33c5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x472];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3422] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x481];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x347f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x490];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3539] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x370a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3767] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x387e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x159f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15fc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xef];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1659] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfe];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16b6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1713] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[6000]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [299];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17cd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x182a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x149];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1887] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x158];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18e4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x167];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1941] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x176];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x199e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x185];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19fb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x194];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ce3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d40] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d9d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dfa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e57] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eb4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f11] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f6e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fcb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2028] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x239];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2085] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x248];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20e2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[599];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x213f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x266];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x219c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x275];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21f9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2256] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x284];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22b3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x293];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2310] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x236d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23ca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2427] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2484] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[9999]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x2ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x276c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27c9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2826] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2883] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x329];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28e0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x338];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x293d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x347];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x299a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x356];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29f7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x365];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a54] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x374];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ab1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[899];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b0e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x392];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b6b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bc8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c25] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e53] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eb0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f0d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f6a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fc7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3024] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x419];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3081] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x428];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x437];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x313b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x446];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3198] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x455];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3369] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x464];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33c6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x473];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3423] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x482];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3480] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x491];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34dd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x353a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x370b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3768] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x387f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe5c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x10];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x142c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1489] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14e6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x100];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15a0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15fd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x165a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x12d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16b7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1771] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17ce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x182b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x169];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18e5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x178];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1942] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x187];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19fc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x196];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ab6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b13] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b70] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bcd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c2a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c87] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d41] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ff];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d9e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dfb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e58] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eb5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f6f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fcc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x259];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2029] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x268];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2086] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x277];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2140] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x286];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x219d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x295];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2257] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2311] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x236e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2428] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x253f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x259c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ef];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25f9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fe];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2656] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26b3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x276d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27ca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2827] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x349];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2884] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x358];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x293e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x367];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x299b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x376];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29f8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x385];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ab2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x394];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b0f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bc9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ce0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d3d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d9a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2df7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eb1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f0e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f6b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3025] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3082] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x439];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x313c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x448];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3253] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x457];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32b0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x466];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x330d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x475];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33c7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x484];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3424] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x493];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35f5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3652] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x370c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3823] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xeba]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x20];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x142d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x148a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14e7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x101];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15a1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x110];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15fe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x165b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x12e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16b8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1772] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17cf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x182c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18e6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x179];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1943] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x188];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19fd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x197];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ab7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b14] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b71] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c2b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c88] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d42] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x200];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d9f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dfc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e59] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eb6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f70] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fcd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x202a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x269];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2087] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x278];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2141] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x287];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x219e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x296];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2258] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2312] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x236f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2429] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2540] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x259d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25fa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ff];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2657] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26b4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x276e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27cb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2828] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2885] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x359];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x293f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x368];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x299c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x377];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29f9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x386];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ab3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x395];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b10] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ce1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d3e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d9b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2df8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ef];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eb2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fe];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f0f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f6c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3026] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3083] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x313d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x449];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3254] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x458];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32b1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x467];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x330e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x476];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33c8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x485];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3425] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x494];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34df] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35f6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3653] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x370d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3824] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf18]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x30];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x142e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x148b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14e8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x102];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15a2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x111];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x120];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x165c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x12f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16b9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1773] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17d0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x182d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18e7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1944] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x189];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19fe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x198];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ab8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b15] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b72] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bcf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c2c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c89] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d43] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x201];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1da0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x210];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dfd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e5a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eb7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f71] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x202b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2088] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x279];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2142] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x288];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x219f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x297];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2259] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2313] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2370] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x242a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2541] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x259e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25fb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x300];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2658] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26b5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x276f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27cc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2829] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2886] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2940] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x369];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x299d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x378];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29fa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x387];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ab4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x396];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b11] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bcb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ce2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d3f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d9c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2df9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eb3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ff];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f10] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f6d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3027] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3084] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x313e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3255] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x459];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32b2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x468];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x330f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x477];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33c9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x486];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3426] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x495];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34e0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35f7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3654] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x370e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3825] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf76]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x40];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x142f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x148c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14e9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x103];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x112];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1600] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x121];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x165d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x130];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16ba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1774] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17d1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x182e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18e8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1945] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x199];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ab9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b16] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b73] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bd0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c2d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c8a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[499];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d44] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x202];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1da1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x211];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dfe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x220];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e5b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eb8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f72] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fcf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x202c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2089] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2143] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x289];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21a0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x298];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x225a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2314] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2371] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x242b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2542] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x259f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25fc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x301];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2659] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x310];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26b6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[799];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2770] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27cd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x282a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2887] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2941] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x299e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x379];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29fb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x388];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ab5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x397];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b12] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bcc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ce3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d40] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d9d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dfa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eb4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x400];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f11] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f6e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3028] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3085] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x313f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[1099];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3256] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32b3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x469];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3310] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x478];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33ca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x487];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3427] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x496];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34e1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35f8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3655] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x370f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3826] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfd4]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x50];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1430] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x148d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14ea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x104];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x113];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1601] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x122];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x165e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x131];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16bb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x140];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1775] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17d2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x182f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18e9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1946] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a00] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1aba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b17] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b74] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bd1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c2e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c8b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[500];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d45] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x203];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1da2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x212];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x221];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e5c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x230];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eb9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f73] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fd0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x202d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x208a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2144] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21a1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x299];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x225b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2315] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2372] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x242c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2543] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25a0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25fd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x302];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x265a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x311];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26b7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[800];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2771] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27ce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x282b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2888] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2942] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x299f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29fc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x389];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ab6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x398];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b13] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bcd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ce4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d41] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d9e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dfb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eb5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x401];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f12] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x410];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f6f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3029] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3086] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3140] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3257] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32b4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3311] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x479];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33cb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x488];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3428] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x497];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34e2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35f9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3656] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3710] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3827] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1032] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x60];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1431] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x148e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14eb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x105];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x114];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1602] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x123];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x165f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x132];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16bc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x141];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1776] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x150];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17d3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1830] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18ea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1947] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a01] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1abb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b18] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b75] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bd2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c2f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c8c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d46] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x204];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1da3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x213];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e00] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x222];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e5d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x231];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1eba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x240];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f74] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fd1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x202e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x208b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2145] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21a2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x225c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2316] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2373] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x242d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2544] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25a1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25fe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x303];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x265b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x312];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26b8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x321];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2772] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x330];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27cf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x282c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2889] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2943] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29a0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29fd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ab7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x399];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b14] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ce5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d42] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d9f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dfc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eb6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x402];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f13] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x411];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f70] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x420];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x302a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3087] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3141] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3258] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32b5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3312] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33cc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x489];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3429] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x498];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34e3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35fa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3657] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3711] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3828] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10ed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x70];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1432] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x148f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14ec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x106];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x115];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1603] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x124];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1660] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x133];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16bd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x142];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1777] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x151];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17d4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x160];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1831] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18eb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1948] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a02] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1abc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b19] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b76] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bd3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c30] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c8d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d47] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x205];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1da4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x214];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e01] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x223];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e5e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x232];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ebb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x241];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f75] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x250];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fd2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x202f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x208c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2146] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x225d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2317] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2374] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x242e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2545] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25a2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x304];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x265c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x313];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26b9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x322];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2773] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x331];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27d0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x340];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x282d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x288a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2944] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29a1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29fe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ab8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b15] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bcf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ce6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d43] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2da0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dfd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eb7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x403];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f14] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x412];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f71] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x421];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x302b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x430];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3088] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3142] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3259] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32b6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3313] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33cd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x342a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x499];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34e4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35fb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3658] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3712] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3829] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x114b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x80];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1433] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1490] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14ed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x107];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x116];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1604] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x125];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1661] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x134];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16be] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x143];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1778] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x152];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17d5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x161];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1832] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x170];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18ec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1949] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a03] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1abd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b1a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b77] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bd4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c31] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c8e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d48] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x206];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1da5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x215];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e02] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x224];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e5f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x233];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ebc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x242];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f76] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x251];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fd3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x260];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2030] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x208d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2147] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x225e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2318] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2375] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x242f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2546] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2600] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x305];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x265d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x314];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26ba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x323];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2774] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x332];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27d1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x341];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x282e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x350];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x288b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2945] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29a2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ab9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b16] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bd0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ce7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d44] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2da1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dfe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eb8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x404];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f15] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x413];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f72] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x422];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x302c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x431];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3089] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x440];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3143] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x325a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32b7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3314] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33ce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x342b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34e5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35fc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3659] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3713] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x382a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x90];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1434] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1491] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14ee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x108];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x117];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1605] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x126];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1662] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x135];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16bf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x144];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1779] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x153];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17d6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x162];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1833] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x171];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18ed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x180];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x194a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[399];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a04] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1abe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b1b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b78] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bd5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c32] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c8f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d49] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x207];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1da6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x216];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e03] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x225];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e60] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x234];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ebd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x243];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f77] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x252];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fd4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x261];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2031] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x270];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x208e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2148] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x225f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2319] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[699];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2376] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2430] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2547] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2601] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x306];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x265e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x315];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26bb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x324];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2775] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x333];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27d2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x342];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x282f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x351];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x288c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x360];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2946] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a00] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2aba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b17] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bd1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ce8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d45] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2da2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[999];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eb9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x405];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f16] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x414];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f73] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x423];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x302d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x432];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x308a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x441];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3144] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x450];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x325b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32b8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3315] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33cf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x342c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34e6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35fd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x365a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3714] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x382b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1207] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xa0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1435] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xeb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1492] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14ef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x109];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x118];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1606] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x127];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1663] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x136];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16c0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x145];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x177a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x154];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17d7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x163];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1834] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x172];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18ee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x181];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x194b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[400];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a05] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1abf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b1c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b79] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bd6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c33] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c90] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d4a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x208];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1da7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x217];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e04] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x226];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e61] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x235];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ebe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x244];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f78] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x253];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fd5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x262];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2032] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x271];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x208f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x280];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2149] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2260] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x231a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[700];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2377] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2431] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2548] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2602] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x307];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x265f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x316];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26bc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x325];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2776] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x334];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27d3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x343];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2830] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x352];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x288d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x361];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2947] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x370];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a01] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2abb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b18] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bd2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ce9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d46] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2da3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[1000];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e00] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x406];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f17] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x415];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f74] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x424];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x302e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x433];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x308b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x442];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3145] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x451];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x325c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x460];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32b9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3316] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33d0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x342d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34e7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35fe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x365b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3715] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x382c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1265] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xb0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1436] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1493] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14f0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15aa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x119];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1607] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x128];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1664] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x137];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16c1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x146];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x177b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x155];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17d8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x164];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1835] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x173];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18ef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x182];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x194c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x191];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a06] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ac0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b1d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b7a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bd7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c34] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c91] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d4b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x209];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1da8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x218];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e05] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x227];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e62] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x236];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ebf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x245];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f79] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x254];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fd6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x263];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2033] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x272];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2090] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x281];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x214a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x290];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2261] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x231b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2378] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2432] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2549] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2603] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x308];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2660] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x317];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26bd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x326];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2777] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x335];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27d4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x344];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2831] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x353];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x288e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x362];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2948] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x371];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x380];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a02] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2abc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b19] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bd3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d47] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2da4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e01] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ebb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x407];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f18] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x416];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f75] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x425];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x302f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x434];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x308c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x443];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3146] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x452];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x325d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x461];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32ba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x470];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3317] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33d1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x342e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34e8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x365c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3716] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x382d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x12c3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xc0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1437] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1494] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1608] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x129];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1665] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x138];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16c2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x147];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x177c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x156];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x165];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1836] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x174];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18f0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x183];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x194d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x192];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a07] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ac1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b1e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b7b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bd8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c35] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c92] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d4c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1da9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x219];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e06] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x228];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e63] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x237];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ec0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x246];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f7a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x255];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fd7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x264];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2034] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x273];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2091] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x282];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x214b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x291];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2262] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x231c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2379] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2433] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x254a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2604] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x309];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2661] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x318];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26be] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x327];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2778] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x336];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27d5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x345];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2832] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x354];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x288f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x363];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2949] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x372];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x381];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a03] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x390];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2abd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b1a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bd4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ceb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d48] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2da5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e02] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ebc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x408];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f19] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x417];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f76] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x426];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3030] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x435];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x308d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x444];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3147] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x453];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x325e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x462];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32bb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x471];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3318] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x480];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33d2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x342f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34e9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3600] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x365d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3717] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x382e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x137e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xd0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1438] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1495] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14f2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15ac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1609] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x12a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1666] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x139];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16c3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x148];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x177d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x157];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x166];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1837] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x175];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x184];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x194e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x193];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a08] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ac2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b1f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b7c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bd9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c36] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c93] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d4d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1daa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e07] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x229];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e64] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x238];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ec1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x247];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f7b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x256];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fd8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x265];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2035] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x274];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2092] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x283];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x214c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x292];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2263] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x231d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x237a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2434] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x254b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2605] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2662] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x319];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26bf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x328];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2779] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x337];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27d6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x346];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2833] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x355];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2890] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x364];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x294a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x373];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x382];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a04] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x391];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2abe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b1b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bd5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d49] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2da6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e03] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ebd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x409];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f1a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x418];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f77] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x427];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3031] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x436];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x308e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x445];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3148] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x454];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x325f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x463];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32bc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x472];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3319] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x481];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33d3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x490];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3430] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34ea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3601] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x365e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3718] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x382f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1439] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xef];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1496] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfe];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14f3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x160a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[299];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1667] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x16c4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x149];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x177e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x158];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17db] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x167];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1838] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x176];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18f2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x185];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x194f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x194];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a09] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ac3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b20] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b7d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bda] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c37] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c94] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d4e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e08] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e65] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x239];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ec2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x248];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f7c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[599];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fd9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x266];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2036] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x275];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2093] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x284];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x214d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x293];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21aa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2264] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x231e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x237b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2435] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x254c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2606] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2663] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26c0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x329];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x277a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x338];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27d7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x347];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2834] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x356];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2891] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x365];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x294b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x374];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[899];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a05] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x392];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2abf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b1c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bd6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ced] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d4a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2da7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e04] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ebe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f1b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x419];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f78] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x428];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3032] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x437];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x308f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x446];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3149] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x455];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3260] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x464];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32bd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x473];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x331a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x482];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33d4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x491];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3431] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34eb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3602] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x365f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3719] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3830] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xdb0]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13dd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x143a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1497] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xff];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1551] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x160b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[300];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1668] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1722] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x177f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x159];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x168];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1896] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x177];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18f3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x186];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x195];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a67] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ac4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b21] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b7e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bdb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c38] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ef];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cf2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fe];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d4f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e09] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e66] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f20] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x249];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f7d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[600];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fda] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x267];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2037] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x276];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x285];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x214e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x294];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22c2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x231f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24f0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x254d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25aa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2607] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2664] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x271e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x277b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x339];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27d8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x348];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2835] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x357];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28ef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x366];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x294c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x375];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[900];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a63] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x393];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ac0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b7a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c91] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d4b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2da8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e62] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ebf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f1c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fd6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x429];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3033] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x438];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30ed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x447];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3204] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x456];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3261] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x465];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32be] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x474];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3378] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x483];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33d5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x492];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x348f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3603] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36bd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37d4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe0e]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x10];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x143b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1498] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x100];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1552] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15af] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x160c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x12d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1669] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1723] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1780] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17dd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x169];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1897] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x178];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18f4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x187];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x196];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a68] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ac5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b22] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b7f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bdc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c39] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cf3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ff];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d50] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e0a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e67] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f21] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f7e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x259];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fdb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x268];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2038] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x277];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20f2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x286];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x214f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x295];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21ac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22c3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2320] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x254e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ef];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fe];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2608] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2665] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x271f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x277c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x349];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2836] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x358];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28f0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x367];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x294d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x376];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29aa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x385];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a64] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x394];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ac1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b7b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c92] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d4c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2da9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e63] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ec0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f1d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fd7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3034] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x439];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30ee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x448];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3205] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x457];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3262] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x466];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32bf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x475];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3379] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x484];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33d6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x493];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3490] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3604] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36be] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37d5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xe6c]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x20];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13df] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x143c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1499] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x101];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1553] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x110];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15b0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x160d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x12e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x166a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1724] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1781] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1898] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x179];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18f5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x188];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19af] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x197];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a69] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ac6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b23] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b80] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bdd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c3a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cf4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x200];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d51] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e0b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e68] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f22] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f7f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fdc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x269];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2039] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x278];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20f3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x287];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2150] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x296];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22c4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2321] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23db] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24f2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x254f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25ac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ff];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2609] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2666] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2720] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x277d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2837] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x359];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x368];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x294e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x377];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x386];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a65] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x395];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ac2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b7c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c93] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cf0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d4d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2daa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ef];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e64] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fe];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ec1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f1e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fd8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3035] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30ef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x449];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3206] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x458];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3263] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x467];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32c0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x476];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x337a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x485];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33d7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x494];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3491] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3605] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36bf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37d6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xeca]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x30];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13e0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x143d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x149a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x102];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1554] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x111];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15b1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x120];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x160e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x12f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x166b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1725] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1782] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17df] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1899] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18f6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x189];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19b0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x198];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a6a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ac7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b24] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b81] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bde] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c3b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cf5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x201];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d52] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x210];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1daf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e0c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e69] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f23] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f80] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fdd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x203a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x279];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20f4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x288];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2151] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x297];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22c5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2322] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24f3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2550] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x300];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x260a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2667] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2721] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x277e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27db] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2838] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28f2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x369];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x294f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x378];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29ac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x387];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a66] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x396];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ac3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b7d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c94] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cf1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d4e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e65] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ff];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ec2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f1f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fd9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3036] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30f0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3207] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x459];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3264] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x468];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32c1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x477];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x337b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x486];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33d8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x495];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3492] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3606] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36c0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37d7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf28]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x40];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13e1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x143e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x149b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x103];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1555] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x112];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15b2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x121];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x160f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x130];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x166c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1726] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1783] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17e0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x189a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18f7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19b1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x199];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a6b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ac8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b25] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b82] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bdf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c3c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[499];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cf6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x202];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d53] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x211];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1db0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x220];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e0d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e6a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f24] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f81] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fde] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x203b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20f5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x289];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2152] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x298];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21af] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22c6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2323] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23dd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24f4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2551] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x301];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x260b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x310];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2668] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[799];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2722] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x277f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2839] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28f3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2950] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x379];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x388];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a67] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x397];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ac4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b7e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c95] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cf2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d4f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e66] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x400];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ec3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f20] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fda] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3037] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[1099];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3208] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3265] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x469];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32c2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x478];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x337c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x487];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x496];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3493] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35aa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3607] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36c1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37d8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xf86]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x50];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13e2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x143f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x149c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x104];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1556] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x113];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15b3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x122];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1610] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x131];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x166d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x140];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1727] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1784] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17e1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x189b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18f8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19b2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a6c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ac9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b26] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b83] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1be0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c3d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[500];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cf7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x203];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d54] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x212];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1db1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x221];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e0e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x230];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e6b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f25] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f82] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fdf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x203c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20f6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2153] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x299];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21b0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22c7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2324] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24f5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2552] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25af] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x302];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x260c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x311];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2669] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[800];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2723] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2780] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27dd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x283a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28f4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2951] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x389];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a68] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x398];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ac5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b7f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c96] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cf3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d50] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e67] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x401];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ec4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x410];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f21] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fdb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3038] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30f2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3209] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3266] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32c3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x479];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x337d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x488];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x497];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3494] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3608] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36c2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[0xfe4]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x60];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13e3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1440] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x149d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x105];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1557] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x114];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15b4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x123];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1611] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x132];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x166e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x141];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1728] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x150];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1785] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17e2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x189c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18f9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19b3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a6d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1aca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b27] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b84] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1be1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c3e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cf8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x204];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d55] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x213];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1db2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x222];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e0f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x231];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e6c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x240];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f26] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f83] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fe0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x203d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20f7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2154] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21b1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22c8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2325] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23df] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24f6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2553] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25b0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x303];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x260d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x312];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x266a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x321];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2724] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x330];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2781] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x283b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28f5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2952] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29af] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a69] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x399];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ac6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b80] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c97] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cf4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d51] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e68] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x402];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ec5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x411];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f22] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x420];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fdc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3039] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30f3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x320a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3267] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32c4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x337e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x489];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33db] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x498];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3495] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35ac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3609] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36c3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x109f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x70];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13e4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1441] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x149e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x106];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1558] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x115];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15b5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x124];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1612] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x133];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x166f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x142];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1729] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x151];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1786] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x160];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17e3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x189d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18fa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19b4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a6e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1acb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b28] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b85] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1be2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c3f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cf9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x205];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d56] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x214];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1db3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x223];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e10] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x232];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e6d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x241];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f27] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x250];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f84] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fe1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x203e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20f8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2155] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21b2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22c9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2326] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23e0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24f7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2554] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25b1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x304];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x260e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x313];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x266b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x322];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2725] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x331];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2782] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x340];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27df] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x283c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28f6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2953] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29b0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a6a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ac7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b81] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c98] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cf5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d52] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2daf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e69] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x403];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ec6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x412];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f23] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x421];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fdd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x430];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x303a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30f4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x320b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3268] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32c5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x337f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x499];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3496] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x360a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36c4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37db] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x10fd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x80];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13e5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1442] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x149f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x107];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1559] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x116];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15b6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x125];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1613] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x134];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1670] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x143];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x172a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x152];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1787] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x161];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17e4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x170];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x189e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18fb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19b5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a6f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1acc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b29] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b86] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1be3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c40] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cfa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x206];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d57] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x215];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1db4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x224];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e11] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x233];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e6e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x242];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f28] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x251];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f85] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x260];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fe2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x203f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20f9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2156] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21b3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22ca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[8999]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x2c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23e1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24f8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2555] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25b2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x305];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x260f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x314];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x266c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x323];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2726] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x332];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2783] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x341];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27e0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x350];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x283d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28f7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2954] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29b1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a6b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ac8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b82] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c99] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cf6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d53] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2db0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e6a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x404];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ec7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x413];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f24] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x422];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fde] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x431];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x303b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x440];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30f5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x320c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3269] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32c6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3380] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33dd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3497] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x360b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36c5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x115b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x90];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13e6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1443] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14a0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x108];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x155a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x117];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15b7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x126];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1614] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x135];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1671] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x144];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x172b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x153];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1788] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x162];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17e5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x171];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x189f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x180];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18fc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[399];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19b6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a70] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1acd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b2a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b87] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1be4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c41] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cfb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x207];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d58] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x216];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1db5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x225];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e12] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x234];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e6f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x243];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f29] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x252];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f86] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x261];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fe3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x270];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2040] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20fa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2157] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21b4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22cb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[699];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[9000]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x2ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23e2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24f9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2556] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25b3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x306];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2610] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x315];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x266d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x324];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2727] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x333];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2784] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x342];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27e1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x351];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x283e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x360];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28f8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2955] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29b2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a6c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ac9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b83] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c9a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cf7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d54] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[999];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2db1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e6b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x405];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ec8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x414];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f25] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x423];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fdf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x432];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x303c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x441];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30f6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x450];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x320d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x326a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[12999]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x47d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3381] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3498] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35af] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x360c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36c6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37dd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x11b9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xa0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13e7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xeb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1444] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14a1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x109];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x155b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x118];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15b8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x127];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1615] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x136];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1672] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x145];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x172c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x154];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1789] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x163];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17e6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x172];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18a0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x181];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18fd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[400];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19b7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a71] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ace] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b2b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b88] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1be5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c42] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cfc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x208];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d59] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x217];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1db6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x226];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e13] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x235];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e70] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x244];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f2a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x253];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f87] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x262];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fe4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x271];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2041] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x280];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20fb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2158] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21b5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22cc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[700];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2329] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23e3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24fa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2557] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25b4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x307];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2611] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x316];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x266e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x325];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2728] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x334];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2785] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x343];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27e2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x352];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x283f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x361];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28f9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x370];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2956] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29b3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a6d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2aca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b84] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c9b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cf8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d55] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[1000];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2db2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e6c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x406];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ec9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x415];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f26] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x424];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fe0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x433];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x303d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x442];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30f7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x451];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x320e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x460];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x326b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array[13000]
       = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.array
         [0x47e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3382] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33df] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3499] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35b0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x360d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36c7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1217] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xb0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13e8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1445] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14a2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x155c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x119];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15b9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x128];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1616] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x137];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1673] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x146];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x172d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x155];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x178a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x164];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17e7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x173];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18a1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x182];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18fe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x191];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19b8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a72] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1acf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b2c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b89] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1be6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c43] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cfd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x209];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d5a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x218];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1db7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x227];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e14] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x236];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e71] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x245];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f2b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x254];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f88] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x263];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fe5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x272];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2042] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x281];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20fc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x290];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2159] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21b6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22cd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x232a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23e4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24fb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2558] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25b5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x308];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2612] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x317];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x266f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x326];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2729] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x335];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2786] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x344];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27e3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x353];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2840] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x362];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28fa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x371];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2957] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x380];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29b4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a6e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2acb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b85] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c9c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cf9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d56] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2db3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e6d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x407];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x416];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f27] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x425];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fe1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x434];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x303e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x443];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30f8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x452];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x320f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x461];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x326c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x470];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32c9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3383] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33e0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x349a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35b1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x360e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36c8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37df] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1275] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xc0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13e9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1446] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x155d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15ba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x129];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1617] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x138];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1674] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x147];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x172e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x156];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x178b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x165];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17e8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x174];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18a2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x183];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x192];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19b9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a73] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ad0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b2d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b8a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1be7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c44] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cfe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d5b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x219];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1db8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x228];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e15] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x237];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e72] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x246];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f2c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x255];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f89] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x264];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fe6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x273];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2043] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x282];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20fd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x291];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x215a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21b7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22ce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x232b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23e5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24fc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2559] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25b6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x309];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2613] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x318];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2670] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x327];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x272a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x336];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2787] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x345];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27e4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x354];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2841] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x363];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28fb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x372];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2958] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x381];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29b5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x390];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a6f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2acc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b86] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c9d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cfa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d57] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2db4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e6e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x408];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ecb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x417];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f28] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x426];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fe2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x435];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x303f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x444];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30f9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x453];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3210] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x462];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x326d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x471];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32ca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x480];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3384] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33e1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x349b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35b2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x360f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36c9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37e0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1330] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xd0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13ea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1447] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x155e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15bb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x12a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1618] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x139];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1675] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x148];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x172f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x157];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x178c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x166];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17e9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x175];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x184];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1900] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x193];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19ba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a74] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ad1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b2e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b8b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1be8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c45] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1cff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d5c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1db9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x229];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e16] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x238];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e73] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x247];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f2d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x256];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f8a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x265];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fe7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x274];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2044] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x283];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20fe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x292];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x215b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21b8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22cf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x232c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23e6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24fd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x255a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25b7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2614] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x319];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2671] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x328];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x272b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x337];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2788] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x346];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27e5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x355];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2842] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x364];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28fc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x373];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2959] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x382];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29b6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x391];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a70] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2acd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b87] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c9e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cfb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d58] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2db5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e6f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x409];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ecc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x418];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f29] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x427];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fe3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x436];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3040] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x445];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30fa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x454];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3211] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x463];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x326e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x472];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32cb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x481];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3385] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x490];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33e2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x349c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35b3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3610] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36ca] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37e1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x138e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x13eb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xef];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1448] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfe];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x14a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x155f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x15bc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[299];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1619] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1676] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x149];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1730] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x158];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x178d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x167];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x17ea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x176];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x18a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x185];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1901] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x194];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x19bb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a75] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ad2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b2f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b8c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1be9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c46] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d00] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d5d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e17] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x239];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e74] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x248];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f2e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[599];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f8b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x266];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fe8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x275];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2045] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x284];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x293];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x215c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21b9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22d0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x232d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23e7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24fe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x255b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25b8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2615] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2672] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x329];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x272c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x338];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2789] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x347];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27e6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x356];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2843] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x365];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28fd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x374];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x295a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[899];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29b7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x392];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a71] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ace] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b88] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c9f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cfc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d59] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2db6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e70] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ecd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x419];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f2a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x428];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fe4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x437];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3041] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x446];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30fb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x455];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3212] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x464];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x326f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x473];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32cc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x482];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3386] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x491];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33e3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x349d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35b4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3611] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36cb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37e2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1a76] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fe9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2046] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xff];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2100] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x215d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21ba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[300];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2274] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22d1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x232e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x159];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x238b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x168];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23e8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x177];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2445] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x186];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24a2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x195];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x255c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25b9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2616] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2673] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26d0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ef];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x272d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fe];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x278a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27e7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2844] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28a1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28fe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x249];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x295b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[600];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29b8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x267];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a15] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x276];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a72] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x285];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2acf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x294];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b2c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b89] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2be6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c43] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ca0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cfd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d5a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2db7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e14] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e71] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ece] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x339];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f2b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x348];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f88] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x357];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fe5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x366];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3042] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x375];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x309f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[900];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30fc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x393];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3159] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31b6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3213] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3270] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32cd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x332a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3387] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33e4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3441] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x349e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x429];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34fb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x438];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3558] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x447];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35b5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x456];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3612] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x465];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x366f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x474];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36cc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x483];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3729] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x492];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3786] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37e3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3840] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x389d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38fa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ad4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2047] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x100];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2101] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x215e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21bb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x12d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2275] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22d2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x232f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x238c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x169];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23e9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x178];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2446] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x187];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x196];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2500] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x255d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25ba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2617] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2674] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26d1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x272e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ff];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x278b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27e8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2845] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28a2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x295c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x259];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29b9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x268];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a16] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x277];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a73] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x286];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ad0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x295];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b2d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b8a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2be7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c44] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ca1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cfe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ef];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d5b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fe];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2db8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e15] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e72] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ecf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f2c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x349];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f89] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x358];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fe6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x367];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3043] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x376];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30a0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x385];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30fd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x394];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x315a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31b7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3214] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3271] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32ce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x332b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3388] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33e5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3442] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x349f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34fc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x439];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3559] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x448];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35b6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x457];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3613] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x466];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3670] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x475];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36cd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x484];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x372a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x493];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3787] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37e4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3841] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x389e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38fb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b32] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1feb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2048] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x101];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2102] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x110];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x215f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21bc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x12e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2276] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22d3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2330] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x238d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23ea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x179];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2447] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x188];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x197];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2501] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x255e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25bb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2618] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2675] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26d2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x272f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x200];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x278c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27e9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2846] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2900] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x295d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29ba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x269];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a17] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x278];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a74] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x287];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ad1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x296];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b2e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b8b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2be8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c45] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ca2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d5c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ff];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2db9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e16] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e73] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ed0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f2d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f8a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x359];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fe7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x368];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3044] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x377];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30a1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x386];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30fe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x395];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x315b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31b8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3215] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3272] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32cf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x332c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ef];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3389] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fe];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33e6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3443] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34a0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34fd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x355a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x449];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35b7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x458];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3614] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x467];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3671] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x476];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36ce] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x485];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x372b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x494];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3788] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37e5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3842] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x389f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38fc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1b90] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2049] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x102];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2103] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x111];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2160] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x120];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21bd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x12f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2277] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22d4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2331] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x238e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23eb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2448] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x189];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x198];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2502] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x255f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25bc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2619] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2676] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26d3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2730] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x201];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x278d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x210];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27ea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2847] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2901] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x295e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29bb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a18] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x279];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a75] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x288];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ad2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x297];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b2f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b8c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2be9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c46] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ca3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d00] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d5d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x300];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e17] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e74] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ed1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f2e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f8b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fe8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x369];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3045] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x378];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30a2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x387];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x396];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x315c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31b9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3216] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3273] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32d0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x332d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x338a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ff];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33e7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3444] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34a1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34fe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x355b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35b8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x459];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3615] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x468];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3672] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x477];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36cf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x486];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x372c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x495];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3789] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37e6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3843] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38a0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38fd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1bee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x204a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x103];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2104] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x112];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2161] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x121];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21be] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x130];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2278] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22d5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2332] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x238f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23ec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2449] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x199];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2503] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2560] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25bd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x261a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2677] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26d4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[499];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2731] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x202];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x278e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x211];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27eb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x220];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2848] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2902] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x295f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29bc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a19] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a76] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x289];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ad3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x298];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b30] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b8d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c47] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ca4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d01] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d5e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x301];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dbb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x310];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e18] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[799];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e75] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ed2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f2f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f8c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fe9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3046] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x379];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x388];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3100] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x397];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x315d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31ba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3217] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3274] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32d1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x332e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x338b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x400];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33e8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3445] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34a2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x355c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[1099];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35b9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3616] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x469];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3673] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x478];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36d0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x487];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x372d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x496];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x378a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37e7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3844] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38a1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38fe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1c4c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x50];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x204b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x104];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2105] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x113];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2162] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x122];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21bf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x131];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2279] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x140];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22d6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x14f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2333] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2390] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23ed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x244a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2504] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2561] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25be] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x261b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2678] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26d5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[500];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2732] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x203];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x278f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x212];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27ec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x221];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2849] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x230];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x23f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2903] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2960] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29bd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a1a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a77] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ad4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x299];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b31] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b8e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2beb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c48] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ca5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d02] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d5f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x302];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dbc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x311];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e19] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[800];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e76] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x32f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ed3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f30] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f8d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3047] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x389];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3101] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x398];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x315e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31bb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3218] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3275] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32d2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x332f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x338c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x401];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33e9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x410];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3446] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x41f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3500] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x355d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35ba] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3617] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3674] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x479];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36d1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x488];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x372e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x497];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x378b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37e8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3845] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38a2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38ff] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1caa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x60];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1fef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x204c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x105];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2106] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x114];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2163] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x123];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21c0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x132];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x227a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x141];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22d7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x150];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2334] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x15f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2391] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23ee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x244b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2505] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2562] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25bf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x261c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2679] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26d6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2733] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x204];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2790] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x213];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27ed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x222];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x284a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x231];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x240];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2904] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x24f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2961] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29be] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a1b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a78] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ad5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b32] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b8f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c49] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ca6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d03] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d60] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x303];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dbd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x312];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e1a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x321];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e77] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x330];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ed4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x33f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f31] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f8e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2feb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3048] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3102] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x399];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x315f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31bc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3219] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3276] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32d3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3330] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x338d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x402];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33ea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x411];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3447] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x420];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x42f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3501] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x355e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35bb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3618] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3675] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36d2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x489];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x372f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x498];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x378c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37e9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3846] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38a3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3900] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d08] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x70];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ff0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x204d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20aa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x106];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2107] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x115];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2164] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x124];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21c1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x133];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x227b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x142];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22d8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x151];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2335] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x160];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2392] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x16f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23ef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x244c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2506] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2563] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25c0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x261d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x267a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26d7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2734] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x205];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2791] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x214];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27ee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x223];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x284b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x232];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x241];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2905] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x250];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2962] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x25f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29bf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a1c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a79] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ad6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b33] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b90] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c4a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ca7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d04] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d61] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x304];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dbe] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x313];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e1b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x322];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e78] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x331];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ed5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x340];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f32] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x34f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f8f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3049] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3103] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3160] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31bd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x321a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3277] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32d4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3331] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x338e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x403];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33eb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x412];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3448] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x421];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x430];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3502] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x43f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x355f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35bc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3619] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3676] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36d3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3730] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x499];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x378d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37ea] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3847] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38a4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3901] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e4];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1d66] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x80];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ff1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x204e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x107];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2108] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x116];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2165] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x125];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21c2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x134];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x227c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x143];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x152];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2336] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x161];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2393] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x170];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23f0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x17f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x244d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x18e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24aa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2507] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2564] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25c1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x261e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x267b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26d8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2735] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x206];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2792] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x215];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27ef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x224];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x284c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x233];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x242];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2906] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x251];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2963] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x260];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29c0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x26f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a1d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a7a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ad7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b34] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b91] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c4b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ca8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d05] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d62] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x305];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dbf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x314];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e1c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x323];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e79] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x332];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ed6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x341];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f33] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x350];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f90] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x35f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x304a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3104] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3161] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31be] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x321b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3278] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32d5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3332] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x338f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x404];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33ec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x413];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3449] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x422];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x431];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3503] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x440];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3560] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x44f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35bd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x361a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3677] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36d4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3731] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x378e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37eb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3848] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38a5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3902] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e5];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1dc4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x90];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ff2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x204f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xf9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20ac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x108];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2109] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x117];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2166] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x126];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21c3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x135];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x227d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x144];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x153];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2337] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x162];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2394] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x171];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x180];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x244e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[399];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2508] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2565] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25c2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x261f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x267c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2736] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x207];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2793] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x216];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27f0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x225];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x284d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x234];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28aa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x243];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2907] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x252];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2964] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x261];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29c1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x270];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a1e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x27f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a7b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ad8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b35] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b92] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[699];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c4c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ca9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d06] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d63] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x306];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dc0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x315];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e1d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x324];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e7a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x333];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ed7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x342];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f34] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x351];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f91] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x360];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x36f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x304b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3105] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3162] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31bf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x321c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3279] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32d6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[999];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3333] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3390] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x405];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33ed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x414];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x344a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x423];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x432];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3504] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x441];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3561] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x450];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35be] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x45f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x361b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3678] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36d5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3732] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x378f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4aa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37ec] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4b9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3849] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38a6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3903] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e6];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e22] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xa0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ff3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xeb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2050] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x109];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x210a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x118];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2167] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x127];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21c4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x136];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x227e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x145];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22db] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x154];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2338] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x163];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2395] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x172];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23f2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x181];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x244f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[400];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24ac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x19f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2509] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2566] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25c3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2620] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x267d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2737] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x208];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2794] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x217];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x226];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x284e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x235];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x244];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2908] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x253];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2965] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x262];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29c2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x271];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a1f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x280];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a7c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x28f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ad9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b36] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b93] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[700];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bf0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c4d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2caa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d07] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d64] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x307];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dc1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x316];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e1e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x325];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e7b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x334];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ed8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x343];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f35] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x352];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f92] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x361];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2fef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x370];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x304c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x37f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3106] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3163] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31c0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x321d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x327a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32d7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[1000];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3334] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3391] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x406];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33ee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x415];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x344b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x424];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x433];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3505] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x442];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3562] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x451];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35bf] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x460];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x361c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x46f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3679] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36d6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3733] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3790] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ab];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37ed] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ba];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x384a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4c9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38a7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3904] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e7];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1e80] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xb0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ff4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2051] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x210b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x119];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2168] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x128];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21c5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x137];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x227f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x146];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x155];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2339] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x164];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2396] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x173];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23f3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x182];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2450] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x191];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x250a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2567] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25c4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2621] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x267e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26db] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2738] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x209];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2795] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x218];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27f2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x227];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x284f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x236];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28ac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x245];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2909] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x254];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2966] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x263];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29c3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x272];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a20] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x281];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a7d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x290];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ada] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x29f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b37] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b94] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bf1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c4e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d08] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d65] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x308];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dc2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x317];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e1f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x326];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e7c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x335];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ed9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x344];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f36] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x353];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f93] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x362];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ff0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x371];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x304d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x380];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30aa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x38f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3107] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3164] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31c1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x321e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x327b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32d8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3335] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3392] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x407];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33ef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x416];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x344c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x425];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x434];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3506] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x443];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3563] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x452];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35c0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x461];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x361d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x470];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x367a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x47f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36d7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3734] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3791] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ac];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37ee] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x384b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ca];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38a8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4d9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3905] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e8];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ede] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xc0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ff5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2052] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20af] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x210c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2169] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x129];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21c6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x138];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2280] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x147];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22dd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x156];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x233a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x165];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2397] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x174];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23f4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x183];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2451] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x192];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x250b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2568] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25c5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2622] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x267f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26dc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2739] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2796] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x219];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27f3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x228];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2850] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x237];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x246];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x290a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x255];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2967] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x264];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29c4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x273];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a21] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x282];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a7e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x291];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2adb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b38] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b95] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bf2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c4f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d09] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d66] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x309];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dc3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x318];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e20] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x327];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e7d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x336];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2eda] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x345];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f37] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x354];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f94] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x363];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ff1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x372];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x304e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x381];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x390];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3108] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x39f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3165] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31c2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x321f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x327c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3336] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3f9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3393] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x408];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33f0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x417];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x344d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x426];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34aa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x435];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3507] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x444];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3564] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x453];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35c1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x462];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x361e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x471];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x367b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x480];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36d8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x48f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3735] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49e];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3792] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ad];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37ef] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x384c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38a9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4da];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3906] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4e9];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f3c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xd0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ff6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2053] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20b0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x210d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x216a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x12a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21c7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x139];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2281] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x148];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x157];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x233b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x166];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2398] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x175];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23f5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x184];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2452] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x193];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24af] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x250c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2569] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25c6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2623] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2680] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26dd] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x273a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2797] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27f4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x229];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2851] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x238];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28ae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x247];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x290b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x256];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2968] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x265];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29c5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x274];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a22] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x283];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a7f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x292];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2adc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b39] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b96] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bf3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c50] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d0a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d67] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dc4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x319];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e21] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x328];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e7e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x337];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2edb] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x346];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f38] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x355];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f95] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x364];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ff2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x373];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x304f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x382];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30ac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x391];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3109] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3166] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31c3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3220] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x327d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3eb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3337] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fa];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3394] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x409];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x418];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x344e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x427];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x436];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3508] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x445];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3565] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x454];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35c2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x463];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x361f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x472];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x367c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x481];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36d9] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x490];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3736] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x49f];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3793] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ae];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37f0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4bd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x384d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38aa] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4db];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3907] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4ea];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1f9a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xe0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x1ff7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xef];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2054] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0xfe];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x20b1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x10d];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x210e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x11c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x216b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[299];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x21c8] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x13a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2282] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x149];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x22df] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x158];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x233c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x167];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2399] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x176];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x23f6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x185];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2453] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x194];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x24b0] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1a3];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x250d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1b2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x256a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1c1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x25c7] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1d0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2624] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1df];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2681] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1ee];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x26de] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x1fd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x273b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x20c];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2798] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x21b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x27f5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x22a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2852] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x239];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x28af] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x248];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x290c] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[599];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2969] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x266];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x29c6] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x275];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a23] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x284];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2a80] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x293];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2add] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2a2];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b3a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2b1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2b97] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2c0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2bf4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2cf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2c51] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2de];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2cae] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2ed];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d0b] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x2fc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2d68] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x30b];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2dc5] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x31a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e22] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x329];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2e7f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x338];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2edc] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x347];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f39] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x356];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2f96] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x365];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x2ff3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x374];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3050] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[899];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x30ad] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x392];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x310a] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3a1];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3167] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3b0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x31c4] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3bf];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3221] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ce];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x327e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3dd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x32db] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3ec];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3338] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x3fb];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3395] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x40a];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x33f2] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x419];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x344f] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x428];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x34ac] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x437];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3509] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x446];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3566] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x455];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x35c3] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x464];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3620] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x473];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x367d] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x482];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x36da] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x491];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3737] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4a0];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3794] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4af];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x37f1] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4be];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x384e] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4cd];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x38ab] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4dc];
  M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.array
  [0x3908] = M1.super_PlainObjectBase<Eigen::Matrix<float,_15,_84,_0,_15,_84>_>.m_storage.m_data.
             array[0x4eb];
  M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array[6] = 0.0
  ;
  M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array[7] = 0.0
  ;
  M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array[8] = 0.0
  ;
  M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array[9] = 0.0
  ;
  M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array[10] =
       1.30321e-43;
  M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array[0xb] =
       0.0;
  M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array._0_8_ =
       (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M2;
  M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array._16_8_ =
       (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M2;
  Eigen::PartialPivLU<Eigen::Matrix<float,93,93,0,93,93>>::
  PartialPivLU<Eigen::Block<Eigen::Matrix<float,93,157,0,93,157>,93,93,false>>
            ((PartialPivLU<Eigen::Matrix<float,93,93,0,93,93>> *)&lu,
             (EigenBase<Eigen::Block<Eigen::Matrix<float,_93,_157,_0,_93,_157>,_93,_93,_false>_> *)
             &M3);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M2.super_PlainObjectBase<Eigen::Matrix<float,_93,_157,_0,_93,_157>_>.m_storage.m_data.
          array + 0x21c9);
  uStack_25740 = 0;
  uStack_25738 = 0x5d;
  uStack_25730 = 0x5d;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M2;
  BStack_24378.super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false>,_1>
  .super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false>,_0> =
       (MapBase<Eigen::Block<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false>,_0>)
       Eigen::SolverBase<Eigen::PartialPivLU<Eigen::Matrix<float,93,93,0,93,93>>>::
       solve<Eigen::Block<Eigen::Matrix<float,93,157,0,93,157>,93,64,false>>
                 ((SolverBase<Eigen::PartialPivLU<Eigen::Matrix<float,93,93,0,93,93>>> *)&lu,
                  (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_157,_0,_93,_157>,_93,_64,_false>_>
                   *)aCStack_25758);
  Eigen::PlainObjectBase<Eigen::Matrix<float,93,64,0,93,64>>::
  _set_noalias<Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<float,93,93,0,93,93>>,Eigen::Block<Eigen::Matrix<float,93,157,0,93,157>,93,64,false>>>
            ((PlainObjectBase<Eigen::Matrix<float,93,64,0,93,64>> *)&M3,
             (DenseBase<Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<float,_93,_93,_0,_93,_93>_>,_Eigen::Block<Eigen::Matrix<float,_93,_157,_0,_93,_157>,_93,_64,_false>_>_>
              *)&BStack_24378);
  Eigen::DenseBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>::Zero();
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,64,64,0,64,64>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,64,64,0,64,64>>>
            (xpr,aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x24);
  uStack_25740 = 0x24;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,0);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x42);
  uStack_25740 = 0x42;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,1);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x43);
  uStack_25740 = 0x43;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,2);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x44);
  uStack_25740 = 0x44;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x45);
  uStack_25740 = 0x45;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,4);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x46);
  uStack_25740 = 0x46;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,5);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x47);
  uStack_25740 = 0x47;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,6);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array[7] =
       1.0;
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x4f);
  uStack_25740 = 0x4f;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,8);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x50);
  uStack_25740 = 0x50;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,9);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x51);
  uStack_25740 = 0x51;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,10);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x52);
  uStack_25740 = 0x52;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,0xb);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x53);
  uStack_25740 = 0x53;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,0xc);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x54);
  uStack_25740 = 0x54;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,0xd);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x55);
  uStack_25740 = 0x55;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,0xe);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x56);
  uStack_25740 = 0x56;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,0xf);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x57);
  uStack_25740 = 0x57;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,0x10);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x58);
  uStack_25740 = 0x58;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,0x11);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x59);
  uStack_25740 = 0x59;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,0x12);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x5a);
  uStack_25740 = 0x5a;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,0x13);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x5b);
  uStack_25740 = 0x5b;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,0x14);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  aCStack_25758[0] =
       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
        )(M3.super_PlainObjectBase<Eigen::Matrix<float,_93,_64,_0,_93,_64>_>.m_storage.m_data.array
         + 0x5c);
  uStack_25740 = 0x5c;
  uStack_25738 = 0;
  uStack_25730 = 1;
  pPStack_25748 = (PlainObjectBase<Eigen::Matrix<float,93,157,0,93,157>> *)&M3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_64,_64,_0,_64,_64>,_1,_64,_false,_true>::
  BlockImpl_dense(&BStack_24378,xpr,0x15);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<float,64,64,0,64,64>,1,64,false>> *)
             &BStack_24378,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             aCStack_25758);
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x56] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x97] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xd8] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x119] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x15a] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x19b] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x1dc] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x39d] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x3de] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x41f] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x460] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x4a1] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x4e2] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x523] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x564] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x5a5] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x5e6] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x627] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x668] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x6a9] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x6ea] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x72b] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x8ac] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x8ed] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x92e] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x96f] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x9b0] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x9f1] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xa32] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xa73] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xab4] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xaf5] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xc36] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xc77] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xcb8] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xcf9] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xd3a] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xd7b] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xe7c] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xebd] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xefe] = 1.0;
  (xpr->super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xfbf] = 1.0;
  lVar6 = 0x858;
  do {
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)
               ((long)&m[0][0][0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  return;
}

Assistant:

void setupAction(
    const std::vector<Eigen::Matrix<floatPrec,6,1>,Eigen::aligned_allocator< Eigen::Matrix<floatPrec,6,1> > > & L1,
    const std::vector<Eigen::Matrix<floatPrec,6,1>,Eigen::aligned_allocator< Eigen::Matrix<floatPrec,6,1> > > & L2,
    Eigen::Matrix<floatPrec,64,64> & Action )
{
  std::vector<floatPrec> m[DECA_EQS][5][3];
  for( int primI = 0; primI < DECA_EQS; primI++ )
  {
    for( int secI = 0; secI < 6; secI++ )
    {
      if( primI != secI )
      {
        const Eigen::Matrix<floatPrec,6,1> & l01 = L1[primI];
        const Eigen::Matrix<floatPrec,6,1> & l02 = L2[primI];
        const Eigen::Matrix<floatPrec,6,1> & l11 = L1[secI];
        const Eigen::Matrix<floatPrec,6,1> & l12 = L2[secI];
        
        int r = secI;
        if(secI > primI)
          r--;
        
        fillRow1<floatPrec>( l01, l02, l11, l12, m[primI][r][0], m[primI][r][1], m[primI][r][2] );
      }
    }
  }

  Eigen::Matrix<floatPrec,EQS,84> M1p = Eigen::Matrix<floatPrec,EQS,84>::Zero();
  
  int decaIndex = 0;
  int row0 = 0;
  int row1 = 1;
  int row2 = 2;
  
  for( int row = 0; row < EQS; row++ )
  {
    fillRow2<floatPrec>( M1p, row, m[decaIndex][row0], m[decaIndex][row1], m[decaIndex][row2] );
    
    row2++;
    if( row2 > 4 )
    {
      row1++;
      row2 = row1 + 1;
      if( row1 > 3 )
      {
        row0++;
        row1 = row0 + 1;
        row2 = row1 + 1;
        
        if( row0 > 2)
        {
          decaIndex++;
          row0 = 0;
          row1 = 1;
          row2 = 2;
        }
      }
    }
  }
  
  //this is currently hardcoded for 15 equations!
  //Eigen::Matrix<floatPrec,15,15> M1_part1 = M1.block<15,15>(0,0);
  //Eigen::Matrix<floatPrec,15,84> M1_part2 = M1_part1.inverse() * M1;
  //M1 = M1_part2;
  
  Eigen::Matrix<floatPrec,EQS,15> B = M1p.template block<EQS,15>(0,0);
  Eigen::Matrix<floatPrec,15,EQS> Bt = B.transpose();
  Eigen::Matrix<floatPrec,15,15> BtB = Bt * B;
  Eigen::Matrix<floatPrec,15,84> M1 = BtB.inverse() * Bt * M1p;
  
  Eigen::Matrix<floatPrec,93,157> M2 = Eigen::Matrix<floatPrec,93,157>::Zero();
M2(0,23) = M1(14,14); M2(0,24) = M1(14,15); M2(0,25) = M1(14,16); M2(0,26) = M1(14,17); M2(0,27) = M1(14,18); M2(0,28) = M1(14,19); M2(0,29) = M1(14,20); M2(0,30) = M1(14,21); M2(0,31) = M1(14,22); M2(0,32) = M1(14,23); M2(0,33) = M1(14,24); M2(0,34) = M1(14,25); M2(0,35) = M1(14,26); M2(0,36) = M1(14,27); M2(0,52) = M1(14,28); M2(0,53) = M1(14,29); M2(0,54) = M1(14,30); M2(0,55) = M1(14,31); M2(0,56) = M1(14,32); M2(0,57) = M1(14,33); M2(0,58) = M1(14,34); M2(0,59) = M1(14,35); M2(0,60) = M1(14,36); M2(0,61) = M1(14,37); M2(0,62) = M1(14,38); M2(0,63) = M1(14,39); M2(0,64) = M1(14,40); M2(0,65) = M1(14,41); M2(0,66) = M1(14,42); M2(0,67) = M1(14,43); M2(0,68) = M1(14,44); M2(0,69) = M1(14,45); M2(0,70) = M1(14,46); M2(0,71) = M1(14,47); M2(0,85) = M1(14,49); M2(0,86) = M1(14,50); M2(0,87) = M1(14,51); M2(0,88) = M1(14,52); M2(0,89) = M1(14,53); M2(0,90) = M1(14,54); M2(0,91) = M1(14,55); M2(0,92) = M1(14,56); M2(0,93) = M1(14,48); M2(0,94) = M1(14,57); M2(0,95) = M1(14,58); M2(0,96) = M1(14,59); M2(0,97) = M1(14,60); M2(0,98) = M1(14,61); M2(0,99) = M1(14,62); M2(0,100) = M1(14,63); M2(0,112) = M1(14,64); M2(0,113) = M1(14,65); M2(0,114) = M1(14,66); M2(0,115) = M1(14,67); M2(0,116) = M1(14,68); M2(0,117) = M1(14,69); M2(0,118) = M1(14,70); M2(0,119) = M1(14,71); M2(0,120) = M1(14,72); M2(0,121) = M1(14,73); M2(0,131) = M1(14,74); M2(0,132) = M1(14,75); M2(0,133) = M1(14,76); M2(0,134) = M1(14,77); M2(0,135) = M1(14,78); M2(0,136) = M1(14,79); M2(0,144) = M1(14,80); M2(0,145) = M1(14,81); M2(0,146) = M1(14,82); M2(0,152) = M1(14,83); 
M2(1,18) = M1(14,14); M2(1,19) = M1(14,15); M2(1,20) = M1(14,16); M2(1,21) = M1(14,17); M2(1,23) = M1(14,18); M2(1,24) = M1(14,19); M2(1,25) = M1(14,20); M2(1,26) = M1(14,21); M2(1,28) = M1(14,22); M2(1,29) = M1(14,23); M2(1,30) = M1(14,24); M2(1,32) = M1(14,25); M2(1,33) = M1(14,26); M2(1,35) = M1(14,27); M2(1,46) = M1(14,28); M2(1,47) = M1(14,29); M2(1,48) = M1(14,30); M2(1,49) = M1(14,31); M2(1,50) = M1(14,32); M2(1,51) = M1(14,33); M2(1,53) = M1(14,34); M2(1,54) = M1(14,35); M2(1,55) = M1(14,36); M2(1,56) = M1(14,37); M2(1,57) = M1(14,38); M2(1,59) = M1(14,39); M2(1,60) = M1(14,40); M2(1,61) = M1(14,41); M2(1,62) = M1(14,42); M2(1,64) = M1(14,43); M2(1,65) = M1(14,44); M2(1,66) = M1(14,45); M2(1,68) = M1(14,46); M2(1,69) = M1(14,47); M2(1,71) = M1(14,48); M2(1,80) = M1(14,49); M2(1,81) = M1(14,50); M2(1,82) = M1(14,51); M2(1,83) = M1(14,52); M2(1,84) = M1(14,53); M2(1,86) = M1(14,54); M2(1,87) = M1(14,55); M2(1,88) = M1(14,56); M2(1,89) = M1(14,57); M2(1,91) = M1(14,58); M2(1,92) = M1(14,59); M2(1,94) = M1(14,60); M2(1,96) = M1(14,61); M2(1,97) = M1(14,62); M2(1,99) = M1(14,63); M2(1,108) = M1(14,64); M2(1,109) = M1(14,65); M2(1,110) = M1(14,66); M2(1,111) = M1(14,67); M2(1,113) = M1(14,68); M2(1,114) = M1(14,69); M2(1,115) = M1(14,70); M2(1,117) = M1(14,71); M2(1,118) = M1(14,72); M2(1,120) = M1(14,73); M2(1,128) = M1(14,74); M2(1,129) = M1(14,75); M2(1,130) = M1(14,76); M2(1,132) = M1(14,77); M2(1,133) = M1(14,78); M2(1,135) = M1(14,79); M2(1,142) = M1(14,80); M2(1,143) = M1(14,81); M2(1,145) = M1(14,82); M2(1,151) = M1(14,83); 
M2(2,6) = M1(8,8); M2(2,13) = M1(8,15); M2(2,14) = M1(8,16); M2(2,15) = M1(8,17); M2(2,18) = M1(8,18); M2(2,19) = M1(8,19); M2(2,20) = M1(8,20); M2(2,21) = M1(8,21); M2(2,24) = M1(8,22); M2(2,25) = M1(8,23); M2(2,26) = M1(8,24); M2(2,29) = M1(8,25); M2(2,30) = M1(8,26); M2(2,33) = M1(8,27); M2(2,39) = M1(8,28); M2(2,40) = M1(8,29); M2(2,41) = M1(8,30); M2(2,42) = M1(8,31); M2(2,43) = M1(8,32); M2(2,44) = M1(8,33); M2(2,47) = M1(8,34); M2(2,48) = M1(8,35); M2(2,49) = M1(8,36); M2(2,50) = M1(8,37); M2(2,51) = M1(8,38); M2(2,54) = M1(8,39); M2(2,55) = M1(8,40); M2(2,56) = M1(8,41); M2(2,57) = M1(8,42); M2(2,60) = M1(8,43); M2(2,61) = M1(8,44); M2(2,62) = M1(8,45); M2(2,65) = M1(8,46); M2(2,66) = M1(8,47); M2(2,69) = M1(8,48); M2(2,74) = M1(8,49); M2(2,75) = M1(8,50); M2(2,76) = M1(8,51); M2(2,77) = M1(8,52); M2(2,78) = M1(8,53); M2(2,81) = M1(8,54); M2(2,82) = M1(8,55); M2(2,83) = M1(8,56); M2(2,84) = M1(8,57); M2(2,87) = M1(8,58); M2(2,88) = M1(8,59); M2(2,89) = M1(8,60); M2(2,92) = M1(8,61); M2(2,94) = M1(8,62); M2(2,97) = M1(8,63); M2(2,103) = M1(8,64); M2(2,104) = M1(8,65); M2(2,105) = M1(8,66); M2(2,106) = M1(8,67); M2(2,109) = M1(8,68); M2(2,110) = M1(8,69); M2(2,111) = M1(8,70); M2(2,114) = M1(8,71); M2(2,115) = M1(8,72); M2(2,118) = M1(8,73); M2(2,124) = M1(8,74); M2(2,125) = M1(8,75); M2(2,126) = M1(8,76); M2(2,129) = M1(8,77); M2(2,130) = M1(8,78); M2(2,133) = M1(8,79); M2(2,139) = M1(8,80); M2(2,140) = M1(8,81); M2(2,143) = M1(8,82); M2(2,149) = M1(8,83); 
M2(3,7) = M1(9,9); M2(3,13) = M1(9,15); M2(3,14) = M1(9,16); M2(3,15) = M1(9,17); M2(3,18) = M1(9,18); M2(3,19) = M1(9,19); M2(3,20) = M1(9,20); M2(3,21) = M1(9,21); M2(3,24) = M1(9,22); M2(3,25) = M1(9,23); M2(3,26) = M1(9,24); M2(3,29) = M1(9,25); M2(3,30) = M1(9,26); M2(3,33) = M1(9,27); M2(3,39) = M1(9,28); M2(3,40) = M1(9,29); M2(3,41) = M1(9,30); M2(3,42) = M1(9,31); M2(3,43) = M1(9,32); M2(3,44) = M1(9,33); M2(3,47) = M1(9,34); M2(3,48) = M1(9,35); M2(3,49) = M1(9,36); M2(3,50) = M1(9,37); M2(3,51) = M1(9,38); M2(3,54) = M1(9,39); M2(3,55) = M1(9,40); M2(3,56) = M1(9,41); M2(3,57) = M1(9,42); M2(3,60) = M1(9,43); M2(3,61) = M1(9,44); M2(3,62) = M1(9,45); M2(3,65) = M1(9,46); M2(3,66) = M1(9,47); M2(3,69) = M1(9,48); M2(3,74) = M1(9,49); M2(3,75) = M1(9,50); M2(3,76) = M1(9,51); M2(3,77) = M1(9,52); M2(3,78) = M1(9,53); M2(3,81) = M1(9,54); M2(3,82) = M1(9,55); M2(3,83) = M1(9,56); M2(3,84) = M1(9,57); M2(3,87) = M1(9,58); M2(3,88) = M1(9,59); M2(3,89) = M1(9,60); M2(3,92) = M1(9,61); M2(3,94) = M1(9,62); M2(3,97) = M1(9,63); M2(3,103) = M1(9,64); M2(3,104) = M1(9,65); M2(3,105) = M1(9,66); M2(3,106) = M1(9,67); M2(3,109) = M1(9,68); M2(3,110) = M1(9,69); M2(3,111) = M1(9,70); M2(3,114) = M1(9,71); M2(3,115) = M1(9,72); M2(3,118) = M1(9,73); M2(3,124) = M1(9,74); M2(3,125) = M1(9,75); M2(3,126) = M1(9,76); M2(3,129) = M1(9,77); M2(3,130) = M1(9,78); M2(3,133) = M1(9,79); M2(3,139) = M1(9,80); M2(3,140) = M1(9,81); M2(3,143) = M1(9,82); M2(3,149) = M1(9,83); 
M2(4,8) = M1(10,10); M2(4,13) = M1(10,15); M2(4,14) = M1(10,16); M2(4,15) = M1(10,17); M2(4,18) = M1(10,18); M2(4,19) = M1(10,19); M2(4,20) = M1(10,20); M2(4,21) = M1(10,21); M2(4,24) = M1(10,22); M2(4,25) = M1(10,23); M2(4,26) = M1(10,24); M2(4,29) = M1(10,25); M2(4,30) = M1(10,26); M2(4,33) = M1(10,27); M2(4,39) = M1(10,28); M2(4,40) = M1(10,29); M2(4,41) = M1(10,30); M2(4,42) = M1(10,31); M2(4,43) = M1(10,32); M2(4,44) = M1(10,33); M2(4,47) = M1(10,34); M2(4,48) = M1(10,35); M2(4,49) = M1(10,36); M2(4,50) = M1(10,37); M2(4,51) = M1(10,38); M2(4,54) = M1(10,39); M2(4,55) = M1(10,40); M2(4,56) = M1(10,41); M2(4,57) = M1(10,42); M2(4,60) = M1(10,43); M2(4,61) = M1(10,44); M2(4,62) = M1(10,45); M2(4,65) = M1(10,46); M2(4,66) = M1(10,47); M2(4,69) = M1(10,48); M2(4,74) = M1(10,49); M2(4,75) = M1(10,50); M2(4,76) = M1(10,51); M2(4,77) = M1(10,52); M2(4,78) = M1(10,53); M2(4,81) = M1(10,54); M2(4,82) = M1(10,55); M2(4,83) = M1(10,56); M2(4,84) = M1(10,57); M2(4,87) = M1(10,58); M2(4,88) = M1(10,59); M2(4,89) = M1(10,60); M2(4,92) = M1(10,61); M2(4,94) = M1(10,62); M2(4,97) = M1(10,63); M2(4,103) = M1(10,64); M2(4,104) = M1(10,65); M2(4,105) = M1(10,66); M2(4,106) = M1(10,67); M2(4,109) = M1(10,68); M2(4,110) = M1(10,69); M2(4,111) = M1(10,70); M2(4,114) = M1(10,71); M2(4,115) = M1(10,72); M2(4,118) = M1(10,73); M2(4,124) = M1(10,74); M2(4,125) = M1(10,75); M2(4,126) = M1(10,76); M2(4,129) = M1(10,77); M2(4,130) = M1(10,78); M2(4,133) = M1(10,79); M2(4,139) = M1(10,80); M2(4,140) = M1(10,81); M2(4,143) = M1(10,82); M2(4,149) = M1(10,83); 
M2(5,9) = M1(11,11); M2(5,13) = M1(11,15); M2(5,14) = M1(11,16); M2(5,15) = M1(11,17); M2(5,18) = M1(11,18); M2(5,19) = M1(11,19); M2(5,20) = M1(11,20); M2(5,21) = M1(11,21); M2(5,24) = M1(11,22); M2(5,25) = M1(11,23); M2(5,26) = M1(11,24); M2(5,29) = M1(11,25); M2(5,30) = M1(11,26); M2(5,33) = M1(11,27); M2(5,39) = M1(11,28); M2(5,40) = M1(11,29); M2(5,41) = M1(11,30); M2(5,42) = M1(11,31); M2(5,43) = M1(11,32); M2(5,44) = M1(11,33); M2(5,47) = M1(11,34); M2(5,48) = M1(11,35); M2(5,49) = M1(11,36); M2(5,50) = M1(11,37); M2(5,51) = M1(11,38); M2(5,54) = M1(11,39); M2(5,55) = M1(11,40); M2(5,56) = M1(11,41); M2(5,57) = M1(11,42); M2(5,60) = M1(11,43); M2(5,61) = M1(11,44); M2(5,62) = M1(11,45); M2(5,65) = M1(11,46); M2(5,66) = M1(11,47); M2(5,69) = M1(11,48); M2(5,74) = M1(11,49); M2(5,75) = M1(11,50); M2(5,76) = M1(11,51); M2(5,77) = M1(11,52); M2(5,78) = M1(11,53); M2(5,81) = M1(11,54); M2(5,82) = M1(11,55); M2(5,83) = M1(11,56); M2(5,84) = M1(11,57); M2(5,87) = M1(11,58); M2(5,88) = M1(11,59); M2(5,89) = M1(11,60); M2(5,92) = M1(11,61); M2(5,94) = M1(11,62); M2(5,97) = M1(11,63); M2(5,103) = M1(11,64); M2(5,104) = M1(11,65); M2(5,105) = M1(11,66); M2(5,106) = M1(11,67); M2(5,109) = M1(11,68); M2(5,110) = M1(11,69); M2(5,111) = M1(11,70); M2(5,114) = M1(11,71); M2(5,115) = M1(11,72); M2(5,118) = M1(11,73); M2(5,124) = M1(11,74); M2(5,125) = M1(11,75); M2(5,126) = M1(11,76); M2(5,129) = M1(11,77); M2(5,130) = M1(11,78); M2(5,133) = M1(11,79); M2(5,139) = M1(11,80); M2(5,140) = M1(11,81); M2(5,143) = M1(11,82); M2(5,149) = M1(11,83); 
M2(6,11) = M1(13,13); M2(6,13) = M1(13,15); M2(6,14) = M1(13,16); M2(6,15) = M1(13,17); M2(6,18) = M1(13,18); M2(6,19) = M1(13,19); M2(6,20) = M1(13,20); M2(6,21) = M1(13,21); M2(6,24) = M1(13,22); M2(6,25) = M1(13,23); M2(6,26) = M1(13,24); M2(6,29) = M1(13,25); M2(6,30) = M1(13,26); M2(6,33) = M1(13,27); M2(6,39) = M1(13,28); M2(6,40) = M1(13,29); M2(6,41) = M1(13,30); M2(6,42) = M1(13,31); M2(6,43) = M1(13,32); M2(6,44) = M1(13,33); M2(6,47) = M1(13,34); M2(6,48) = M1(13,35); M2(6,49) = M1(13,36); M2(6,50) = M1(13,37); M2(6,51) = M1(13,38); M2(6,54) = M1(13,39); M2(6,55) = M1(13,40); M2(6,56) = M1(13,41); M2(6,57) = M1(13,42); M2(6,60) = M1(13,43); M2(6,61) = M1(13,44); M2(6,62) = M1(13,45); M2(6,65) = M1(13,46); M2(6,66) = M1(13,47); M2(6,69) = M1(13,48); M2(6,74) = M1(13,49); M2(6,75) = M1(13,50); M2(6,76) = M1(13,51); M2(6,77) = M1(13,52); M2(6,78) = M1(13,53); M2(6,81) = M1(13,54); M2(6,82) = M1(13,55); M2(6,83) = M1(13,56); M2(6,84) = M1(13,57); M2(6,87) = M1(13,58); M2(6,88) = M1(13,59); M2(6,89) = M1(13,60); M2(6,92) = M1(13,61); M2(6,94) = M1(13,62); M2(6,97) = M1(13,63); M2(6,103) = M1(13,64); M2(6,104) = M1(13,65); M2(6,105) = M1(13,66); M2(6,106) = M1(13,67); M2(6,109) = M1(13,68); M2(6,110) = M1(13,69); M2(6,111) = M1(13,70); M2(6,114) = M1(13,71); M2(6,115) = M1(13,72); M2(6,118) = M1(13,73); M2(6,124) = M1(13,74); M2(6,125) = M1(13,75); M2(6,126) = M1(13,76); M2(6,129) = M1(13,77); M2(6,130) = M1(13,78); M2(6,133) = M1(13,79); M2(6,139) = M1(13,80); M2(6,140) = M1(13,81); M2(6,143) = M1(13,82); M2(6,149) = M1(13,83); 
M2(7,12) = M1(14,14); M2(7,13) = M1(14,15); M2(7,14) = M1(14,16); M2(7,15) = M1(14,17); M2(7,18) = M1(14,18); M2(7,19) = M1(14,19); M2(7,20) = M1(14,20); M2(7,21) = M1(14,21); M2(7,24) = M1(14,22); M2(7,25) = M1(14,23); M2(7,26) = M1(14,24); M2(7,29) = M1(14,25); M2(7,30) = M1(14,26); M2(7,33) = M1(14,27); M2(7,39) = M1(14,28); M2(7,40) = M1(14,29); M2(7,41) = M1(14,30); M2(7,42) = M1(14,31); M2(7,43) = M1(14,32); M2(7,44) = M1(14,33); M2(7,47) = M1(14,34); M2(7,48) = M1(14,35); M2(7,49) = M1(14,36); M2(7,50) = M1(14,37); M2(7,51) = M1(14,38); M2(7,54) = M1(14,39); M2(7,55) = M1(14,40); M2(7,56) = M1(14,41); M2(7,57) = M1(14,42); M2(7,60) = M1(14,43); M2(7,61) = M1(14,44); M2(7,62) = M1(14,45); M2(7,65) = M1(14,46); M2(7,66) = M1(14,47); M2(7,69) = M1(14,48); M2(7,74) = M1(14,49); M2(7,75) = M1(14,50); M2(7,76) = M1(14,51); M2(7,77) = M1(14,52); M2(7,78) = M1(14,53); M2(7,81) = M1(14,54); M2(7,82) = M1(14,55); M2(7,83) = M1(14,56); M2(7,84) = M1(14,57); M2(7,87) = M1(14,58); M2(7,88) = M1(14,59); M2(7,89) = M1(14,60); M2(7,92) = M1(14,61); M2(7,94) = M1(14,62); M2(7,97) = M1(14,63); M2(7,103) = M1(14,64); M2(7,104) = M1(14,65); M2(7,105) = M1(14,66); M2(7,106) = M1(14,67); M2(7,109) = M1(14,68); M2(7,110) = M1(14,69); M2(7,111) = M1(14,70); M2(7,114) = M1(14,71); M2(7,115) = M1(14,72); M2(7,118) = M1(14,73); M2(7,124) = M1(14,74); M2(7,125) = M1(14,75); M2(7,126) = M1(14,76); M2(7,129) = M1(14,77); M2(7,130) = M1(14,78); M2(7,133) = M1(14,79); M2(7,139) = M1(14,80); M2(7,140) = M1(14,81); M2(7,143) = M1(14,82); M2(7,149) = M1(14,83); 
M2(8,10) = M1(8,8); M2(8,18) = M1(8,15); M2(8,19) = M1(8,16); M2(8,20) = M1(8,17); M2(8,22) = M1(8,18); M2(8,23) = M1(8,19); M2(8,24) = M1(8,20); M2(8,25) = M1(8,21); M2(8,27) = M1(8,22); M2(8,28) = M1(8,23); M2(8,29) = M1(8,24); M2(8,31) = M1(8,25); M2(8,32) = M1(8,26); M2(8,34) = M1(8,27); M2(8,45) = M1(8,28); M2(8,46) = M1(8,29); M2(8,47) = M1(8,30); M2(8,48) = M1(8,31); M2(8,49) = M1(8,32); M2(8,50) = M1(8,33); M2(8,52) = M1(8,34); M2(8,53) = M1(8,35); M2(8,54) = M1(8,36); M2(8,55) = M1(8,37); M2(8,56) = M1(8,38); M2(8,58) = M1(8,39); M2(8,59) = M1(8,40); M2(8,60) = M1(8,41); M2(8,61) = M1(8,42); M2(8,63) = M1(8,43); M2(8,64) = M1(8,44); M2(8,65) = M1(8,45); M2(8,67) = M1(8,46); M2(8,68) = M1(8,47); M2(8,70) = M1(8,48); M2(8,79) = M1(8,49); M2(8,80) = M1(8,50); M2(8,81) = M1(8,51); M2(8,82) = M1(8,52); M2(8,83) = M1(8,53); M2(8,85) = M1(8,54); M2(8,86) = M1(8,55); M2(8,87) = M1(8,56); M2(8,88) = M1(8,57); M2(8,90) = M1(8,58); M2(8,91) = M1(8,59); M2(8,92) = M1(8,60); M2(8,95) = M1(8,61); M2(8,96) = M1(8,62); M2(8,98) = M1(8,63); M2(8,107) = M1(8,64); M2(8,108) = M1(8,65); M2(8,109) = M1(8,66); M2(8,110) = M1(8,67); M2(8,112) = M1(8,68); M2(8,113) = M1(8,69); M2(8,114) = M1(8,70); M2(8,116) = M1(8,71); M2(8,117) = M1(8,72); M2(8,119) = M1(8,73); M2(8,127) = M1(8,74); M2(8,128) = M1(8,75); M2(8,129) = M1(8,76); M2(8,131) = M1(8,77); M2(8,132) = M1(8,78); M2(8,134) = M1(8,79); M2(8,141) = M1(8,80); M2(8,142) = M1(8,81); M2(8,144) = M1(8,82); M2(8,150) = M1(8,83); 
M2(9,11) = M1(9,9); M2(9,18) = M1(9,15); M2(9,19) = M1(9,16); M2(9,20) = M1(9,17); M2(9,22) = M1(9,18); M2(9,23) = M1(9,19); M2(9,24) = M1(9,20); M2(9,25) = M1(9,21); M2(9,27) = M1(9,22); M2(9,28) = M1(9,23); M2(9,29) = M1(9,24); M2(9,31) = M1(9,25); M2(9,32) = M1(9,26); M2(9,34) = M1(9,27); M2(9,45) = M1(9,28); M2(9,46) = M1(9,29); M2(9,47) = M1(9,30); M2(9,48) = M1(9,31); M2(9,49) = M1(9,32); M2(9,50) = M1(9,33); M2(9,52) = M1(9,34); M2(9,53) = M1(9,35); M2(9,54) = M1(9,36); M2(9,55) = M1(9,37); M2(9,56) = M1(9,38); M2(9,58) = M1(9,39); M2(9,59) = M1(9,40); M2(9,60) = M1(9,41); M2(9,61) = M1(9,42); M2(9,63) = M1(9,43); M2(9,64) = M1(9,44); M2(9,65) = M1(9,45); M2(9,67) = M1(9,46); M2(9,68) = M1(9,47); M2(9,70) = M1(9,48); M2(9,79) = M1(9,49); M2(9,80) = M1(9,50); M2(9,81) = M1(9,51); M2(9,82) = M1(9,52); M2(9,83) = M1(9,53); M2(9,85) = M1(9,54); M2(9,86) = M1(9,55); M2(9,87) = M1(9,56); M2(9,88) = M1(9,57); M2(9,90) = M1(9,58); M2(9,91) = M1(9,59); M2(9,92) = M1(9,60); M2(9,95) = M1(9,61); M2(9,96) = M1(9,62); M2(9,98) = M1(9,63); M2(9,107) = M1(9,64); M2(9,108) = M1(9,65); M2(9,109) = M1(9,66); M2(9,110) = M1(9,67); M2(9,112) = M1(9,68); M2(9,113) = M1(9,69); M2(9,114) = M1(9,70); M2(9,116) = M1(9,71); M2(9,117) = M1(9,72); M2(9,119) = M1(9,73); M2(9,127) = M1(9,74); M2(9,128) = M1(9,75); M2(9,129) = M1(9,76); M2(9,131) = M1(9,77); M2(9,132) = M1(9,78); M2(9,134) = M1(9,79); M2(9,141) = M1(9,80); M2(9,142) = M1(9,81); M2(9,144) = M1(9,82); M2(9,150) = M1(9,83); 
M2(10,12) = M1(10,10); M2(10,18) = M1(10,15); M2(10,19) = M1(10,16); M2(10,20) = M1(10,17); M2(10,22) = M1(10,18); M2(10,23) = M1(10,19); M2(10,24) = M1(10,20); M2(10,25) = M1(10,21); M2(10,27) = M1(10,22); M2(10,28) = M1(10,23); M2(10,29) = M1(10,24); M2(10,31) = M1(10,25); M2(10,32) = M1(10,26); M2(10,34) = M1(10,27); M2(10,45) = M1(10,28); M2(10,46) = M1(10,29); M2(10,47) = M1(10,30); M2(10,48) = M1(10,31); M2(10,49) = M1(10,32); M2(10,50) = M1(10,33); M2(10,52) = M1(10,34); M2(10,53) = M1(10,35); M2(10,54) = M1(10,36); M2(10,55) = M1(10,37); M2(10,56) = M1(10,38); M2(10,58) = M1(10,39); M2(10,59) = M1(10,40); M2(10,60) = M1(10,41); M2(10,61) = M1(10,42); M2(10,63) = M1(10,43); M2(10,64) = M1(10,44); M2(10,65) = M1(10,45); M2(10,67) = M1(10,46); M2(10,68) = M1(10,47); M2(10,70) = M1(10,48); M2(10,79) = M1(10,49); M2(10,80) = M1(10,50); M2(10,81) = M1(10,51); M2(10,82) = M1(10,52); M2(10,83) = M1(10,53); M2(10,85) = M1(10,54); M2(10,86) = M1(10,55); M2(10,87) = M1(10,56); M2(10,88) = M1(10,57); M2(10,90) = M1(10,58); M2(10,91) = M1(10,59); M2(10,92) = M1(10,60); M2(10,95) = M1(10,61); M2(10,96) = M1(10,62); M2(10,98) = M1(10,63); M2(10,107) = M1(10,64); M2(10,108) = M1(10,65); M2(10,109) = M1(10,66); M2(10,110) = M1(10,67); M2(10,112) = M1(10,68); M2(10,113) = M1(10,69); M2(10,114) = M1(10,70); M2(10,116) = M1(10,71); M2(10,117) = M1(10,72); M2(10,119) = M1(10,73); M2(10,127) = M1(10,74); M2(10,128) = M1(10,75); M2(10,129) = M1(10,76); M2(10,131) = M1(10,77); M2(10,132) = M1(10,78); M2(10,134) = M1(10,79); M2(10,141) = M1(10,80); M2(10,142) = M1(10,81); M2(10,144) = M1(10,82); M2(10,150) = M1(10,83); 
M2(11,13) = M1(11,11); M2(11,18) = M1(11,15); M2(11,19) = M1(11,16); M2(11,20) = M1(11,17); M2(11,22) = M1(11,18); M2(11,23) = M1(11,19); M2(11,24) = M1(11,20); M2(11,25) = M1(11,21); M2(11,27) = M1(11,22); M2(11,28) = M1(11,23); M2(11,29) = M1(11,24); M2(11,31) = M1(11,25); M2(11,32) = M1(11,26); M2(11,34) = M1(11,27); M2(11,45) = M1(11,28); M2(11,46) = M1(11,29); M2(11,47) = M1(11,30); M2(11,48) = M1(11,31); M2(11,49) = M1(11,32); M2(11,50) = M1(11,33); M2(11,52) = M1(11,34); M2(11,53) = M1(11,35); M2(11,54) = M1(11,36); M2(11,55) = M1(11,37); M2(11,56) = M1(11,38); M2(11,58) = M1(11,39); M2(11,59) = M1(11,40); M2(11,60) = M1(11,41); M2(11,61) = M1(11,42); M2(11,63) = M1(11,43); M2(11,64) = M1(11,44); M2(11,65) = M1(11,45); M2(11,67) = M1(11,46); M2(11,68) = M1(11,47); M2(11,70) = M1(11,48); M2(11,79) = M1(11,49); M2(11,80) = M1(11,50); M2(11,81) = M1(11,51); M2(11,82) = M1(11,52); M2(11,83) = M1(11,53); M2(11,85) = M1(11,54); M2(11,86) = M1(11,55); M2(11,87) = M1(11,56); M2(11,88) = M1(11,57); M2(11,90) = M1(11,58); M2(11,91) = M1(11,59); M2(11,92) = M1(11,60); M2(11,95) = M1(11,61); M2(11,96) = M1(11,62); M2(11,98) = M1(11,63); M2(11,107) = M1(11,64); M2(11,108) = M1(11,65); M2(11,109) = M1(11,66); M2(11,110) = M1(11,67); M2(11,112) = M1(11,68); M2(11,113) = M1(11,69); M2(11,114) = M1(11,70); M2(11,116) = M1(11,71); M2(11,117) = M1(11,72); M2(11,119) = M1(11,73); M2(11,127) = M1(11,74); M2(11,128) = M1(11,75); M2(11,129) = M1(11,76); M2(11,131) = M1(11,77); M2(11,132) = M1(11,78); M2(11,134) = M1(11,79); M2(11,141) = M1(11,80); M2(11,142) = M1(11,81); M2(11,144) = M1(11,82); M2(11,150) = M1(11,83); 
M2(12,14) = M1(12,12); M2(12,18) = M1(12,15); M2(12,19) = M1(12,16); M2(12,20) = M1(12,17); M2(12,22) = M1(12,18); M2(12,23) = M1(12,19); M2(12,24) = M1(12,20); M2(12,25) = M1(12,21); M2(12,27) = M1(12,22); M2(12,28) = M1(12,23); M2(12,29) = M1(12,24); M2(12,31) = M1(12,25); M2(12,32) = M1(12,26); M2(12,34) = M1(12,27); M2(12,45) = M1(12,28); M2(12,46) = M1(12,29); M2(12,47) = M1(12,30); M2(12,48) = M1(12,31); M2(12,49) = M1(12,32); M2(12,50) = M1(12,33); M2(12,52) = M1(12,34); M2(12,53) = M1(12,35); M2(12,54) = M1(12,36); M2(12,55) = M1(12,37); M2(12,56) = M1(12,38); M2(12,58) = M1(12,39); M2(12,59) = M1(12,40); M2(12,60) = M1(12,41); M2(12,61) = M1(12,42); M2(12,63) = M1(12,43); M2(12,64) = M1(12,44); M2(12,65) = M1(12,45); M2(12,67) = M1(12,46); M2(12,68) = M1(12,47); M2(12,70) = M1(12,48); M2(12,79) = M1(12,49); M2(12,80) = M1(12,50); M2(12,81) = M1(12,51); M2(12,82) = M1(12,52); M2(12,83) = M1(12,53); M2(12,85) = M1(12,54); M2(12,86) = M1(12,55); M2(12,87) = M1(12,56); M2(12,88) = M1(12,57); M2(12,90) = M1(12,58); M2(12,91) = M1(12,59); M2(12,92) = M1(12,60); M2(12,95) = M1(12,61); M2(12,96) = M1(12,62); M2(12,98) = M1(12,63); M2(12,107) = M1(12,64); M2(12,108) = M1(12,65); M2(12,109) = M1(12,66); M2(12,110) = M1(12,67); M2(12,112) = M1(12,68); M2(12,113) = M1(12,69); M2(12,114) = M1(12,70); M2(12,116) = M1(12,71); M2(12,117) = M1(12,72); M2(12,119) = M1(12,73); M2(12,127) = M1(12,74); M2(12,128) = M1(12,75); M2(12,129) = M1(12,76); M2(12,131) = M1(12,77); M2(12,132) = M1(12,78); M2(12,134) = M1(12,79); M2(12,141) = M1(12,80); M2(12,142) = M1(12,81); M2(12,144) = M1(12,82); M2(12,150) = M1(12,83); 
M2(13,16) = M1(13,13); M2(13,18) = M1(13,15); M2(13,19) = M1(13,16); M2(13,20) = M1(13,17); M2(13,22) = M1(13,18); M2(13,23) = M1(13,19); M2(13,24) = M1(13,20); M2(13,25) = M1(13,21); M2(13,27) = M1(13,22); M2(13,28) = M1(13,23); M2(13,29) = M1(13,24); M2(13,31) = M1(13,25); M2(13,32) = M1(13,26); M2(13,34) = M1(13,27); M2(13,45) = M1(13,28); M2(13,46) = M1(13,29); M2(13,47) = M1(13,30); M2(13,48) = M1(13,31); M2(13,49) = M1(13,32); M2(13,50) = M1(13,33); M2(13,52) = M1(13,34); M2(13,53) = M1(13,35); M2(13,54) = M1(13,36); M2(13,55) = M1(13,37); M2(13,56) = M1(13,38); M2(13,58) = M1(13,39); M2(13,59) = M1(13,40); M2(13,60) = M1(13,41); M2(13,61) = M1(13,42); M2(13,63) = M1(13,43); M2(13,64) = M1(13,44); M2(13,65) = M1(13,45); M2(13,67) = M1(13,46); M2(13,68) = M1(13,47); M2(13,70) = M1(13,48); M2(13,79) = M1(13,49); M2(13,80) = M1(13,50); M2(13,81) = M1(13,51); M2(13,82) = M1(13,52); M2(13,83) = M1(13,53); M2(13,85) = M1(13,54); M2(13,86) = M1(13,55); M2(13,87) = M1(13,56); M2(13,88) = M1(13,57); M2(13,90) = M1(13,58); M2(13,91) = M1(13,59); M2(13,92) = M1(13,60); M2(13,95) = M1(13,61); M2(13,96) = M1(13,62); M2(13,98) = M1(13,63); M2(13,107) = M1(13,64); M2(13,108) = M1(13,65); M2(13,109) = M1(13,66); M2(13,110) = M1(13,67); M2(13,112) = M1(13,68); M2(13,113) = M1(13,69); M2(13,114) = M1(13,70); M2(13,116) = M1(13,71); M2(13,117) = M1(13,72); M2(13,119) = M1(13,73); M2(13,127) = M1(13,74); M2(13,128) = M1(13,75); M2(13,129) = M1(13,76); M2(13,131) = M1(13,77); M2(13,132) = M1(13,78); M2(13,134) = M1(13,79); M2(13,141) = M1(13,80); M2(13,142) = M1(13,81); M2(13,144) = M1(13,82); M2(13,150) = M1(13,83); 
M2(14,17) = M1(14,14); M2(14,18) = M1(14,15); M2(14,19) = M1(14,16); M2(14,20) = M1(14,17); M2(14,22) = M1(14,18); M2(14,23) = M1(14,19); M2(14,24) = M1(14,20); M2(14,25) = M1(14,21); M2(14,27) = M1(14,22); M2(14,28) = M1(14,23); M2(14,29) = M1(14,24); M2(14,31) = M1(14,25); M2(14,32) = M1(14,26); M2(14,34) = M1(14,27); M2(14,45) = M1(14,28); M2(14,46) = M1(14,29); M2(14,47) = M1(14,30); M2(14,48) = M1(14,31); M2(14,49) = M1(14,32); M2(14,50) = M1(14,33); M2(14,52) = M1(14,34); M2(14,53) = M1(14,35); M2(14,54) = M1(14,36); M2(14,55) = M1(14,37); M2(14,56) = M1(14,38); M2(14,58) = M1(14,39); M2(14,59) = M1(14,40); M2(14,60) = M1(14,41); M2(14,61) = M1(14,42); M2(14,63) = M1(14,43); M2(14,64) = M1(14,44); M2(14,65) = M1(14,45); M2(14,67) = M1(14,46); M2(14,68) = M1(14,47); M2(14,70) = M1(14,48); M2(14,79) = M1(14,49); M2(14,80) = M1(14,50); M2(14,81) = M1(14,51); M2(14,82) = M1(14,52); M2(14,83) = M1(14,53); M2(14,85) = M1(14,54); M2(14,86) = M1(14,55); M2(14,87) = M1(14,56); M2(14,88) = M1(14,57); M2(14,90) = M1(14,58); M2(14,91) = M1(14,59); M2(14,92) = M1(14,60); M2(14,95) = M1(14,61); M2(14,96) = M1(14,62); M2(14,98) = M1(14,63); M2(14,107) = M1(14,64); M2(14,108) = M1(14,65); M2(14,109) = M1(14,66); M2(14,110) = M1(14,67); M2(14,112) = M1(14,68); M2(14,113) = M1(14,69); M2(14,114) = M1(14,70); M2(14,116) = M1(14,71); M2(14,117) = M1(14,72); M2(14,119) = M1(14,73); M2(14,127) = M1(14,74); M2(14,128) = M1(14,75); M2(14,129) = M1(14,76); M2(14,131) = M1(14,77); M2(14,132) = M1(14,78); M2(14,134) = M1(14,79); M2(14,141) = M1(14,80); M2(14,142) = M1(14,81); M2(14,144) = M1(14,82); M2(14,150) = M1(14,83); 
M2(15,0) = M1(2,2); M2(15,12) = M1(2,15); M2(15,13) = M1(2,16); M2(15,14) = M1(2,17); M2(15,17) = M1(2,18); M2(15,18) = M1(2,19); M2(15,19) = M1(2,20); M2(15,20) = M1(2,21); M2(15,23) = M1(2,22); M2(15,24) = M1(2,23); M2(15,25) = M1(2,24); M2(15,28) = M1(2,25); M2(15,29) = M1(2,26); M2(15,32) = M1(2,27); M2(15,38) = M1(2,28); M2(15,39) = M1(2,29); M2(15,40) = M1(2,30); M2(15,41) = M1(2,31); M2(15,42) = M1(2,32); M2(15,43) = M1(2,33); M2(15,46) = M1(2,34); M2(15,47) = M1(2,35); M2(15,48) = M1(2,36); M2(15,49) = M1(2,37); M2(15,50) = M1(2,38); M2(15,53) = M1(2,39); M2(15,54) = M1(2,40); M2(15,55) = M1(2,41); M2(15,56) = M1(2,42); M2(15,59) = M1(2,43); M2(15,60) = M1(2,44); M2(15,61) = M1(2,45); M2(15,64) = M1(2,46); M2(15,65) = M1(2,47); M2(15,68) = M1(2,48); M2(15,73) = M1(2,49); M2(15,74) = M1(2,50); M2(15,75) = M1(2,51); M2(15,76) = M1(2,52); M2(15,77) = M1(2,53); M2(15,80) = M1(2,54); M2(15,81) = M1(2,55); M2(15,82) = M1(2,56); M2(15,83) = M1(2,57); M2(15,86) = M1(2,58); M2(15,87) = M1(2,59); M2(15,88) = M1(2,60); M2(15,91) = M1(2,61); M2(15,92) = M1(2,62); M2(15,96) = M1(2,63); M2(15,102) = M1(2,64); M2(15,103) = M1(2,65); M2(15,104) = M1(2,66); M2(15,105) = M1(2,67); M2(15,108) = M1(2,68); M2(15,109) = M1(2,69); M2(15,110) = M1(2,70); M2(15,113) = M1(2,71); M2(15,114) = M1(2,72); M2(15,117) = M1(2,73); M2(15,123) = M1(2,74); M2(15,124) = M1(2,75); M2(15,125) = M1(2,76); M2(15,128) = M1(2,77); M2(15,129) = M1(2,78); M2(15,132) = M1(2,79); M2(15,138) = M1(2,80); M2(15,139) = M1(2,81); M2(15,142) = M1(2,82); M2(15,148) = M1(2,83); 
M2(16,1) = M1(3,3); M2(16,12) = M1(3,15); M2(16,13) = M1(3,16); M2(16,14) = M1(3,17); M2(16,17) = M1(3,18); M2(16,18) = M1(3,19); M2(16,19) = M1(3,20); M2(16,20) = M1(3,21); M2(16,23) = M1(3,22); M2(16,24) = M1(3,23); M2(16,25) = M1(3,24); M2(16,28) = M1(3,25); M2(16,29) = M1(3,26); M2(16,32) = M1(3,27); M2(16,38) = M1(3,28); M2(16,39) = M1(3,29); M2(16,40) = M1(3,30); M2(16,41) = M1(3,31); M2(16,42) = M1(3,32); M2(16,43) = M1(3,33); M2(16,46) = M1(3,34); M2(16,47) = M1(3,35); M2(16,48) = M1(3,36); M2(16,49) = M1(3,37); M2(16,50) = M1(3,38); M2(16,53) = M1(3,39); M2(16,54) = M1(3,40); M2(16,55) = M1(3,41); M2(16,56) = M1(3,42); M2(16,59) = M1(3,43); M2(16,60) = M1(3,44); M2(16,61) = M1(3,45); M2(16,64) = M1(3,46); M2(16,65) = M1(3,47); M2(16,68) = M1(3,48); M2(16,73) = M1(3,49); M2(16,74) = M1(3,50); M2(16,75) = M1(3,51); M2(16,76) = M1(3,52); M2(16,77) = M1(3,53); M2(16,80) = M1(3,54); M2(16,81) = M1(3,55); M2(16,82) = M1(3,56); M2(16,83) = M1(3,57); M2(16,86) = M1(3,58); M2(16,87) = M1(3,59); M2(16,88) = M1(3,60); M2(16,91) = M1(3,61); M2(16,92) = M1(3,62); M2(16,96) = M1(3,63); M2(16,102) = M1(3,64); M2(16,103) = M1(3,65); M2(16,104) = M1(3,66); M2(16,105) = M1(3,67); M2(16,108) = M1(3,68); M2(16,109) = M1(3,69); M2(16,110) = M1(3,70); M2(16,113) = M1(3,71); M2(16,114) = M1(3,72); M2(16,117) = M1(3,73); M2(16,123) = M1(3,74); M2(16,124) = M1(3,75); M2(16,125) = M1(3,76); M2(16,128) = M1(3,77); M2(16,129) = M1(3,78); M2(16,132) = M1(3,79); M2(16,138) = M1(3,80); M2(16,139) = M1(3,81); M2(16,142) = M1(3,82); M2(16,148) = M1(3,83); 
M2(17,2) = M1(4,4); M2(17,12) = M1(4,15); M2(17,13) = M1(4,16); M2(17,14) = M1(4,17); M2(17,17) = M1(4,18); M2(17,18) = M1(4,19); M2(17,19) = M1(4,20); M2(17,20) = M1(4,21); M2(17,23) = M1(4,22); M2(17,24) = M1(4,23); M2(17,25) = M1(4,24); M2(17,28) = M1(4,25); M2(17,29) = M1(4,26); M2(17,32) = M1(4,27); M2(17,38) = M1(4,28); M2(17,39) = M1(4,29); M2(17,40) = M1(4,30); M2(17,41) = M1(4,31); M2(17,42) = M1(4,32); M2(17,43) = M1(4,33); M2(17,46) = M1(4,34); M2(17,47) = M1(4,35); M2(17,48) = M1(4,36); M2(17,49) = M1(4,37); M2(17,50) = M1(4,38); M2(17,53) = M1(4,39); M2(17,54) = M1(4,40); M2(17,55) = M1(4,41); M2(17,56) = M1(4,42); M2(17,59) = M1(4,43); M2(17,60) = M1(4,44); M2(17,61) = M1(4,45); M2(17,64) = M1(4,46); M2(17,65) = M1(4,47); M2(17,68) = M1(4,48); M2(17,73) = M1(4,49); M2(17,74) = M1(4,50); M2(17,75) = M1(4,51); M2(17,76) = M1(4,52); M2(17,77) = M1(4,53); M2(17,80) = M1(4,54); M2(17,81) = M1(4,55); M2(17,82) = M1(4,56); M2(17,83) = M1(4,57); M2(17,86) = M1(4,58); M2(17,87) = M1(4,59); M2(17,88) = M1(4,60); M2(17,91) = M1(4,61); M2(17,92) = M1(4,62); M2(17,96) = M1(4,63); M2(17,102) = M1(4,64); M2(17,103) = M1(4,65); M2(17,104) = M1(4,66); M2(17,105) = M1(4,67); M2(17,108) = M1(4,68); M2(17,109) = M1(4,69); M2(17,110) = M1(4,70); M2(17,113) = M1(4,71); M2(17,114) = M1(4,72); M2(17,117) = M1(4,73); M2(17,123) = M1(4,74); M2(17,124) = M1(4,75); M2(17,125) = M1(4,76); M2(17,128) = M1(4,77); M2(17,129) = M1(4,78); M2(17,132) = M1(4,79); M2(17,138) = M1(4,80); M2(17,139) = M1(4,81); M2(17,142) = M1(4,82); M2(17,148) = M1(4,83); 
M2(18,3) = M1(5,5); M2(18,12) = M1(5,15); M2(18,13) = M1(5,16); M2(18,14) = M1(5,17); M2(18,17) = M1(5,18); M2(18,18) = M1(5,19); M2(18,19) = M1(5,20); M2(18,20) = M1(5,21); M2(18,23) = M1(5,22); M2(18,24) = M1(5,23); M2(18,25) = M1(5,24); M2(18,28) = M1(5,25); M2(18,29) = M1(5,26); M2(18,32) = M1(5,27); M2(18,38) = M1(5,28); M2(18,39) = M1(5,29); M2(18,40) = M1(5,30); M2(18,41) = M1(5,31); M2(18,42) = M1(5,32); M2(18,43) = M1(5,33); M2(18,46) = M1(5,34); M2(18,47) = M1(5,35); M2(18,48) = M1(5,36); M2(18,49) = M1(5,37); M2(18,50) = M1(5,38); M2(18,53) = M1(5,39); M2(18,54) = M1(5,40); M2(18,55) = M1(5,41); M2(18,56) = M1(5,42); M2(18,59) = M1(5,43); M2(18,60) = M1(5,44); M2(18,61) = M1(5,45); M2(18,64) = M1(5,46); M2(18,65) = M1(5,47); M2(18,68) = M1(5,48); M2(18,73) = M1(5,49); M2(18,74) = M1(5,50); M2(18,75) = M1(5,51); M2(18,76) = M1(5,52); M2(18,77) = M1(5,53); M2(18,80) = M1(5,54); M2(18,81) = M1(5,55); M2(18,82) = M1(5,56); M2(18,83) = M1(5,57); M2(18,86) = M1(5,58); M2(18,87) = M1(5,59); M2(18,88) = M1(5,60); M2(18,91) = M1(5,61); M2(18,92) = M1(5,62); M2(18,96) = M1(5,63); M2(18,102) = M1(5,64); M2(18,103) = M1(5,65); M2(18,104) = M1(5,66); M2(18,105) = M1(5,67); M2(18,108) = M1(5,68); M2(18,109) = M1(5,69); M2(18,110) = M1(5,70); M2(18,113) = M1(5,71); M2(18,114) = M1(5,72); M2(18,117) = M1(5,73); M2(18,123) = M1(5,74); M2(18,124) = M1(5,75); M2(18,125) = M1(5,76); M2(18,128) = M1(5,77); M2(18,129) = M1(5,78); M2(18,132) = M1(5,79); M2(18,138) = M1(5,80); M2(18,139) = M1(5,81); M2(18,142) = M1(5,82); M2(18,148) = M1(5,83); 
M2(19,4) = M1(7,7); M2(19,12) = M1(7,15); M2(19,13) = M1(7,16); M2(19,14) = M1(7,17); M2(19,17) = M1(7,18); M2(19,18) = M1(7,19); M2(19,19) = M1(7,20); M2(19,20) = M1(7,21); M2(19,23) = M1(7,22); M2(19,24) = M1(7,23); M2(19,25) = M1(7,24); M2(19,28) = M1(7,25); M2(19,29) = M1(7,26); M2(19,32) = M1(7,27); M2(19,38) = M1(7,28); M2(19,39) = M1(7,29); M2(19,40) = M1(7,30); M2(19,41) = M1(7,31); M2(19,42) = M1(7,32); M2(19,43) = M1(7,33); M2(19,46) = M1(7,34); M2(19,47) = M1(7,35); M2(19,48) = M1(7,36); M2(19,49) = M1(7,37); M2(19,50) = M1(7,38); M2(19,53) = M1(7,39); M2(19,54) = M1(7,40); M2(19,55) = M1(7,41); M2(19,56) = M1(7,42); M2(19,59) = M1(7,43); M2(19,60) = M1(7,44); M2(19,61) = M1(7,45); M2(19,64) = M1(7,46); M2(19,65) = M1(7,47); M2(19,68) = M1(7,48); M2(19,73) = M1(7,49); M2(19,74) = M1(7,50); M2(19,75) = M1(7,51); M2(19,76) = M1(7,52); M2(19,77) = M1(7,53); M2(19,80) = M1(7,54); M2(19,81) = M1(7,55); M2(19,82) = M1(7,56); M2(19,83) = M1(7,57); M2(19,86) = M1(7,58); M2(19,87) = M1(7,59); M2(19,88) = M1(7,60); M2(19,91) = M1(7,61); M2(19,92) = M1(7,62); M2(19,96) = M1(7,63); M2(19,102) = M1(7,64); M2(19,103) = M1(7,65); M2(19,104) = M1(7,66); M2(19,105) = M1(7,67); M2(19,108) = M1(7,68); M2(19,109) = M1(7,69); M2(19,110) = M1(7,70); M2(19,113) = M1(7,71); M2(19,114) = M1(7,72); M2(19,117) = M1(7,73); M2(19,123) = M1(7,74); M2(19,124) = M1(7,75); M2(19,125) = M1(7,76); M2(19,128) = M1(7,77); M2(19,129) = M1(7,78); M2(19,132) = M1(7,79); M2(19,138) = M1(7,80); M2(19,139) = M1(7,81); M2(19,142) = M1(7,82); M2(19,148) = M1(7,83); 
M2(20,5) = M1(8,8); M2(20,12) = M1(8,15); M2(20,13) = M1(8,16); M2(20,14) = M1(8,17); M2(20,17) = M1(8,18); M2(20,18) = M1(8,19); M2(20,19) = M1(8,20); M2(20,20) = M1(8,21); M2(20,23) = M1(8,22); M2(20,24) = M1(8,23); M2(20,25) = M1(8,24); M2(20,28) = M1(8,25); M2(20,29) = M1(8,26); M2(20,32) = M1(8,27); M2(20,38) = M1(8,28); M2(20,39) = M1(8,29); M2(20,40) = M1(8,30); M2(20,41) = M1(8,31); M2(20,42) = M1(8,32); M2(20,43) = M1(8,33); M2(20,46) = M1(8,34); M2(20,47) = M1(8,35); M2(20,48) = M1(8,36); M2(20,49) = M1(8,37); M2(20,50) = M1(8,38); M2(20,53) = M1(8,39); M2(20,54) = M1(8,40); M2(20,55) = M1(8,41); M2(20,56) = M1(8,42); M2(20,59) = M1(8,43); M2(20,60) = M1(8,44); M2(20,61) = M1(8,45); M2(20,64) = M1(8,46); M2(20,65) = M1(8,47); M2(20,68) = M1(8,48); M2(20,73) = M1(8,49); M2(20,74) = M1(8,50); M2(20,75) = M1(8,51); M2(20,76) = M1(8,52); M2(20,77) = M1(8,53); M2(20,80) = M1(8,54); M2(20,81) = M1(8,55); M2(20,82) = M1(8,56); M2(20,83) = M1(8,57); M2(20,86) = M1(8,58); M2(20,87) = M1(8,59); M2(20,88) = M1(8,60); M2(20,91) = M1(8,61); M2(20,92) = M1(8,62); M2(20,96) = M1(8,63); M2(20,102) = M1(8,64); M2(20,103) = M1(8,65); M2(20,104) = M1(8,66); M2(20,105) = M1(8,67); M2(20,108) = M1(8,68); M2(20,109) = M1(8,69); M2(20,110) = M1(8,70); M2(20,113) = M1(8,71); M2(20,114) = M1(8,72); M2(20,117) = M1(8,73); M2(20,123) = M1(8,74); M2(20,124) = M1(8,75); M2(20,125) = M1(8,76); M2(20,128) = M1(8,77); M2(20,129) = M1(8,78); M2(20,132) = M1(8,79); M2(20,138) = M1(8,80); M2(20,139) = M1(8,81); M2(20,142) = M1(8,82); M2(20,148) = M1(8,83); 
M2(21,6) = M1(9,9); M2(21,12) = M1(9,15); M2(21,13) = M1(9,16); M2(21,14) = M1(9,17); M2(21,17) = M1(9,18); M2(21,18) = M1(9,19); M2(21,19) = M1(9,20); M2(21,20) = M1(9,21); M2(21,23) = M1(9,22); M2(21,24) = M1(9,23); M2(21,25) = M1(9,24); M2(21,28) = M1(9,25); M2(21,29) = M1(9,26); M2(21,32) = M1(9,27); M2(21,38) = M1(9,28); M2(21,39) = M1(9,29); M2(21,40) = M1(9,30); M2(21,41) = M1(9,31); M2(21,42) = M1(9,32); M2(21,43) = M1(9,33); M2(21,46) = M1(9,34); M2(21,47) = M1(9,35); M2(21,48) = M1(9,36); M2(21,49) = M1(9,37); M2(21,50) = M1(9,38); M2(21,53) = M1(9,39); M2(21,54) = M1(9,40); M2(21,55) = M1(9,41); M2(21,56) = M1(9,42); M2(21,59) = M1(9,43); M2(21,60) = M1(9,44); M2(21,61) = M1(9,45); M2(21,64) = M1(9,46); M2(21,65) = M1(9,47); M2(21,68) = M1(9,48); M2(21,73) = M1(9,49); M2(21,74) = M1(9,50); M2(21,75) = M1(9,51); M2(21,76) = M1(9,52); M2(21,77) = M1(9,53); M2(21,80) = M1(9,54); M2(21,81) = M1(9,55); M2(21,82) = M1(9,56); M2(21,83) = M1(9,57); M2(21,86) = M1(9,58); M2(21,87) = M1(9,59); M2(21,88) = M1(9,60); M2(21,91) = M1(9,61); M2(21,92) = M1(9,62); M2(21,96) = M1(9,63); M2(21,102) = M1(9,64); M2(21,103) = M1(9,65); M2(21,104) = M1(9,66); M2(21,105) = M1(9,67); M2(21,108) = M1(9,68); M2(21,109) = M1(9,69); M2(21,110) = M1(9,70); M2(21,113) = M1(9,71); M2(21,114) = M1(9,72); M2(21,117) = M1(9,73); M2(21,123) = M1(9,74); M2(21,124) = M1(9,75); M2(21,125) = M1(9,76); M2(21,128) = M1(9,77); M2(21,129) = M1(9,78); M2(21,132) = M1(9,79); M2(21,138) = M1(9,80); M2(21,139) = M1(9,81); M2(21,142) = M1(9,82); M2(21,148) = M1(9,83); 
M2(22,7) = M1(10,10); M2(22,12) = M1(10,15); M2(22,13) = M1(10,16); M2(22,14) = M1(10,17); M2(22,17) = M1(10,18); M2(22,18) = M1(10,19); M2(22,19) = M1(10,20); M2(22,20) = M1(10,21); M2(22,23) = M1(10,22); M2(22,24) = M1(10,23); M2(22,25) = M1(10,24); M2(22,28) = M1(10,25); M2(22,29) = M1(10,26); M2(22,32) = M1(10,27); M2(22,38) = M1(10,28); M2(22,39) = M1(10,29); M2(22,40) = M1(10,30); M2(22,41) = M1(10,31); M2(22,42) = M1(10,32); M2(22,43) = M1(10,33); M2(22,46) = M1(10,34); M2(22,47) = M1(10,35); M2(22,48) = M1(10,36); M2(22,49) = M1(10,37); M2(22,50) = M1(10,38); M2(22,53) = M1(10,39); M2(22,54) = M1(10,40); M2(22,55) = M1(10,41); M2(22,56) = M1(10,42); M2(22,59) = M1(10,43); M2(22,60) = M1(10,44); M2(22,61) = M1(10,45); M2(22,64) = M1(10,46); M2(22,65) = M1(10,47); M2(22,68) = M1(10,48); M2(22,73) = M1(10,49); M2(22,74) = M1(10,50); M2(22,75) = M1(10,51); M2(22,76) = M1(10,52); M2(22,77) = M1(10,53); M2(22,80) = M1(10,54); M2(22,81) = M1(10,55); M2(22,82) = M1(10,56); M2(22,83) = M1(10,57); M2(22,86) = M1(10,58); M2(22,87) = M1(10,59); M2(22,88) = M1(10,60); M2(22,91) = M1(10,61); M2(22,92) = M1(10,62); M2(22,96) = M1(10,63); M2(22,102) = M1(10,64); M2(22,103) = M1(10,65); M2(22,104) = M1(10,66); M2(22,105) = M1(10,67); M2(22,108) = M1(10,68); M2(22,109) = M1(10,69); M2(22,110) = M1(10,70); M2(22,113) = M1(10,71); M2(22,114) = M1(10,72); M2(22,117) = M1(10,73); M2(22,123) = M1(10,74); M2(22,124) = M1(10,75); M2(22,125) = M1(10,76); M2(22,128) = M1(10,77); M2(22,129) = M1(10,78); M2(22,132) = M1(10,79); M2(22,138) = M1(10,80); M2(22,139) = M1(10,81); M2(22,142) = M1(10,82); M2(22,148) = M1(10,83); 
M2(23,8) = M1(11,11); M2(23,12) = M1(11,15); M2(23,13) = M1(11,16); M2(23,14) = M1(11,17); M2(23,17) = M1(11,18); M2(23,18) = M1(11,19); M2(23,19) = M1(11,20); M2(23,20) = M1(11,21); M2(23,23) = M1(11,22); M2(23,24) = M1(11,23); M2(23,25) = M1(11,24); M2(23,28) = M1(11,25); M2(23,29) = M1(11,26); M2(23,32) = M1(11,27); M2(23,38) = M1(11,28); M2(23,39) = M1(11,29); M2(23,40) = M1(11,30); M2(23,41) = M1(11,31); M2(23,42) = M1(11,32); M2(23,43) = M1(11,33); M2(23,46) = M1(11,34); M2(23,47) = M1(11,35); M2(23,48) = M1(11,36); M2(23,49) = M1(11,37); M2(23,50) = M1(11,38); M2(23,53) = M1(11,39); M2(23,54) = M1(11,40); M2(23,55) = M1(11,41); M2(23,56) = M1(11,42); M2(23,59) = M1(11,43); M2(23,60) = M1(11,44); M2(23,61) = M1(11,45); M2(23,64) = M1(11,46); M2(23,65) = M1(11,47); M2(23,68) = M1(11,48); M2(23,73) = M1(11,49); M2(23,74) = M1(11,50); M2(23,75) = M1(11,51); M2(23,76) = M1(11,52); M2(23,77) = M1(11,53); M2(23,80) = M1(11,54); M2(23,81) = M1(11,55); M2(23,82) = M1(11,56); M2(23,83) = M1(11,57); M2(23,86) = M1(11,58); M2(23,87) = M1(11,59); M2(23,88) = M1(11,60); M2(23,91) = M1(11,61); M2(23,92) = M1(11,62); M2(23,96) = M1(11,63); M2(23,102) = M1(11,64); M2(23,103) = M1(11,65); M2(23,104) = M1(11,66); M2(23,105) = M1(11,67); M2(23,108) = M1(11,68); M2(23,109) = M1(11,69); M2(23,110) = M1(11,70); M2(23,113) = M1(11,71); M2(23,114) = M1(11,72); M2(23,117) = M1(11,73); M2(23,123) = M1(11,74); M2(23,124) = M1(11,75); M2(23,125) = M1(11,76); M2(23,128) = M1(11,77); M2(23,129) = M1(11,78); M2(23,132) = M1(11,79); M2(23,138) = M1(11,80); M2(23,139) = M1(11,81); M2(23,142) = M1(11,82); M2(23,148) = M1(11,83); 
M2(24,9) = M1(12,12); M2(24,12) = M1(12,15); M2(24,13) = M1(12,16); M2(24,14) = M1(12,17); M2(24,17) = M1(12,18); M2(24,18) = M1(12,19); M2(24,19) = M1(12,20); M2(24,20) = M1(12,21); M2(24,23) = M1(12,22); M2(24,24) = M1(12,23); M2(24,25) = M1(12,24); M2(24,28) = M1(12,25); M2(24,29) = M1(12,26); M2(24,32) = M1(12,27); M2(24,38) = M1(12,28); M2(24,39) = M1(12,29); M2(24,40) = M1(12,30); M2(24,41) = M1(12,31); M2(24,42) = M1(12,32); M2(24,43) = M1(12,33); M2(24,46) = M1(12,34); M2(24,47) = M1(12,35); M2(24,48) = M1(12,36); M2(24,49) = M1(12,37); M2(24,50) = M1(12,38); M2(24,53) = M1(12,39); M2(24,54) = M1(12,40); M2(24,55) = M1(12,41); M2(24,56) = M1(12,42); M2(24,59) = M1(12,43); M2(24,60) = M1(12,44); M2(24,61) = M1(12,45); M2(24,64) = M1(12,46); M2(24,65) = M1(12,47); M2(24,68) = M1(12,48); M2(24,73) = M1(12,49); M2(24,74) = M1(12,50); M2(24,75) = M1(12,51); M2(24,76) = M1(12,52); M2(24,77) = M1(12,53); M2(24,80) = M1(12,54); M2(24,81) = M1(12,55); M2(24,82) = M1(12,56); M2(24,83) = M1(12,57); M2(24,86) = M1(12,58); M2(24,87) = M1(12,59); M2(24,88) = M1(12,60); M2(24,91) = M1(12,61); M2(24,92) = M1(12,62); M2(24,96) = M1(12,63); M2(24,102) = M1(12,64); M2(24,103) = M1(12,65); M2(24,104) = M1(12,66); M2(24,105) = M1(12,67); M2(24,108) = M1(12,68); M2(24,109) = M1(12,69); M2(24,110) = M1(12,70); M2(24,113) = M1(12,71); M2(24,114) = M1(12,72); M2(24,117) = M1(12,73); M2(24,123) = M1(12,74); M2(24,124) = M1(12,75); M2(24,125) = M1(12,76); M2(24,128) = M1(12,77); M2(24,129) = M1(12,78); M2(24,132) = M1(12,79); M2(24,138) = M1(12,80); M2(24,139) = M1(12,81); M2(24,142) = M1(12,82); M2(24,148) = M1(12,83); 
M2(25,10) = M1(13,13); M2(25,12) = M1(13,15); M2(25,13) = M1(13,16); M2(25,14) = M1(13,17); M2(25,17) = M1(13,18); M2(25,18) = M1(13,19); M2(25,19) = M1(13,20); M2(25,20) = M1(13,21); M2(25,23) = M1(13,22); M2(25,24) = M1(13,23); M2(25,25) = M1(13,24); M2(25,28) = M1(13,25); M2(25,29) = M1(13,26); M2(25,32) = M1(13,27); M2(25,38) = M1(13,28); M2(25,39) = M1(13,29); M2(25,40) = M1(13,30); M2(25,41) = M1(13,31); M2(25,42) = M1(13,32); M2(25,43) = M1(13,33); M2(25,46) = M1(13,34); M2(25,47) = M1(13,35); M2(25,48) = M1(13,36); M2(25,49) = M1(13,37); M2(25,50) = M1(13,38); M2(25,53) = M1(13,39); M2(25,54) = M1(13,40); M2(25,55) = M1(13,41); M2(25,56) = M1(13,42); M2(25,59) = M1(13,43); M2(25,60) = M1(13,44); M2(25,61) = M1(13,45); M2(25,64) = M1(13,46); M2(25,65) = M1(13,47); M2(25,68) = M1(13,48); M2(25,73) = M1(13,49); M2(25,74) = M1(13,50); M2(25,75) = M1(13,51); M2(25,76) = M1(13,52); M2(25,77) = M1(13,53); M2(25,80) = M1(13,54); M2(25,81) = M1(13,55); M2(25,82) = M1(13,56); M2(25,83) = M1(13,57); M2(25,86) = M1(13,58); M2(25,87) = M1(13,59); M2(25,88) = M1(13,60); M2(25,91) = M1(13,61); M2(25,92) = M1(13,62); M2(25,96) = M1(13,63); M2(25,102) = M1(13,64); M2(25,103) = M1(13,65); M2(25,104) = M1(13,66); M2(25,105) = M1(13,67); M2(25,108) = M1(13,68); M2(25,109) = M1(13,69); M2(25,110) = M1(13,70); M2(25,113) = M1(13,71); M2(25,114) = M1(13,72); M2(25,117) = M1(13,73); M2(25,123) = M1(13,74); M2(25,124) = M1(13,75); M2(25,125) = M1(13,76); M2(25,128) = M1(13,77); M2(25,129) = M1(13,78); M2(25,132) = M1(13,79); M2(25,138) = M1(13,80); M2(25,139) = M1(13,81); M2(25,142) = M1(13,82); M2(25,148) = M1(13,83); 
M2(26,11) = M1(14,14); M2(26,12) = M1(14,15); M2(26,13) = M1(14,16); M2(26,14) = M1(14,17); M2(26,17) = M1(14,18); M2(26,18) = M1(14,19); M2(26,19) = M1(14,20); M2(26,20) = M1(14,21); M2(26,23) = M1(14,22); M2(26,24) = M1(14,23); M2(26,25) = M1(14,24); M2(26,28) = M1(14,25); M2(26,29) = M1(14,26); M2(26,32) = M1(14,27); M2(26,38) = M1(14,28); M2(26,39) = M1(14,29); M2(26,40) = M1(14,30); M2(26,41) = M1(14,31); M2(26,42) = M1(14,32); M2(26,43) = M1(14,33); M2(26,46) = M1(14,34); M2(26,47) = M1(14,35); M2(26,48) = M1(14,36); M2(26,49) = M1(14,37); M2(26,50) = M1(14,38); M2(26,53) = M1(14,39); M2(26,54) = M1(14,40); M2(26,55) = M1(14,41); M2(26,56) = M1(14,42); M2(26,59) = M1(14,43); M2(26,60) = M1(14,44); M2(26,61) = M1(14,45); M2(26,64) = M1(14,46); M2(26,65) = M1(14,47); M2(26,68) = M1(14,48); M2(26,73) = M1(14,49); M2(26,74) = M1(14,50); M2(26,75) = M1(14,51); M2(26,76) = M1(14,52); M2(26,77) = M1(14,53); M2(26,80) = M1(14,54); M2(26,81) = M1(14,55); M2(26,82) = M1(14,56); M2(26,83) = M1(14,57); M2(26,86) = M1(14,58); M2(26,87) = M1(14,59); M2(26,88) = M1(14,60); M2(26,91) = M1(14,61); M2(26,92) = M1(14,62); M2(26,96) = M1(14,63); M2(26,102) = M1(14,64); M2(26,103) = M1(14,65); M2(26,104) = M1(14,66); M2(26,105) = M1(14,67); M2(26,108) = M1(14,68); M2(26,109) = M1(14,69); M2(26,110) = M1(14,70); M2(26,113) = M1(14,71); M2(26,114) = M1(14,72); M2(26,117) = M1(14,73); M2(26,123) = M1(14,74); M2(26,124) = M1(14,75); M2(26,125) = M1(14,76); M2(26,128) = M1(14,77); M2(26,129) = M1(14,78); M2(26,132) = M1(14,79); M2(26,138) = M1(14,80); M2(26,139) = M1(14,81); M2(26,142) = M1(14,82); M2(26,148) = M1(14,83); 
M2(27,0) = M1(3,3); M2(27,11) = M1(3,15); M2(27,12) = M1(3,16); M2(27,13) = M1(3,17); M2(27,16) = M1(3,18); M2(27,17) = M1(3,19); M2(27,18) = M1(3,20); M2(27,19) = M1(3,21); M2(27,22) = M1(3,22); M2(27,23) = M1(3,23); M2(27,24) = M1(3,24); M2(27,27) = M1(3,25); M2(27,28) = M1(3,26); M2(27,31) = M1(3,27); M2(27,37) = M1(3,28); M2(27,38) = M1(3,29); M2(27,39) = M1(3,30); M2(27,40) = M1(3,31); M2(27,41) = M1(3,32); M2(27,42) = M1(3,33); M2(27,45) = M1(3,34); M2(27,46) = M1(3,35); M2(27,47) = M1(3,36); M2(27,48) = M1(3,37); M2(27,49) = M1(3,38); M2(27,52) = M1(3,39); M2(27,53) = M1(3,40); M2(27,54) = M1(3,41); M2(27,55) = M1(3,42); M2(27,58) = M1(3,43); M2(27,59) = M1(3,44); M2(27,60) = M1(3,45); M2(27,63) = M1(3,46); M2(27,64) = M1(3,47); M2(27,67) = M1(3,48); M2(27,72) = M1(3,49); M2(27,73) = M1(3,50); M2(27,74) = M1(3,51); M2(27,75) = M1(3,52); M2(27,76) = M1(3,53); M2(27,79) = M1(3,54); M2(27,80) = M1(3,55); M2(27,81) = M1(3,56); M2(27,82) = M1(3,57); M2(27,85) = M1(3,58); M2(27,86) = M1(3,59); M2(27,87) = M1(3,60); M2(27,90) = M1(3,61); M2(27,91) = M1(3,62); M2(27,95) = M1(3,63); M2(27,101) = M1(3,64); M2(27,102) = M1(3,65); M2(27,103) = M1(3,66); M2(27,104) = M1(3,67); M2(27,107) = M1(3,68); M2(27,108) = M1(3,69); M2(27,109) = M1(3,70); M2(27,112) = M1(3,71); M2(27,113) = M1(3,72); M2(27,116) = M1(3,73); M2(27,122) = M1(3,74); M2(27,123) = M1(3,75); M2(27,124) = M1(3,76); M2(27,127) = M1(3,77); M2(27,128) = M1(3,78); M2(27,131) = M1(3,79); M2(27,137) = M1(3,80); M2(27,138) = M1(3,81); M2(27,141) = M1(3,82); M2(27,147) = M1(3,83); 
M2(28,1) = M1(4,4); M2(28,11) = M1(4,15); M2(28,12) = M1(4,16); M2(28,13) = M1(4,17); M2(28,16) = M1(4,18); M2(28,17) = M1(4,19); M2(28,18) = M1(4,20); M2(28,19) = M1(4,21); M2(28,22) = M1(4,22); M2(28,23) = M1(4,23); M2(28,24) = M1(4,24); M2(28,27) = M1(4,25); M2(28,28) = M1(4,26); M2(28,31) = M1(4,27); M2(28,37) = M1(4,28); M2(28,38) = M1(4,29); M2(28,39) = M1(4,30); M2(28,40) = M1(4,31); M2(28,41) = M1(4,32); M2(28,42) = M1(4,33); M2(28,45) = M1(4,34); M2(28,46) = M1(4,35); M2(28,47) = M1(4,36); M2(28,48) = M1(4,37); M2(28,49) = M1(4,38); M2(28,52) = M1(4,39); M2(28,53) = M1(4,40); M2(28,54) = M1(4,41); M2(28,55) = M1(4,42); M2(28,58) = M1(4,43); M2(28,59) = M1(4,44); M2(28,60) = M1(4,45); M2(28,63) = M1(4,46); M2(28,64) = M1(4,47); M2(28,67) = M1(4,48); M2(28,72) = M1(4,49); M2(28,73) = M1(4,50); M2(28,74) = M1(4,51); M2(28,75) = M1(4,52); M2(28,76) = M1(4,53); M2(28,79) = M1(4,54); M2(28,80) = M1(4,55); M2(28,81) = M1(4,56); M2(28,82) = M1(4,57); M2(28,85) = M1(4,58); M2(28,86) = M1(4,59); M2(28,87) = M1(4,60); M2(28,90) = M1(4,61); M2(28,91) = M1(4,62); M2(28,95) = M1(4,63); M2(28,101) = M1(4,64); M2(28,102) = M1(4,65); M2(28,103) = M1(4,66); M2(28,104) = M1(4,67); M2(28,107) = M1(4,68); M2(28,108) = M1(4,69); M2(28,109) = M1(4,70); M2(28,112) = M1(4,71); M2(28,113) = M1(4,72); M2(28,116) = M1(4,73); M2(28,122) = M1(4,74); M2(28,123) = M1(4,75); M2(28,124) = M1(4,76); M2(28,127) = M1(4,77); M2(28,128) = M1(4,78); M2(28,131) = M1(4,79); M2(28,137) = M1(4,80); M2(28,138) = M1(4,81); M2(28,141) = M1(4,82); M2(28,147) = M1(4,83); 
M2(29,2) = M1(5,5); M2(29,11) = M1(5,15); M2(29,12) = M1(5,16); M2(29,13) = M1(5,17); M2(29,16) = M1(5,18); M2(29,17) = M1(5,19); M2(29,18) = M1(5,20); M2(29,19) = M1(5,21); M2(29,22) = M1(5,22); M2(29,23) = M1(5,23); M2(29,24) = M1(5,24); M2(29,27) = M1(5,25); M2(29,28) = M1(5,26); M2(29,31) = M1(5,27); M2(29,37) = M1(5,28); M2(29,38) = M1(5,29); M2(29,39) = M1(5,30); M2(29,40) = M1(5,31); M2(29,41) = M1(5,32); M2(29,42) = M1(5,33); M2(29,45) = M1(5,34); M2(29,46) = M1(5,35); M2(29,47) = M1(5,36); M2(29,48) = M1(5,37); M2(29,49) = M1(5,38); M2(29,52) = M1(5,39); M2(29,53) = M1(5,40); M2(29,54) = M1(5,41); M2(29,55) = M1(5,42); M2(29,58) = M1(5,43); M2(29,59) = M1(5,44); M2(29,60) = M1(5,45); M2(29,63) = M1(5,46); M2(29,64) = M1(5,47); M2(29,67) = M1(5,48); M2(29,72) = M1(5,49); M2(29,73) = M1(5,50); M2(29,74) = M1(5,51); M2(29,75) = M1(5,52); M2(29,76) = M1(5,53); M2(29,79) = M1(5,54); M2(29,80) = M1(5,55); M2(29,81) = M1(5,56); M2(29,82) = M1(5,57); M2(29,85) = M1(5,58); M2(29,86) = M1(5,59); M2(29,87) = M1(5,60); M2(29,90) = M1(5,61); M2(29,91) = M1(5,62); M2(29,95) = M1(5,63); M2(29,101) = M1(5,64); M2(29,102) = M1(5,65); M2(29,103) = M1(5,66); M2(29,104) = M1(5,67); M2(29,107) = M1(5,68); M2(29,108) = M1(5,69); M2(29,109) = M1(5,70); M2(29,112) = M1(5,71); M2(29,113) = M1(5,72); M2(29,116) = M1(5,73); M2(29,122) = M1(5,74); M2(29,123) = M1(5,75); M2(29,124) = M1(5,76); M2(29,127) = M1(5,77); M2(29,128) = M1(5,78); M2(29,131) = M1(5,79); M2(29,137) = M1(5,80); M2(29,138) = M1(5,81); M2(29,141) = M1(5,82); M2(29,147) = M1(5,83); 
M2(30,3) = M1(6,6); M2(30,11) = M1(6,15); M2(30,12) = M1(6,16); M2(30,13) = M1(6,17); M2(30,16) = M1(6,18); M2(30,17) = M1(6,19); M2(30,18) = M1(6,20); M2(30,19) = M1(6,21); M2(30,22) = M1(6,22); M2(30,23) = M1(6,23); M2(30,24) = M1(6,24); M2(30,27) = M1(6,25); M2(30,28) = M1(6,26); M2(30,31) = M1(6,27); M2(30,37) = M1(6,28); M2(30,38) = M1(6,29); M2(30,39) = M1(6,30); M2(30,40) = M1(6,31); M2(30,41) = M1(6,32); M2(30,42) = M1(6,33); M2(30,45) = M1(6,34); M2(30,46) = M1(6,35); M2(30,47) = M1(6,36); M2(30,48) = M1(6,37); M2(30,49) = M1(6,38); M2(30,52) = M1(6,39); M2(30,53) = M1(6,40); M2(30,54) = M1(6,41); M2(30,55) = M1(6,42); M2(30,58) = M1(6,43); M2(30,59) = M1(6,44); M2(30,60) = M1(6,45); M2(30,63) = M1(6,46); M2(30,64) = M1(6,47); M2(30,67) = M1(6,48); M2(30,72) = M1(6,49); M2(30,73) = M1(6,50); M2(30,74) = M1(6,51); M2(30,75) = M1(6,52); M2(30,76) = M1(6,53); M2(30,79) = M1(6,54); M2(30,80) = M1(6,55); M2(30,81) = M1(6,56); M2(30,82) = M1(6,57); M2(30,85) = M1(6,58); M2(30,86) = M1(6,59); M2(30,87) = M1(6,60); M2(30,90) = M1(6,61); M2(30,91) = M1(6,62); M2(30,95) = M1(6,63); M2(30,101) = M1(6,64); M2(30,102) = M1(6,65); M2(30,103) = M1(6,66); M2(30,104) = M1(6,67); M2(30,107) = M1(6,68); M2(30,108) = M1(6,69); M2(30,109) = M1(6,70); M2(30,112) = M1(6,71); M2(30,113) = M1(6,72); M2(30,116) = M1(6,73); M2(30,122) = M1(6,74); M2(30,123) = M1(6,75); M2(30,124) = M1(6,76); M2(30,127) = M1(6,77); M2(30,128) = M1(6,78); M2(30,131) = M1(6,79); M2(30,137) = M1(6,80); M2(30,138) = M1(6,81); M2(30,141) = M1(6,82); M2(30,147) = M1(6,83); 
M2(31,4) = M1(8,8); M2(31,11) = M1(8,15); M2(31,12) = M1(8,16); M2(31,13) = M1(8,17); M2(31,16) = M1(8,18); M2(31,17) = M1(8,19); M2(31,18) = M1(8,20); M2(31,19) = M1(8,21); M2(31,22) = M1(8,22); M2(31,23) = M1(8,23); M2(31,24) = M1(8,24); M2(31,27) = M1(8,25); M2(31,28) = M1(8,26); M2(31,31) = M1(8,27); M2(31,37) = M1(8,28); M2(31,38) = M1(8,29); M2(31,39) = M1(8,30); M2(31,40) = M1(8,31); M2(31,41) = M1(8,32); M2(31,42) = M1(8,33); M2(31,45) = M1(8,34); M2(31,46) = M1(8,35); M2(31,47) = M1(8,36); M2(31,48) = M1(8,37); M2(31,49) = M1(8,38); M2(31,52) = M1(8,39); M2(31,53) = M1(8,40); M2(31,54) = M1(8,41); M2(31,55) = M1(8,42); M2(31,58) = M1(8,43); M2(31,59) = M1(8,44); M2(31,60) = M1(8,45); M2(31,63) = M1(8,46); M2(31,64) = M1(8,47); M2(31,67) = M1(8,48); M2(31,72) = M1(8,49); M2(31,73) = M1(8,50); M2(31,74) = M1(8,51); M2(31,75) = M1(8,52); M2(31,76) = M1(8,53); M2(31,79) = M1(8,54); M2(31,80) = M1(8,55); M2(31,81) = M1(8,56); M2(31,82) = M1(8,57); M2(31,85) = M1(8,58); M2(31,86) = M1(8,59); M2(31,87) = M1(8,60); M2(31,90) = M1(8,61); M2(31,91) = M1(8,62); M2(31,95) = M1(8,63); M2(31,101) = M1(8,64); M2(31,102) = M1(8,65); M2(31,103) = M1(8,66); M2(31,104) = M1(8,67); M2(31,107) = M1(8,68); M2(31,108) = M1(8,69); M2(31,109) = M1(8,70); M2(31,112) = M1(8,71); M2(31,113) = M1(8,72); M2(31,116) = M1(8,73); M2(31,122) = M1(8,74); M2(31,123) = M1(8,75); M2(31,124) = M1(8,76); M2(31,127) = M1(8,77); M2(31,128) = M1(8,78); M2(31,131) = M1(8,79); M2(31,137) = M1(8,80); M2(31,138) = M1(8,81); M2(31,141) = M1(8,82); M2(31,147) = M1(8,83); 
M2(32,5) = M1(9,9); M2(32,11) = M1(9,15); M2(32,12) = M1(9,16); M2(32,13) = M1(9,17); M2(32,16) = M1(9,18); M2(32,17) = M1(9,19); M2(32,18) = M1(9,20); M2(32,19) = M1(9,21); M2(32,22) = M1(9,22); M2(32,23) = M1(9,23); M2(32,24) = M1(9,24); M2(32,27) = M1(9,25); M2(32,28) = M1(9,26); M2(32,31) = M1(9,27); M2(32,37) = M1(9,28); M2(32,38) = M1(9,29); M2(32,39) = M1(9,30); M2(32,40) = M1(9,31); M2(32,41) = M1(9,32); M2(32,42) = M1(9,33); M2(32,45) = M1(9,34); M2(32,46) = M1(9,35); M2(32,47) = M1(9,36); M2(32,48) = M1(9,37); M2(32,49) = M1(9,38); M2(32,52) = M1(9,39); M2(32,53) = M1(9,40); M2(32,54) = M1(9,41); M2(32,55) = M1(9,42); M2(32,58) = M1(9,43); M2(32,59) = M1(9,44); M2(32,60) = M1(9,45); M2(32,63) = M1(9,46); M2(32,64) = M1(9,47); M2(32,67) = M1(9,48); M2(32,72) = M1(9,49); M2(32,73) = M1(9,50); M2(32,74) = M1(9,51); M2(32,75) = M1(9,52); M2(32,76) = M1(9,53); M2(32,79) = M1(9,54); M2(32,80) = M1(9,55); M2(32,81) = M1(9,56); M2(32,82) = M1(9,57); M2(32,85) = M1(9,58); M2(32,86) = M1(9,59); M2(32,87) = M1(9,60); M2(32,90) = M1(9,61); M2(32,91) = M1(9,62); M2(32,95) = M1(9,63); M2(32,101) = M1(9,64); M2(32,102) = M1(9,65); M2(32,103) = M1(9,66); M2(32,104) = M1(9,67); M2(32,107) = M1(9,68); M2(32,108) = M1(9,69); M2(32,109) = M1(9,70); M2(32,112) = M1(9,71); M2(32,113) = M1(9,72); M2(32,116) = M1(9,73); M2(32,122) = M1(9,74); M2(32,123) = M1(9,75); M2(32,124) = M1(9,76); M2(32,127) = M1(9,77); M2(32,128) = M1(9,78); M2(32,131) = M1(9,79); M2(32,137) = M1(9,80); M2(32,138) = M1(9,81); M2(32,141) = M1(9,82); M2(32,147) = M1(9,83); 
M2(33,6) = M1(10,10); M2(33,11) = M1(10,15); M2(33,12) = M1(10,16); M2(33,13) = M1(10,17); M2(33,16) = M1(10,18); M2(33,17) = M1(10,19); M2(33,18) = M1(10,20); M2(33,19) = M1(10,21); M2(33,22) = M1(10,22); M2(33,23) = M1(10,23); M2(33,24) = M1(10,24); M2(33,27) = M1(10,25); M2(33,28) = M1(10,26); M2(33,31) = M1(10,27); M2(33,37) = M1(10,28); M2(33,38) = M1(10,29); M2(33,39) = M1(10,30); M2(33,40) = M1(10,31); M2(33,41) = M1(10,32); M2(33,42) = M1(10,33); M2(33,45) = M1(10,34); M2(33,46) = M1(10,35); M2(33,47) = M1(10,36); M2(33,48) = M1(10,37); M2(33,49) = M1(10,38); M2(33,52) = M1(10,39); M2(33,53) = M1(10,40); M2(33,54) = M1(10,41); M2(33,55) = M1(10,42); M2(33,58) = M1(10,43); M2(33,59) = M1(10,44); M2(33,60) = M1(10,45); M2(33,63) = M1(10,46); M2(33,64) = M1(10,47); M2(33,67) = M1(10,48); M2(33,72) = M1(10,49); M2(33,73) = M1(10,50); M2(33,74) = M1(10,51); M2(33,75) = M1(10,52); M2(33,76) = M1(10,53); M2(33,79) = M1(10,54); M2(33,80) = M1(10,55); M2(33,81) = M1(10,56); M2(33,82) = M1(10,57); M2(33,85) = M1(10,58); M2(33,86) = M1(10,59); M2(33,87) = M1(10,60); M2(33,90) = M1(10,61); M2(33,91) = M1(10,62); M2(33,95) = M1(10,63); M2(33,101) = M1(10,64); M2(33,102) = M1(10,65); M2(33,103) = M1(10,66); M2(33,104) = M1(10,67); M2(33,107) = M1(10,68); M2(33,108) = M1(10,69); M2(33,109) = M1(10,70); M2(33,112) = M1(10,71); M2(33,113) = M1(10,72); M2(33,116) = M1(10,73); M2(33,122) = M1(10,74); M2(33,123) = M1(10,75); M2(33,124) = M1(10,76); M2(33,127) = M1(10,77); M2(33,128) = M1(10,78); M2(33,131) = M1(10,79); M2(33,137) = M1(10,80); M2(33,138) = M1(10,81); M2(33,141) = M1(10,82); M2(33,147) = M1(10,83); 
M2(34,7) = M1(11,11); M2(34,11) = M1(11,15); M2(34,12) = M1(11,16); M2(34,13) = M1(11,17); M2(34,16) = M1(11,18); M2(34,17) = M1(11,19); M2(34,18) = M1(11,20); M2(34,19) = M1(11,21); M2(34,22) = M1(11,22); M2(34,23) = M1(11,23); M2(34,24) = M1(11,24); M2(34,27) = M1(11,25); M2(34,28) = M1(11,26); M2(34,31) = M1(11,27); M2(34,37) = M1(11,28); M2(34,38) = M1(11,29); M2(34,39) = M1(11,30); M2(34,40) = M1(11,31); M2(34,41) = M1(11,32); M2(34,42) = M1(11,33); M2(34,45) = M1(11,34); M2(34,46) = M1(11,35); M2(34,47) = M1(11,36); M2(34,48) = M1(11,37); M2(34,49) = M1(11,38); M2(34,52) = M1(11,39); M2(34,53) = M1(11,40); M2(34,54) = M1(11,41); M2(34,55) = M1(11,42); M2(34,58) = M1(11,43); M2(34,59) = M1(11,44); M2(34,60) = M1(11,45); M2(34,63) = M1(11,46); M2(34,64) = M1(11,47); M2(34,67) = M1(11,48); M2(34,72) = M1(11,49); M2(34,73) = M1(11,50); M2(34,74) = M1(11,51); M2(34,75) = M1(11,52); M2(34,76) = M1(11,53); M2(34,79) = M1(11,54); M2(34,80) = M1(11,55); M2(34,81) = M1(11,56); M2(34,82) = M1(11,57); M2(34,85) = M1(11,58); M2(34,86) = M1(11,59); M2(34,87) = M1(11,60); M2(34,90) = M1(11,61); M2(34,91) = M1(11,62); M2(34,95) = M1(11,63); M2(34,101) = M1(11,64); M2(34,102) = M1(11,65); M2(34,103) = M1(11,66); M2(34,104) = M1(11,67); M2(34,107) = M1(11,68); M2(34,108) = M1(11,69); M2(34,109) = M1(11,70); M2(34,112) = M1(11,71); M2(34,113) = M1(11,72); M2(34,116) = M1(11,73); M2(34,122) = M1(11,74); M2(34,123) = M1(11,75); M2(34,124) = M1(11,76); M2(34,127) = M1(11,77); M2(34,128) = M1(11,78); M2(34,131) = M1(11,79); M2(34,137) = M1(11,80); M2(34,138) = M1(11,81); M2(34,141) = M1(11,82); M2(34,147) = M1(11,83); 
M2(35,8) = M1(12,12); M2(35,11) = M1(12,15); M2(35,12) = M1(12,16); M2(35,13) = M1(12,17); M2(35,16) = M1(12,18); M2(35,17) = M1(12,19); M2(35,18) = M1(12,20); M2(35,19) = M1(12,21); M2(35,22) = M1(12,22); M2(35,23) = M1(12,23); M2(35,24) = M1(12,24); M2(35,27) = M1(12,25); M2(35,28) = M1(12,26); M2(35,31) = M1(12,27); M2(35,37) = M1(12,28); M2(35,38) = M1(12,29); M2(35,39) = M1(12,30); M2(35,40) = M1(12,31); M2(35,41) = M1(12,32); M2(35,42) = M1(12,33); M2(35,45) = M1(12,34); M2(35,46) = M1(12,35); M2(35,47) = M1(12,36); M2(35,48) = M1(12,37); M2(35,49) = M1(12,38); M2(35,52) = M1(12,39); M2(35,53) = M1(12,40); M2(35,54) = M1(12,41); M2(35,55) = M1(12,42); M2(35,58) = M1(12,43); M2(35,59) = M1(12,44); M2(35,60) = M1(12,45); M2(35,63) = M1(12,46); M2(35,64) = M1(12,47); M2(35,67) = M1(12,48); M2(35,72) = M1(12,49); M2(35,73) = M1(12,50); M2(35,74) = M1(12,51); M2(35,75) = M1(12,52); M2(35,76) = M1(12,53); M2(35,79) = M1(12,54); M2(35,80) = M1(12,55); M2(35,81) = M1(12,56); M2(35,82) = M1(12,57); M2(35,85) = M1(12,58); M2(35,86) = M1(12,59); M2(35,87) = M1(12,60); M2(35,90) = M1(12,61); M2(35,91) = M1(12,62); M2(35,95) = M1(12,63); M2(35,101) = M1(12,64); M2(35,102) = M1(12,65); M2(35,103) = M1(12,66); M2(35,104) = M1(12,67); M2(35,107) = M1(12,68); M2(35,108) = M1(12,69); M2(35,109) = M1(12,70); M2(35,112) = M1(12,71); M2(35,113) = M1(12,72); M2(35,116) = M1(12,73); M2(35,122) = M1(12,74); M2(35,123) = M1(12,75); M2(35,124) = M1(12,76); M2(35,127) = M1(12,77); M2(35,128) = M1(12,78); M2(35,131) = M1(12,79); M2(35,137) = M1(12,80); M2(35,138) = M1(12,81); M2(35,141) = M1(12,82); M2(35,147) = M1(12,83); 
M2(36,10) = M1(14,14); M2(36,11) = M1(14,15); M2(36,12) = M1(14,16); M2(36,13) = M1(14,17); M2(36,16) = M1(14,18); M2(36,17) = M1(14,19); M2(36,18) = M1(14,20); M2(36,19) = M1(14,21); M2(36,22) = M1(14,22); M2(36,23) = M1(14,23); M2(36,24) = M1(14,24); M2(36,27) = M1(14,25); M2(36,28) = M1(14,26); M2(36,31) = M1(14,27); M2(36,37) = M1(14,28); M2(36,38) = M1(14,29); M2(36,39) = M1(14,30); M2(36,40) = M1(14,31); M2(36,41) = M1(14,32); M2(36,42) = M1(14,33); M2(36,45) = M1(14,34); M2(36,46) = M1(14,35); M2(36,47) = M1(14,36); M2(36,48) = M1(14,37); M2(36,49) = M1(14,38); M2(36,52) = M1(14,39); M2(36,53) = M1(14,40); M2(36,54) = M1(14,41); M2(36,55) = M1(14,42); M2(36,58) = M1(14,43); M2(36,59) = M1(14,44); M2(36,60) = M1(14,45); M2(36,63) = M1(14,46); M2(36,64) = M1(14,47); M2(36,67) = M1(14,48); M2(36,72) = M1(14,49); M2(36,73) = M1(14,50); M2(36,74) = M1(14,51); M2(36,75) = M1(14,52); M2(36,76) = M1(14,53); M2(36,79) = M1(14,54); M2(36,80) = M1(14,55); M2(36,81) = M1(14,56); M2(36,82) = M1(14,57); M2(36,85) = M1(14,58); M2(36,86) = M1(14,59); M2(36,87) = M1(14,60); M2(36,90) = M1(14,61); M2(36,91) = M1(14,62); M2(36,95) = M1(14,63); M2(36,101) = M1(14,64); M2(36,102) = M1(14,65); M2(36,103) = M1(14,66); M2(36,104) = M1(14,67); M2(36,107) = M1(14,68); M2(36,108) = M1(14,69); M2(36,109) = M1(14,70); M2(36,112) = M1(14,71); M2(36,113) = M1(14,72); M2(36,116) = M1(14,73); M2(36,122) = M1(14,74); M2(36,123) = M1(14,75); M2(36,124) = M1(14,76); M2(36,127) = M1(14,77); M2(36,128) = M1(14,78); M2(36,131) = M1(14,79); M2(36,137) = M1(14,80); M2(36,138) = M1(14,81); M2(36,141) = M1(14,82); M2(36,147) = M1(14,83); 
M2(37,48) = M1(3,3); M2(37,60) = M1(3,15); M2(37,61) = M1(3,16); M2(37,62) = M1(3,17); M2(37,63) = M1(3,18); M2(37,64) = M1(3,19); M2(37,65) = M1(3,20); M2(37,66) = M1(3,21); M2(37,67) = M1(3,22); M2(37,68) = M1(3,23); M2(37,69) = M1(3,24); M2(37,70) = M1(3,25); M2(37,71) = M1(3,26); M2(37,79) = M1(3,28); M2(37,80) = M1(3,29); M2(37,81) = M1(3,30); M2(37,82) = M1(3,31); M2(37,83) = M1(3,32); M2(37,84) = M1(3,33); M2(37,85) = M1(3,34); M2(37,86) = M1(3,35); M2(37,87) = M1(3,36); M2(37,88) = M1(3,37); M2(37,89) = M1(3,38); M2(37,90) = M1(3,39); M2(37,91) = M1(3,40); M2(37,92) = M1(3,41); M2(37,93) = M1(3,27); M2(37,94) = M1(3,42); M2(37,95) = M1(3,43); M2(37,96) = M1(3,44); M2(37,97) = M1(3,45); M2(37,98) = M1(3,46); M2(37,99) = M1(3,47); M2(37,100) = M1(3,48); M2(37,107) = M1(3,49); M2(37,108) = M1(3,50); M2(37,109) = M1(3,51); M2(37,110) = M1(3,52); M2(37,111) = M1(3,53); M2(37,112) = M1(3,54); M2(37,113) = M1(3,55); M2(37,114) = M1(3,56); M2(37,115) = M1(3,57); M2(37,116) = M1(3,58); M2(37,117) = M1(3,59); M2(37,118) = M1(3,60); M2(37,119) = M1(3,61); M2(37,120) = M1(3,62); M2(37,121) = M1(3,63); M2(37,127) = M1(3,64); M2(37,128) = M1(3,65); M2(37,129) = M1(3,66); M2(37,130) = M1(3,67); M2(37,131) = M1(3,68); M2(37,132) = M1(3,69); M2(37,133) = M1(3,70); M2(37,134) = M1(3,71); M2(37,135) = M1(3,72); M2(37,136) = M1(3,73); M2(37,141) = M1(3,74); M2(37,142) = M1(3,75); M2(37,143) = M1(3,76); M2(37,144) = M1(3,77); M2(37,145) = M1(3,78); M2(37,146) = M1(3,79); M2(37,150) = M1(3,80); M2(37,151) = M1(3,81); M2(37,152) = M1(3,82); M2(37,155) = M1(3,83); 
M2(38,49) = M1(4,4); M2(38,60) = M1(4,15); M2(38,61) = M1(4,16); M2(38,62) = M1(4,17); M2(38,63) = M1(4,18); M2(38,64) = M1(4,19); M2(38,65) = M1(4,20); M2(38,66) = M1(4,21); M2(38,67) = M1(4,22); M2(38,68) = M1(4,23); M2(38,69) = M1(4,24); M2(38,70) = M1(4,25); M2(38,71) = M1(4,26); M2(38,79) = M1(4,28); M2(38,80) = M1(4,29); M2(38,81) = M1(4,30); M2(38,82) = M1(4,31); M2(38,83) = M1(4,32); M2(38,84) = M1(4,33); M2(38,85) = M1(4,34); M2(38,86) = M1(4,35); M2(38,87) = M1(4,36); M2(38,88) = M1(4,37); M2(38,89) = M1(4,38); M2(38,90) = M1(4,39); M2(38,91) = M1(4,40); M2(38,92) = M1(4,41); M2(38,93) = M1(4,27); M2(38,94) = M1(4,42); M2(38,95) = M1(4,43); M2(38,96) = M1(4,44); M2(38,97) = M1(4,45); M2(38,98) = M1(4,46); M2(38,99) = M1(4,47); M2(38,100) = M1(4,48); M2(38,107) = M1(4,49); M2(38,108) = M1(4,50); M2(38,109) = M1(4,51); M2(38,110) = M1(4,52); M2(38,111) = M1(4,53); M2(38,112) = M1(4,54); M2(38,113) = M1(4,55); M2(38,114) = M1(4,56); M2(38,115) = M1(4,57); M2(38,116) = M1(4,58); M2(38,117) = M1(4,59); M2(38,118) = M1(4,60); M2(38,119) = M1(4,61); M2(38,120) = M1(4,62); M2(38,121) = M1(4,63); M2(38,127) = M1(4,64); M2(38,128) = M1(4,65); M2(38,129) = M1(4,66); M2(38,130) = M1(4,67); M2(38,131) = M1(4,68); M2(38,132) = M1(4,69); M2(38,133) = M1(4,70); M2(38,134) = M1(4,71); M2(38,135) = M1(4,72); M2(38,136) = M1(4,73); M2(38,141) = M1(4,74); M2(38,142) = M1(4,75); M2(38,143) = M1(4,76); M2(38,144) = M1(4,77); M2(38,145) = M1(4,78); M2(38,146) = M1(4,79); M2(38,150) = M1(4,80); M2(38,151) = M1(4,81); M2(38,152) = M1(4,82); M2(38,155) = M1(4,83); 
M2(39,50) = M1(5,5); M2(39,60) = M1(5,15); M2(39,61) = M1(5,16); M2(39,62) = M1(5,17); M2(39,63) = M1(5,18); M2(39,64) = M1(5,19); M2(39,65) = M1(5,20); M2(39,66) = M1(5,21); M2(39,67) = M1(5,22); M2(39,68) = M1(5,23); M2(39,69) = M1(5,24); M2(39,70) = M1(5,25); M2(39,71) = M1(5,26); M2(39,79) = M1(5,28); M2(39,80) = M1(5,29); M2(39,81) = M1(5,30); M2(39,82) = M1(5,31); M2(39,83) = M1(5,32); M2(39,84) = M1(5,33); M2(39,85) = M1(5,34); M2(39,86) = M1(5,35); M2(39,87) = M1(5,36); M2(39,88) = M1(5,37); M2(39,89) = M1(5,38); M2(39,90) = M1(5,39); M2(39,91) = M1(5,40); M2(39,92) = M1(5,41); M2(39,93) = M1(5,27); M2(39,94) = M1(5,42); M2(39,95) = M1(5,43); M2(39,96) = M1(5,44); M2(39,97) = M1(5,45); M2(39,98) = M1(5,46); M2(39,99) = M1(5,47); M2(39,100) = M1(5,48); M2(39,107) = M1(5,49); M2(39,108) = M1(5,50); M2(39,109) = M1(5,51); M2(39,110) = M1(5,52); M2(39,111) = M1(5,53); M2(39,112) = M1(5,54); M2(39,113) = M1(5,55); M2(39,114) = M1(5,56); M2(39,115) = M1(5,57); M2(39,116) = M1(5,58); M2(39,117) = M1(5,59); M2(39,118) = M1(5,60); M2(39,119) = M1(5,61); M2(39,120) = M1(5,62); M2(39,121) = M1(5,63); M2(39,127) = M1(5,64); M2(39,128) = M1(5,65); M2(39,129) = M1(5,66); M2(39,130) = M1(5,67); M2(39,131) = M1(5,68); M2(39,132) = M1(5,69); M2(39,133) = M1(5,70); M2(39,134) = M1(5,71); M2(39,135) = M1(5,72); M2(39,136) = M1(5,73); M2(39,141) = M1(5,74); M2(39,142) = M1(5,75); M2(39,143) = M1(5,76); M2(39,144) = M1(5,77); M2(39,145) = M1(5,78); M2(39,146) = M1(5,79); M2(39,150) = M1(5,80); M2(39,151) = M1(5,81); M2(39,152) = M1(5,82); M2(39,155) = M1(5,83); 
M2(40,51) = M1(6,6); M2(40,60) = M1(6,15); M2(40,61) = M1(6,16); M2(40,62) = M1(6,17); M2(40,63) = M1(6,18); M2(40,64) = M1(6,19); M2(40,65) = M1(6,20); M2(40,66) = M1(6,21); M2(40,67) = M1(6,22); M2(40,68) = M1(6,23); M2(40,69) = M1(6,24); M2(40,70) = M1(6,25); M2(40,71) = M1(6,26); M2(40,79) = M1(6,28); M2(40,80) = M1(6,29); M2(40,81) = M1(6,30); M2(40,82) = M1(6,31); M2(40,83) = M1(6,32); M2(40,84) = M1(6,33); M2(40,85) = M1(6,34); M2(40,86) = M1(6,35); M2(40,87) = M1(6,36); M2(40,88) = M1(6,37); M2(40,89) = M1(6,38); M2(40,90) = M1(6,39); M2(40,91) = M1(6,40); M2(40,92) = M1(6,41); M2(40,93) = M1(6,27); M2(40,94) = M1(6,42); M2(40,95) = M1(6,43); M2(40,96) = M1(6,44); M2(40,97) = M1(6,45); M2(40,98) = M1(6,46); M2(40,99) = M1(6,47); M2(40,100) = M1(6,48); M2(40,107) = M1(6,49); M2(40,108) = M1(6,50); M2(40,109) = M1(6,51); M2(40,110) = M1(6,52); M2(40,111) = M1(6,53); M2(40,112) = M1(6,54); M2(40,113) = M1(6,55); M2(40,114) = M1(6,56); M2(40,115) = M1(6,57); M2(40,116) = M1(6,58); M2(40,117) = M1(6,59); M2(40,118) = M1(6,60); M2(40,119) = M1(6,61); M2(40,120) = M1(6,62); M2(40,121) = M1(6,63); M2(40,127) = M1(6,64); M2(40,128) = M1(6,65); M2(40,129) = M1(6,66); M2(40,130) = M1(6,67); M2(40,131) = M1(6,68); M2(40,132) = M1(6,69); M2(40,133) = M1(6,70); M2(40,134) = M1(6,71); M2(40,135) = M1(6,72); M2(40,136) = M1(6,73); M2(40,141) = M1(6,74); M2(40,142) = M1(6,75); M2(40,143) = M1(6,76); M2(40,144) = M1(6,77); M2(40,145) = M1(6,78); M2(40,146) = M1(6,79); M2(40,150) = M1(6,80); M2(40,151) = M1(6,81); M2(40,152) = M1(6,82); M2(40,155) = M1(6,83); 
M2(41,52) = M1(7,7); M2(41,60) = M1(7,15); M2(41,61) = M1(7,16); M2(41,62) = M1(7,17); M2(41,63) = M1(7,18); M2(41,64) = M1(7,19); M2(41,65) = M1(7,20); M2(41,66) = M1(7,21); M2(41,67) = M1(7,22); M2(41,68) = M1(7,23); M2(41,69) = M1(7,24); M2(41,70) = M1(7,25); M2(41,71) = M1(7,26); M2(41,79) = M1(7,28); M2(41,80) = M1(7,29); M2(41,81) = M1(7,30); M2(41,82) = M1(7,31); M2(41,83) = M1(7,32); M2(41,84) = M1(7,33); M2(41,85) = M1(7,34); M2(41,86) = M1(7,35); M2(41,87) = M1(7,36); M2(41,88) = M1(7,37); M2(41,89) = M1(7,38); M2(41,90) = M1(7,39); M2(41,91) = M1(7,40); M2(41,92) = M1(7,41); M2(41,93) = M1(7,27); M2(41,94) = M1(7,42); M2(41,95) = M1(7,43); M2(41,96) = M1(7,44); M2(41,97) = M1(7,45); M2(41,98) = M1(7,46); M2(41,99) = M1(7,47); M2(41,100) = M1(7,48); M2(41,107) = M1(7,49); M2(41,108) = M1(7,50); M2(41,109) = M1(7,51); M2(41,110) = M1(7,52); M2(41,111) = M1(7,53); M2(41,112) = M1(7,54); M2(41,113) = M1(7,55); M2(41,114) = M1(7,56); M2(41,115) = M1(7,57); M2(41,116) = M1(7,58); M2(41,117) = M1(7,59); M2(41,118) = M1(7,60); M2(41,119) = M1(7,61); M2(41,120) = M1(7,62); M2(41,121) = M1(7,63); M2(41,127) = M1(7,64); M2(41,128) = M1(7,65); M2(41,129) = M1(7,66); M2(41,130) = M1(7,67); M2(41,131) = M1(7,68); M2(41,132) = M1(7,69); M2(41,133) = M1(7,70); M2(41,134) = M1(7,71); M2(41,135) = M1(7,72); M2(41,136) = M1(7,73); M2(41,141) = M1(7,74); M2(41,142) = M1(7,75); M2(41,143) = M1(7,76); M2(41,144) = M1(7,77); M2(41,145) = M1(7,78); M2(41,146) = M1(7,79); M2(41,150) = M1(7,80); M2(41,151) = M1(7,81); M2(41,152) = M1(7,82); M2(41,155) = M1(7,83); 
M2(42,53) = M1(8,8); M2(42,60) = M1(8,15); M2(42,61) = M1(8,16); M2(42,62) = M1(8,17); M2(42,63) = M1(8,18); M2(42,64) = M1(8,19); M2(42,65) = M1(8,20); M2(42,66) = M1(8,21); M2(42,67) = M1(8,22); M2(42,68) = M1(8,23); M2(42,69) = M1(8,24); M2(42,70) = M1(8,25); M2(42,71) = M1(8,26); M2(42,79) = M1(8,28); M2(42,80) = M1(8,29); M2(42,81) = M1(8,30); M2(42,82) = M1(8,31); M2(42,83) = M1(8,32); M2(42,84) = M1(8,33); M2(42,85) = M1(8,34); M2(42,86) = M1(8,35); M2(42,87) = M1(8,36); M2(42,88) = M1(8,37); M2(42,89) = M1(8,38); M2(42,90) = M1(8,39); M2(42,91) = M1(8,40); M2(42,92) = M1(8,41); M2(42,93) = M1(8,27); M2(42,94) = M1(8,42); M2(42,95) = M1(8,43); M2(42,96) = M1(8,44); M2(42,97) = M1(8,45); M2(42,98) = M1(8,46); M2(42,99) = M1(8,47); M2(42,100) = M1(8,48); M2(42,107) = M1(8,49); M2(42,108) = M1(8,50); M2(42,109) = M1(8,51); M2(42,110) = M1(8,52); M2(42,111) = M1(8,53); M2(42,112) = M1(8,54); M2(42,113) = M1(8,55); M2(42,114) = M1(8,56); M2(42,115) = M1(8,57); M2(42,116) = M1(8,58); M2(42,117) = M1(8,59); M2(42,118) = M1(8,60); M2(42,119) = M1(8,61); M2(42,120) = M1(8,62); M2(42,121) = M1(8,63); M2(42,127) = M1(8,64); M2(42,128) = M1(8,65); M2(42,129) = M1(8,66); M2(42,130) = M1(8,67); M2(42,131) = M1(8,68); M2(42,132) = M1(8,69); M2(42,133) = M1(8,70); M2(42,134) = M1(8,71); M2(42,135) = M1(8,72); M2(42,136) = M1(8,73); M2(42,141) = M1(8,74); M2(42,142) = M1(8,75); M2(42,143) = M1(8,76); M2(42,144) = M1(8,77); M2(42,145) = M1(8,78); M2(42,146) = M1(8,79); M2(42,150) = M1(8,80); M2(42,151) = M1(8,81); M2(42,152) = M1(8,82); M2(42,155) = M1(8,83); 
M2(43,54) = M1(9,9); M2(43,60) = M1(9,15); M2(43,61) = M1(9,16); M2(43,62) = M1(9,17); M2(43,63) = M1(9,18); M2(43,64) = M1(9,19); M2(43,65) = M1(9,20); M2(43,66) = M1(9,21); M2(43,67) = M1(9,22); M2(43,68) = M1(9,23); M2(43,69) = M1(9,24); M2(43,70) = M1(9,25); M2(43,71) = M1(9,26); M2(43,79) = M1(9,28); M2(43,80) = M1(9,29); M2(43,81) = M1(9,30); M2(43,82) = M1(9,31); M2(43,83) = M1(9,32); M2(43,84) = M1(9,33); M2(43,85) = M1(9,34); M2(43,86) = M1(9,35); M2(43,87) = M1(9,36); M2(43,88) = M1(9,37); M2(43,89) = M1(9,38); M2(43,90) = M1(9,39); M2(43,91) = M1(9,40); M2(43,92) = M1(9,41); M2(43,93) = M1(9,27); M2(43,94) = M1(9,42); M2(43,95) = M1(9,43); M2(43,96) = M1(9,44); M2(43,97) = M1(9,45); M2(43,98) = M1(9,46); M2(43,99) = M1(9,47); M2(43,100) = M1(9,48); M2(43,107) = M1(9,49); M2(43,108) = M1(9,50); M2(43,109) = M1(9,51); M2(43,110) = M1(9,52); M2(43,111) = M1(9,53); M2(43,112) = M1(9,54); M2(43,113) = M1(9,55); M2(43,114) = M1(9,56); M2(43,115) = M1(9,57); M2(43,116) = M1(9,58); M2(43,117) = M1(9,59); M2(43,118) = M1(9,60); M2(43,119) = M1(9,61); M2(43,120) = M1(9,62); M2(43,121) = M1(9,63); M2(43,127) = M1(9,64); M2(43,128) = M1(9,65); M2(43,129) = M1(9,66); M2(43,130) = M1(9,67); M2(43,131) = M1(9,68); M2(43,132) = M1(9,69); M2(43,133) = M1(9,70); M2(43,134) = M1(9,71); M2(43,135) = M1(9,72); M2(43,136) = M1(9,73); M2(43,141) = M1(9,74); M2(43,142) = M1(9,75); M2(43,143) = M1(9,76); M2(43,144) = M1(9,77); M2(43,145) = M1(9,78); M2(43,146) = M1(9,79); M2(43,150) = M1(9,80); M2(43,151) = M1(9,81); M2(43,152) = M1(9,82); M2(43,155) = M1(9,83); 
M2(44,55) = M1(10,10); M2(44,60) = M1(10,15); M2(44,61) = M1(10,16); M2(44,62) = M1(10,17); M2(44,63) = M1(10,18); M2(44,64) = M1(10,19); M2(44,65) = M1(10,20); M2(44,66) = M1(10,21); M2(44,67) = M1(10,22); M2(44,68) = M1(10,23); M2(44,69) = M1(10,24); M2(44,70) = M1(10,25); M2(44,71) = M1(10,26); M2(44,79) = M1(10,28); M2(44,80) = M1(10,29); M2(44,81) = M1(10,30); M2(44,82) = M1(10,31); M2(44,83) = M1(10,32); M2(44,84) = M1(10,33); M2(44,85) = M1(10,34); M2(44,86) = M1(10,35); M2(44,87) = M1(10,36); M2(44,88) = M1(10,37); M2(44,89) = M1(10,38); M2(44,90) = M1(10,39); M2(44,91) = M1(10,40); M2(44,92) = M1(10,41); M2(44,93) = M1(10,27); M2(44,94) = M1(10,42); M2(44,95) = M1(10,43); M2(44,96) = M1(10,44); M2(44,97) = M1(10,45); M2(44,98) = M1(10,46); M2(44,99) = M1(10,47); M2(44,100) = M1(10,48); M2(44,107) = M1(10,49); M2(44,108) = M1(10,50); M2(44,109) = M1(10,51); M2(44,110) = M1(10,52); M2(44,111) = M1(10,53); M2(44,112) = M1(10,54); M2(44,113) = M1(10,55); M2(44,114) = M1(10,56); M2(44,115) = M1(10,57); M2(44,116) = M1(10,58); M2(44,117) = M1(10,59); M2(44,118) = M1(10,60); M2(44,119) = M1(10,61); M2(44,120) = M1(10,62); M2(44,121) = M1(10,63); M2(44,127) = M1(10,64); M2(44,128) = M1(10,65); M2(44,129) = M1(10,66); M2(44,130) = M1(10,67); M2(44,131) = M1(10,68); M2(44,132) = M1(10,69); M2(44,133) = M1(10,70); M2(44,134) = M1(10,71); M2(44,135) = M1(10,72); M2(44,136) = M1(10,73); M2(44,141) = M1(10,74); M2(44,142) = M1(10,75); M2(44,143) = M1(10,76); M2(44,144) = M1(10,77); M2(44,145) = M1(10,78); M2(44,146) = M1(10,79); M2(44,150) = M1(10,80); M2(44,151) = M1(10,81); M2(44,152) = M1(10,82); M2(44,155) = M1(10,83); 
M2(45,56) = M1(11,11); M2(45,60) = M1(11,15); M2(45,61) = M1(11,16); M2(45,62) = M1(11,17); M2(45,63) = M1(11,18); M2(45,64) = M1(11,19); M2(45,65) = M1(11,20); M2(45,66) = M1(11,21); M2(45,67) = M1(11,22); M2(45,68) = M1(11,23); M2(45,69) = M1(11,24); M2(45,70) = M1(11,25); M2(45,71) = M1(11,26); M2(45,79) = M1(11,28); M2(45,80) = M1(11,29); M2(45,81) = M1(11,30); M2(45,82) = M1(11,31); M2(45,83) = M1(11,32); M2(45,84) = M1(11,33); M2(45,85) = M1(11,34); M2(45,86) = M1(11,35); M2(45,87) = M1(11,36); M2(45,88) = M1(11,37); M2(45,89) = M1(11,38); M2(45,90) = M1(11,39); M2(45,91) = M1(11,40); M2(45,92) = M1(11,41); M2(45,93) = M1(11,27); M2(45,94) = M1(11,42); M2(45,95) = M1(11,43); M2(45,96) = M1(11,44); M2(45,97) = M1(11,45); M2(45,98) = M1(11,46); M2(45,99) = M1(11,47); M2(45,100) = M1(11,48); M2(45,107) = M1(11,49); M2(45,108) = M1(11,50); M2(45,109) = M1(11,51); M2(45,110) = M1(11,52); M2(45,111) = M1(11,53); M2(45,112) = M1(11,54); M2(45,113) = M1(11,55); M2(45,114) = M1(11,56); M2(45,115) = M1(11,57); M2(45,116) = M1(11,58); M2(45,117) = M1(11,59); M2(45,118) = M1(11,60); M2(45,119) = M1(11,61); M2(45,120) = M1(11,62); M2(45,121) = M1(11,63); M2(45,127) = M1(11,64); M2(45,128) = M1(11,65); M2(45,129) = M1(11,66); M2(45,130) = M1(11,67); M2(45,131) = M1(11,68); M2(45,132) = M1(11,69); M2(45,133) = M1(11,70); M2(45,134) = M1(11,71); M2(45,135) = M1(11,72); M2(45,136) = M1(11,73); M2(45,141) = M1(11,74); M2(45,142) = M1(11,75); M2(45,143) = M1(11,76); M2(45,144) = M1(11,77); M2(45,145) = M1(11,78); M2(45,146) = M1(11,79); M2(45,150) = M1(11,80); M2(45,151) = M1(11,81); M2(45,152) = M1(11,82); M2(45,155) = M1(11,83); 
M2(46,57) = M1(12,12); M2(46,60) = M1(12,15); M2(46,61) = M1(12,16); M2(46,62) = M1(12,17); M2(46,63) = M1(12,18); M2(46,64) = M1(12,19); M2(46,65) = M1(12,20); M2(46,66) = M1(12,21); M2(46,67) = M1(12,22); M2(46,68) = M1(12,23); M2(46,69) = M1(12,24); M2(46,70) = M1(12,25); M2(46,71) = M1(12,26); M2(46,79) = M1(12,28); M2(46,80) = M1(12,29); M2(46,81) = M1(12,30); M2(46,82) = M1(12,31); M2(46,83) = M1(12,32); M2(46,84) = M1(12,33); M2(46,85) = M1(12,34); M2(46,86) = M1(12,35); M2(46,87) = M1(12,36); M2(46,88) = M1(12,37); M2(46,89) = M1(12,38); M2(46,90) = M1(12,39); M2(46,91) = M1(12,40); M2(46,92) = M1(12,41); M2(46,93) = M1(12,27); M2(46,94) = M1(12,42); M2(46,95) = M1(12,43); M2(46,96) = M1(12,44); M2(46,97) = M1(12,45); M2(46,98) = M1(12,46); M2(46,99) = M1(12,47); M2(46,100) = M1(12,48); M2(46,107) = M1(12,49); M2(46,108) = M1(12,50); M2(46,109) = M1(12,51); M2(46,110) = M1(12,52); M2(46,111) = M1(12,53); M2(46,112) = M1(12,54); M2(46,113) = M1(12,55); M2(46,114) = M1(12,56); M2(46,115) = M1(12,57); M2(46,116) = M1(12,58); M2(46,117) = M1(12,59); M2(46,118) = M1(12,60); M2(46,119) = M1(12,61); M2(46,120) = M1(12,62); M2(46,121) = M1(12,63); M2(46,127) = M1(12,64); M2(46,128) = M1(12,65); M2(46,129) = M1(12,66); M2(46,130) = M1(12,67); M2(46,131) = M1(12,68); M2(46,132) = M1(12,69); M2(46,133) = M1(12,70); M2(46,134) = M1(12,71); M2(46,135) = M1(12,72); M2(46,136) = M1(12,73); M2(46,141) = M1(12,74); M2(46,142) = M1(12,75); M2(46,143) = M1(12,76); M2(46,144) = M1(12,77); M2(46,145) = M1(12,78); M2(46,146) = M1(12,79); M2(46,150) = M1(12,80); M2(46,151) = M1(12,81); M2(46,152) = M1(12,82); M2(46,155) = M1(12,83); 
M2(47,58) = M1(13,13); M2(47,60) = M1(13,15); M2(47,61) = M1(13,16); M2(47,62) = M1(13,17); M2(47,63) = M1(13,18); M2(47,64) = M1(13,19); M2(47,65) = M1(13,20); M2(47,66) = M1(13,21); M2(47,67) = M1(13,22); M2(47,68) = M1(13,23); M2(47,69) = M1(13,24); M2(47,70) = M1(13,25); M2(47,71) = M1(13,26); M2(47,79) = M1(13,28); M2(47,80) = M1(13,29); M2(47,81) = M1(13,30); M2(47,82) = M1(13,31); M2(47,83) = M1(13,32); M2(47,84) = M1(13,33); M2(47,85) = M1(13,34); M2(47,86) = M1(13,35); M2(47,87) = M1(13,36); M2(47,88) = M1(13,37); M2(47,89) = M1(13,38); M2(47,90) = M1(13,39); M2(47,91) = M1(13,40); M2(47,92) = M1(13,41); M2(47,93) = M1(13,27); M2(47,94) = M1(13,42); M2(47,95) = M1(13,43); M2(47,96) = M1(13,44); M2(47,97) = M1(13,45); M2(47,98) = M1(13,46); M2(47,99) = M1(13,47); M2(47,100) = M1(13,48); M2(47,107) = M1(13,49); M2(47,108) = M1(13,50); M2(47,109) = M1(13,51); M2(47,110) = M1(13,52); M2(47,111) = M1(13,53); M2(47,112) = M1(13,54); M2(47,113) = M1(13,55); M2(47,114) = M1(13,56); M2(47,115) = M1(13,57); M2(47,116) = M1(13,58); M2(47,117) = M1(13,59); M2(47,118) = M1(13,60); M2(47,119) = M1(13,61); M2(47,120) = M1(13,62); M2(47,121) = M1(13,63); M2(47,127) = M1(13,64); M2(47,128) = M1(13,65); M2(47,129) = M1(13,66); M2(47,130) = M1(13,67); M2(47,131) = M1(13,68); M2(47,132) = M1(13,69); M2(47,133) = M1(13,70); M2(47,134) = M1(13,71); M2(47,135) = M1(13,72); M2(47,136) = M1(13,73); M2(47,141) = M1(13,74); M2(47,142) = M1(13,75); M2(47,143) = M1(13,76); M2(47,144) = M1(13,77); M2(47,145) = M1(13,78); M2(47,146) = M1(13,79); M2(47,150) = M1(13,80); M2(47,151) = M1(13,81); M2(47,152) = M1(13,82); M2(47,155) = M1(13,83); 
M2(48,59) = M1(14,14); M2(48,60) = M1(14,15); M2(48,61) = M1(14,16); M2(48,62) = M1(14,17); M2(48,63) = M1(14,18); M2(48,64) = M1(14,19); M2(48,65) = M1(14,20); M2(48,66) = M1(14,21); M2(48,67) = M1(14,22); M2(48,68) = M1(14,23); M2(48,69) = M1(14,24); M2(48,70) = M1(14,25); M2(48,71) = M1(14,26); M2(48,79) = M1(14,28); M2(48,80) = M1(14,29); M2(48,81) = M1(14,30); M2(48,82) = M1(14,31); M2(48,83) = M1(14,32); M2(48,84) = M1(14,33); M2(48,85) = M1(14,34); M2(48,86) = M1(14,35); M2(48,87) = M1(14,36); M2(48,88) = M1(14,37); M2(48,89) = M1(14,38); M2(48,90) = M1(14,39); M2(48,91) = M1(14,40); M2(48,92) = M1(14,41); M2(48,93) = M1(14,27); M2(48,94) = M1(14,42); M2(48,95) = M1(14,43); M2(48,96) = M1(14,44); M2(48,97) = M1(14,45); M2(48,98) = M1(14,46); M2(48,99) = M1(14,47); M2(48,100) = M1(14,48); M2(48,107) = M1(14,49); M2(48,108) = M1(14,50); M2(48,109) = M1(14,51); M2(48,110) = M1(14,52); M2(48,111) = M1(14,53); M2(48,112) = M1(14,54); M2(48,113) = M1(14,55); M2(48,114) = M1(14,56); M2(48,115) = M1(14,57); M2(48,116) = M1(14,58); M2(48,117) = M1(14,59); M2(48,118) = M1(14,60); M2(48,119) = M1(14,61); M2(48,120) = M1(14,62); M2(48,121) = M1(14,63); M2(48,127) = M1(14,64); M2(48,128) = M1(14,65); M2(48,129) = M1(14,66); M2(48,130) = M1(14,67); M2(48,131) = M1(14,68); M2(48,132) = M1(14,69); M2(48,133) = M1(14,70); M2(48,134) = M1(14,71); M2(48,135) = M1(14,72); M2(48,136) = M1(14,73); M2(48,141) = M1(14,74); M2(48,142) = M1(14,75); M2(48,143) = M1(14,76); M2(48,144) = M1(14,77); M2(48,145) = M1(14,78); M2(48,146) = M1(14,79); M2(48,150) = M1(14,80); M2(48,151) = M1(14,81); M2(48,152) = M1(14,82); M2(48,155) = M1(14,83); 
M2(49,39) = M1(1,1); M2(49,55) = M1(1,15); M2(49,56) = M1(1,16); M2(49,57) = M1(1,17); M2(49,59) = M1(1,18); M2(49,60) = M1(1,19); M2(49,61) = M1(1,20); M2(49,62) = M1(1,21); M2(49,64) = M1(1,22); M2(49,65) = M1(1,23); M2(49,66) = M1(1,24); M2(49,68) = M1(1,25); M2(49,69) = M1(1,26); M2(49,71) = M1(1,27); M2(49,73) = M1(1,28); M2(49,74) = M1(1,29); M2(49,75) = M1(1,30); M2(49,76) = M1(1,31); M2(49,77) = M1(1,32); M2(49,78) = M1(1,33); M2(49,80) = M1(1,34); M2(49,81) = M1(1,35); M2(49,82) = M1(1,36); M2(49,83) = M1(1,37); M2(49,84) = M1(1,38); M2(49,86) = M1(1,39); M2(49,87) = M1(1,40); M2(49,88) = M1(1,41); M2(49,89) = M1(1,42); M2(49,91) = M1(1,43); M2(49,92) = M1(1,44); M2(49,94) = M1(1,45); M2(49,96) = M1(1,46); M2(49,97) = M1(1,47); M2(49,99) = M1(1,48); M2(49,102) = M1(1,49); M2(49,103) = M1(1,50); M2(49,104) = M1(1,51); M2(49,105) = M1(1,52); M2(49,106) = M1(1,53); M2(49,108) = M1(1,54); M2(49,109) = M1(1,55); M2(49,110) = M1(1,56); M2(49,111) = M1(1,57); M2(49,113) = M1(1,58); M2(49,114) = M1(1,59); M2(49,115) = M1(1,60); M2(49,117) = M1(1,61); M2(49,118) = M1(1,62); M2(49,120) = M1(1,63); M2(49,123) = M1(1,64); M2(49,124) = M1(1,65); M2(49,125) = M1(1,66); M2(49,126) = M1(1,67); M2(49,128) = M1(1,68); M2(49,129) = M1(1,69); M2(49,130) = M1(1,70); M2(49,132) = M1(1,71); M2(49,133) = M1(1,72); M2(49,135) = M1(1,73); M2(49,138) = M1(1,74); M2(49,139) = M1(1,75); M2(49,140) = M1(1,76); M2(49,142) = M1(1,77); M2(49,143) = M1(1,78); M2(49,145) = M1(1,79); M2(49,148) = M1(1,80); M2(49,149) = M1(1,81); M2(49,151) = M1(1,82); M2(49,154) = M1(1,83); 
M2(50,40) = M1(2,2); M2(50,55) = M1(2,15); M2(50,56) = M1(2,16); M2(50,57) = M1(2,17); M2(50,59) = M1(2,18); M2(50,60) = M1(2,19); M2(50,61) = M1(2,20); M2(50,62) = M1(2,21); M2(50,64) = M1(2,22); M2(50,65) = M1(2,23); M2(50,66) = M1(2,24); M2(50,68) = M1(2,25); M2(50,69) = M1(2,26); M2(50,71) = M1(2,27); M2(50,73) = M1(2,28); M2(50,74) = M1(2,29); M2(50,75) = M1(2,30); M2(50,76) = M1(2,31); M2(50,77) = M1(2,32); M2(50,78) = M1(2,33); M2(50,80) = M1(2,34); M2(50,81) = M1(2,35); M2(50,82) = M1(2,36); M2(50,83) = M1(2,37); M2(50,84) = M1(2,38); M2(50,86) = M1(2,39); M2(50,87) = M1(2,40); M2(50,88) = M1(2,41); M2(50,89) = M1(2,42); M2(50,91) = M1(2,43); M2(50,92) = M1(2,44); M2(50,94) = M1(2,45); M2(50,96) = M1(2,46); M2(50,97) = M1(2,47); M2(50,99) = M1(2,48); M2(50,102) = M1(2,49); M2(50,103) = M1(2,50); M2(50,104) = M1(2,51); M2(50,105) = M1(2,52); M2(50,106) = M1(2,53); M2(50,108) = M1(2,54); M2(50,109) = M1(2,55); M2(50,110) = M1(2,56); M2(50,111) = M1(2,57); M2(50,113) = M1(2,58); M2(50,114) = M1(2,59); M2(50,115) = M1(2,60); M2(50,117) = M1(2,61); M2(50,118) = M1(2,62); M2(50,120) = M1(2,63); M2(50,123) = M1(2,64); M2(50,124) = M1(2,65); M2(50,125) = M1(2,66); M2(50,126) = M1(2,67); M2(50,128) = M1(2,68); M2(50,129) = M1(2,69); M2(50,130) = M1(2,70); M2(50,132) = M1(2,71); M2(50,133) = M1(2,72); M2(50,135) = M1(2,73); M2(50,138) = M1(2,74); M2(50,139) = M1(2,75); M2(50,140) = M1(2,76); M2(50,142) = M1(2,77); M2(50,143) = M1(2,78); M2(50,145) = M1(2,79); M2(50,148) = M1(2,80); M2(50,149) = M1(2,81); M2(50,151) = M1(2,82); M2(50,154) = M1(2,83); 
M2(51,41) = M1(3,3); M2(51,55) = M1(3,15); M2(51,56) = M1(3,16); M2(51,57) = M1(3,17); M2(51,59) = M1(3,18); M2(51,60) = M1(3,19); M2(51,61) = M1(3,20); M2(51,62) = M1(3,21); M2(51,64) = M1(3,22); M2(51,65) = M1(3,23); M2(51,66) = M1(3,24); M2(51,68) = M1(3,25); M2(51,69) = M1(3,26); M2(51,71) = M1(3,27); M2(51,73) = M1(3,28); M2(51,74) = M1(3,29); M2(51,75) = M1(3,30); M2(51,76) = M1(3,31); M2(51,77) = M1(3,32); M2(51,78) = M1(3,33); M2(51,80) = M1(3,34); M2(51,81) = M1(3,35); M2(51,82) = M1(3,36); M2(51,83) = M1(3,37); M2(51,84) = M1(3,38); M2(51,86) = M1(3,39); M2(51,87) = M1(3,40); M2(51,88) = M1(3,41); M2(51,89) = M1(3,42); M2(51,91) = M1(3,43); M2(51,92) = M1(3,44); M2(51,94) = M1(3,45); M2(51,96) = M1(3,46); M2(51,97) = M1(3,47); M2(51,99) = M1(3,48); M2(51,102) = M1(3,49); M2(51,103) = M1(3,50); M2(51,104) = M1(3,51); M2(51,105) = M1(3,52); M2(51,106) = M1(3,53); M2(51,108) = M1(3,54); M2(51,109) = M1(3,55); M2(51,110) = M1(3,56); M2(51,111) = M1(3,57); M2(51,113) = M1(3,58); M2(51,114) = M1(3,59); M2(51,115) = M1(3,60); M2(51,117) = M1(3,61); M2(51,118) = M1(3,62); M2(51,120) = M1(3,63); M2(51,123) = M1(3,64); M2(51,124) = M1(3,65); M2(51,125) = M1(3,66); M2(51,126) = M1(3,67); M2(51,128) = M1(3,68); M2(51,129) = M1(3,69); M2(51,130) = M1(3,70); M2(51,132) = M1(3,71); M2(51,133) = M1(3,72); M2(51,135) = M1(3,73); M2(51,138) = M1(3,74); M2(51,139) = M1(3,75); M2(51,140) = M1(3,76); M2(51,142) = M1(3,77); M2(51,143) = M1(3,78); M2(51,145) = M1(3,79); M2(51,148) = M1(3,80); M2(51,149) = M1(3,81); M2(51,151) = M1(3,82); M2(51,154) = M1(3,83); 
M2(52,42) = M1(4,4); M2(52,55) = M1(4,15); M2(52,56) = M1(4,16); M2(52,57) = M1(4,17); M2(52,59) = M1(4,18); M2(52,60) = M1(4,19); M2(52,61) = M1(4,20); M2(52,62) = M1(4,21); M2(52,64) = M1(4,22); M2(52,65) = M1(4,23); M2(52,66) = M1(4,24); M2(52,68) = M1(4,25); M2(52,69) = M1(4,26); M2(52,71) = M1(4,27); M2(52,73) = M1(4,28); M2(52,74) = M1(4,29); M2(52,75) = M1(4,30); M2(52,76) = M1(4,31); M2(52,77) = M1(4,32); M2(52,78) = M1(4,33); M2(52,80) = M1(4,34); M2(52,81) = M1(4,35); M2(52,82) = M1(4,36); M2(52,83) = M1(4,37); M2(52,84) = M1(4,38); M2(52,86) = M1(4,39); M2(52,87) = M1(4,40); M2(52,88) = M1(4,41); M2(52,89) = M1(4,42); M2(52,91) = M1(4,43); M2(52,92) = M1(4,44); M2(52,94) = M1(4,45); M2(52,96) = M1(4,46); M2(52,97) = M1(4,47); M2(52,99) = M1(4,48); M2(52,102) = M1(4,49); M2(52,103) = M1(4,50); M2(52,104) = M1(4,51); M2(52,105) = M1(4,52); M2(52,106) = M1(4,53); M2(52,108) = M1(4,54); M2(52,109) = M1(4,55); M2(52,110) = M1(4,56); M2(52,111) = M1(4,57); M2(52,113) = M1(4,58); M2(52,114) = M1(4,59); M2(52,115) = M1(4,60); M2(52,117) = M1(4,61); M2(52,118) = M1(4,62); M2(52,120) = M1(4,63); M2(52,123) = M1(4,64); M2(52,124) = M1(4,65); M2(52,125) = M1(4,66); M2(52,126) = M1(4,67); M2(52,128) = M1(4,68); M2(52,129) = M1(4,69); M2(52,130) = M1(4,70); M2(52,132) = M1(4,71); M2(52,133) = M1(4,72); M2(52,135) = M1(4,73); M2(52,138) = M1(4,74); M2(52,139) = M1(4,75); M2(52,140) = M1(4,76); M2(52,142) = M1(4,77); M2(52,143) = M1(4,78); M2(52,145) = M1(4,79); M2(52,148) = M1(4,80); M2(52,149) = M1(4,81); M2(52,151) = M1(4,82); M2(52,154) = M1(4,83); 
M2(53,43) = M1(5,5); M2(53,55) = M1(5,15); M2(53,56) = M1(5,16); M2(53,57) = M1(5,17); M2(53,59) = M1(5,18); M2(53,60) = M1(5,19); M2(53,61) = M1(5,20); M2(53,62) = M1(5,21); M2(53,64) = M1(5,22); M2(53,65) = M1(5,23); M2(53,66) = M1(5,24); M2(53,68) = M1(5,25); M2(53,69) = M1(5,26); M2(53,71) = M1(5,27); M2(53,73) = M1(5,28); M2(53,74) = M1(5,29); M2(53,75) = M1(5,30); M2(53,76) = M1(5,31); M2(53,77) = M1(5,32); M2(53,78) = M1(5,33); M2(53,80) = M1(5,34); M2(53,81) = M1(5,35); M2(53,82) = M1(5,36); M2(53,83) = M1(5,37); M2(53,84) = M1(5,38); M2(53,86) = M1(5,39); M2(53,87) = M1(5,40); M2(53,88) = M1(5,41); M2(53,89) = M1(5,42); M2(53,91) = M1(5,43); M2(53,92) = M1(5,44); M2(53,94) = M1(5,45); M2(53,96) = M1(5,46); M2(53,97) = M1(5,47); M2(53,99) = M1(5,48); M2(53,102) = M1(5,49); M2(53,103) = M1(5,50); M2(53,104) = M1(5,51); M2(53,105) = M1(5,52); M2(53,106) = M1(5,53); M2(53,108) = M1(5,54); M2(53,109) = M1(5,55); M2(53,110) = M1(5,56); M2(53,111) = M1(5,57); M2(53,113) = M1(5,58); M2(53,114) = M1(5,59); M2(53,115) = M1(5,60); M2(53,117) = M1(5,61); M2(53,118) = M1(5,62); M2(53,120) = M1(5,63); M2(53,123) = M1(5,64); M2(53,124) = M1(5,65); M2(53,125) = M1(5,66); M2(53,126) = M1(5,67); M2(53,128) = M1(5,68); M2(53,129) = M1(5,69); M2(53,130) = M1(5,70); M2(53,132) = M1(5,71); M2(53,133) = M1(5,72); M2(53,135) = M1(5,73); M2(53,138) = M1(5,74); M2(53,139) = M1(5,75); M2(53,140) = M1(5,76); M2(53,142) = M1(5,77); M2(53,143) = M1(5,78); M2(53,145) = M1(5,79); M2(53,148) = M1(5,80); M2(53,149) = M1(5,81); M2(53,151) = M1(5,82); M2(53,154) = M1(5,83); 
M2(54,44) = M1(6,6); M2(54,55) = M1(6,15); M2(54,56) = M1(6,16); M2(54,57) = M1(6,17); M2(54,59) = M1(6,18); M2(54,60) = M1(6,19); M2(54,61) = M1(6,20); M2(54,62) = M1(6,21); M2(54,64) = M1(6,22); M2(54,65) = M1(6,23); M2(54,66) = M1(6,24); M2(54,68) = M1(6,25); M2(54,69) = M1(6,26); M2(54,71) = M1(6,27); M2(54,73) = M1(6,28); M2(54,74) = M1(6,29); M2(54,75) = M1(6,30); M2(54,76) = M1(6,31); M2(54,77) = M1(6,32); M2(54,78) = M1(6,33); M2(54,80) = M1(6,34); M2(54,81) = M1(6,35); M2(54,82) = M1(6,36); M2(54,83) = M1(6,37); M2(54,84) = M1(6,38); M2(54,86) = M1(6,39); M2(54,87) = M1(6,40); M2(54,88) = M1(6,41); M2(54,89) = M1(6,42); M2(54,91) = M1(6,43); M2(54,92) = M1(6,44); M2(54,94) = M1(6,45); M2(54,96) = M1(6,46); M2(54,97) = M1(6,47); M2(54,99) = M1(6,48); M2(54,102) = M1(6,49); M2(54,103) = M1(6,50); M2(54,104) = M1(6,51); M2(54,105) = M1(6,52); M2(54,106) = M1(6,53); M2(54,108) = M1(6,54); M2(54,109) = M1(6,55); M2(54,110) = M1(6,56); M2(54,111) = M1(6,57); M2(54,113) = M1(6,58); M2(54,114) = M1(6,59); M2(54,115) = M1(6,60); M2(54,117) = M1(6,61); M2(54,118) = M1(6,62); M2(54,120) = M1(6,63); M2(54,123) = M1(6,64); M2(54,124) = M1(6,65); M2(54,125) = M1(6,66); M2(54,126) = M1(6,67); M2(54,128) = M1(6,68); M2(54,129) = M1(6,69); M2(54,130) = M1(6,70); M2(54,132) = M1(6,71); M2(54,133) = M1(6,72); M2(54,135) = M1(6,73); M2(54,138) = M1(6,74); M2(54,139) = M1(6,75); M2(54,140) = M1(6,76); M2(54,142) = M1(6,77); M2(54,143) = M1(6,78); M2(54,145) = M1(6,79); M2(54,148) = M1(6,80); M2(54,149) = M1(6,81); M2(54,151) = M1(6,82); M2(54,154) = M1(6,83); 
M2(55,46) = M1(7,7); M2(55,55) = M1(7,15); M2(55,56) = M1(7,16); M2(55,57) = M1(7,17); M2(55,59) = M1(7,18); M2(55,60) = M1(7,19); M2(55,61) = M1(7,20); M2(55,62) = M1(7,21); M2(55,64) = M1(7,22); M2(55,65) = M1(7,23); M2(55,66) = M1(7,24); M2(55,68) = M1(7,25); M2(55,69) = M1(7,26); M2(55,71) = M1(7,27); M2(55,73) = M1(7,28); M2(55,74) = M1(7,29); M2(55,75) = M1(7,30); M2(55,76) = M1(7,31); M2(55,77) = M1(7,32); M2(55,78) = M1(7,33); M2(55,80) = M1(7,34); M2(55,81) = M1(7,35); M2(55,82) = M1(7,36); M2(55,83) = M1(7,37); M2(55,84) = M1(7,38); M2(55,86) = M1(7,39); M2(55,87) = M1(7,40); M2(55,88) = M1(7,41); M2(55,89) = M1(7,42); M2(55,91) = M1(7,43); M2(55,92) = M1(7,44); M2(55,94) = M1(7,45); M2(55,96) = M1(7,46); M2(55,97) = M1(7,47); M2(55,99) = M1(7,48); M2(55,102) = M1(7,49); M2(55,103) = M1(7,50); M2(55,104) = M1(7,51); M2(55,105) = M1(7,52); M2(55,106) = M1(7,53); M2(55,108) = M1(7,54); M2(55,109) = M1(7,55); M2(55,110) = M1(7,56); M2(55,111) = M1(7,57); M2(55,113) = M1(7,58); M2(55,114) = M1(7,59); M2(55,115) = M1(7,60); M2(55,117) = M1(7,61); M2(55,118) = M1(7,62); M2(55,120) = M1(7,63); M2(55,123) = M1(7,64); M2(55,124) = M1(7,65); M2(55,125) = M1(7,66); M2(55,126) = M1(7,67); M2(55,128) = M1(7,68); M2(55,129) = M1(7,69); M2(55,130) = M1(7,70); M2(55,132) = M1(7,71); M2(55,133) = M1(7,72); M2(55,135) = M1(7,73); M2(55,138) = M1(7,74); M2(55,139) = M1(7,75); M2(55,140) = M1(7,76); M2(55,142) = M1(7,77); M2(55,143) = M1(7,78); M2(55,145) = M1(7,79); M2(55,148) = M1(7,80); M2(55,149) = M1(7,81); M2(55,151) = M1(7,82); M2(55,154) = M1(7,83); 
M2(56,47) = M1(8,8); M2(56,55) = M1(8,15); M2(56,56) = M1(8,16); M2(56,57) = M1(8,17); M2(56,59) = M1(8,18); M2(56,60) = M1(8,19); M2(56,61) = M1(8,20); M2(56,62) = M1(8,21); M2(56,64) = M1(8,22); M2(56,65) = M1(8,23); M2(56,66) = M1(8,24); M2(56,68) = M1(8,25); M2(56,69) = M1(8,26); M2(56,71) = M1(8,27); M2(56,73) = M1(8,28); M2(56,74) = M1(8,29); M2(56,75) = M1(8,30); M2(56,76) = M1(8,31); M2(56,77) = M1(8,32); M2(56,78) = M1(8,33); M2(56,80) = M1(8,34); M2(56,81) = M1(8,35); M2(56,82) = M1(8,36); M2(56,83) = M1(8,37); M2(56,84) = M1(8,38); M2(56,86) = M1(8,39); M2(56,87) = M1(8,40); M2(56,88) = M1(8,41); M2(56,89) = M1(8,42); M2(56,91) = M1(8,43); M2(56,92) = M1(8,44); M2(56,94) = M1(8,45); M2(56,96) = M1(8,46); M2(56,97) = M1(8,47); M2(56,99) = M1(8,48); M2(56,102) = M1(8,49); M2(56,103) = M1(8,50); M2(56,104) = M1(8,51); M2(56,105) = M1(8,52); M2(56,106) = M1(8,53); M2(56,108) = M1(8,54); M2(56,109) = M1(8,55); M2(56,110) = M1(8,56); M2(56,111) = M1(8,57); M2(56,113) = M1(8,58); M2(56,114) = M1(8,59); M2(56,115) = M1(8,60); M2(56,117) = M1(8,61); M2(56,118) = M1(8,62); M2(56,120) = M1(8,63); M2(56,123) = M1(8,64); M2(56,124) = M1(8,65); M2(56,125) = M1(8,66); M2(56,126) = M1(8,67); M2(56,128) = M1(8,68); M2(56,129) = M1(8,69); M2(56,130) = M1(8,70); M2(56,132) = M1(8,71); M2(56,133) = M1(8,72); M2(56,135) = M1(8,73); M2(56,138) = M1(8,74); M2(56,139) = M1(8,75); M2(56,140) = M1(8,76); M2(56,142) = M1(8,77); M2(56,143) = M1(8,78); M2(56,145) = M1(8,79); M2(56,148) = M1(8,80); M2(56,149) = M1(8,81); M2(56,151) = M1(8,82); M2(56,154) = M1(8,83); 
M2(57,48) = M1(9,9); M2(57,55) = M1(9,15); M2(57,56) = M1(9,16); M2(57,57) = M1(9,17); M2(57,59) = M1(9,18); M2(57,60) = M1(9,19); M2(57,61) = M1(9,20); M2(57,62) = M1(9,21); M2(57,64) = M1(9,22); M2(57,65) = M1(9,23); M2(57,66) = M1(9,24); M2(57,68) = M1(9,25); M2(57,69) = M1(9,26); M2(57,71) = M1(9,27); M2(57,73) = M1(9,28); M2(57,74) = M1(9,29); M2(57,75) = M1(9,30); M2(57,76) = M1(9,31); M2(57,77) = M1(9,32); M2(57,78) = M1(9,33); M2(57,80) = M1(9,34); M2(57,81) = M1(9,35); M2(57,82) = M1(9,36); M2(57,83) = M1(9,37); M2(57,84) = M1(9,38); M2(57,86) = M1(9,39); M2(57,87) = M1(9,40); M2(57,88) = M1(9,41); M2(57,89) = M1(9,42); M2(57,91) = M1(9,43); M2(57,92) = M1(9,44); M2(57,94) = M1(9,45); M2(57,96) = M1(9,46); M2(57,97) = M1(9,47); M2(57,99) = M1(9,48); M2(57,102) = M1(9,49); M2(57,103) = M1(9,50); M2(57,104) = M1(9,51); M2(57,105) = M1(9,52); M2(57,106) = M1(9,53); M2(57,108) = M1(9,54); M2(57,109) = M1(9,55); M2(57,110) = M1(9,56); M2(57,111) = M1(9,57); M2(57,113) = M1(9,58); M2(57,114) = M1(9,59); M2(57,115) = M1(9,60); M2(57,117) = M1(9,61); M2(57,118) = M1(9,62); M2(57,120) = M1(9,63); M2(57,123) = M1(9,64); M2(57,124) = M1(9,65); M2(57,125) = M1(9,66); M2(57,126) = M1(9,67); M2(57,128) = M1(9,68); M2(57,129) = M1(9,69); M2(57,130) = M1(9,70); M2(57,132) = M1(9,71); M2(57,133) = M1(9,72); M2(57,135) = M1(9,73); M2(57,138) = M1(9,74); M2(57,139) = M1(9,75); M2(57,140) = M1(9,76); M2(57,142) = M1(9,77); M2(57,143) = M1(9,78); M2(57,145) = M1(9,79); M2(57,148) = M1(9,80); M2(57,149) = M1(9,81); M2(57,151) = M1(9,82); M2(57,154) = M1(9,83); 
M2(58,49) = M1(10,10); M2(58,55) = M1(10,15); M2(58,56) = M1(10,16); M2(58,57) = M1(10,17); M2(58,59) = M1(10,18); M2(58,60) = M1(10,19); M2(58,61) = M1(10,20); M2(58,62) = M1(10,21); M2(58,64) = M1(10,22); M2(58,65) = M1(10,23); M2(58,66) = M1(10,24); M2(58,68) = M1(10,25); M2(58,69) = M1(10,26); M2(58,71) = M1(10,27); M2(58,73) = M1(10,28); M2(58,74) = M1(10,29); M2(58,75) = M1(10,30); M2(58,76) = M1(10,31); M2(58,77) = M1(10,32); M2(58,78) = M1(10,33); M2(58,80) = M1(10,34); M2(58,81) = M1(10,35); M2(58,82) = M1(10,36); M2(58,83) = M1(10,37); M2(58,84) = M1(10,38); M2(58,86) = M1(10,39); M2(58,87) = M1(10,40); M2(58,88) = M1(10,41); M2(58,89) = M1(10,42); M2(58,91) = M1(10,43); M2(58,92) = M1(10,44); M2(58,94) = M1(10,45); M2(58,96) = M1(10,46); M2(58,97) = M1(10,47); M2(58,99) = M1(10,48); M2(58,102) = M1(10,49); M2(58,103) = M1(10,50); M2(58,104) = M1(10,51); M2(58,105) = M1(10,52); M2(58,106) = M1(10,53); M2(58,108) = M1(10,54); M2(58,109) = M1(10,55); M2(58,110) = M1(10,56); M2(58,111) = M1(10,57); M2(58,113) = M1(10,58); M2(58,114) = M1(10,59); M2(58,115) = M1(10,60); M2(58,117) = M1(10,61); M2(58,118) = M1(10,62); M2(58,120) = M1(10,63); M2(58,123) = M1(10,64); M2(58,124) = M1(10,65); M2(58,125) = M1(10,66); M2(58,126) = M1(10,67); M2(58,128) = M1(10,68); M2(58,129) = M1(10,69); M2(58,130) = M1(10,70); M2(58,132) = M1(10,71); M2(58,133) = M1(10,72); M2(58,135) = M1(10,73); M2(58,138) = M1(10,74); M2(58,139) = M1(10,75); M2(58,140) = M1(10,76); M2(58,142) = M1(10,77); M2(58,143) = M1(10,78); M2(58,145) = M1(10,79); M2(58,148) = M1(10,80); M2(58,149) = M1(10,81); M2(58,151) = M1(10,82); M2(58,154) = M1(10,83); 
M2(59,50) = M1(11,11); M2(59,55) = M1(11,15); M2(59,56) = M1(11,16); M2(59,57) = M1(11,17); M2(59,59) = M1(11,18); M2(59,60) = M1(11,19); M2(59,61) = M1(11,20); M2(59,62) = M1(11,21); M2(59,64) = M1(11,22); M2(59,65) = M1(11,23); M2(59,66) = M1(11,24); M2(59,68) = M1(11,25); M2(59,69) = M1(11,26); M2(59,71) = M1(11,27); M2(59,73) = M1(11,28); M2(59,74) = M1(11,29); M2(59,75) = M1(11,30); M2(59,76) = M1(11,31); M2(59,77) = M1(11,32); M2(59,78) = M1(11,33); M2(59,80) = M1(11,34); M2(59,81) = M1(11,35); M2(59,82) = M1(11,36); M2(59,83) = M1(11,37); M2(59,84) = M1(11,38); M2(59,86) = M1(11,39); M2(59,87) = M1(11,40); M2(59,88) = M1(11,41); M2(59,89) = M1(11,42); M2(59,91) = M1(11,43); M2(59,92) = M1(11,44); M2(59,94) = M1(11,45); M2(59,96) = M1(11,46); M2(59,97) = M1(11,47); M2(59,99) = M1(11,48); M2(59,102) = M1(11,49); M2(59,103) = M1(11,50); M2(59,104) = M1(11,51); M2(59,105) = M1(11,52); M2(59,106) = M1(11,53); M2(59,108) = M1(11,54); M2(59,109) = M1(11,55); M2(59,110) = M1(11,56); M2(59,111) = M1(11,57); M2(59,113) = M1(11,58); M2(59,114) = M1(11,59); M2(59,115) = M1(11,60); M2(59,117) = M1(11,61); M2(59,118) = M1(11,62); M2(59,120) = M1(11,63); M2(59,123) = M1(11,64); M2(59,124) = M1(11,65); M2(59,125) = M1(11,66); M2(59,126) = M1(11,67); M2(59,128) = M1(11,68); M2(59,129) = M1(11,69); M2(59,130) = M1(11,70); M2(59,132) = M1(11,71); M2(59,133) = M1(11,72); M2(59,135) = M1(11,73); M2(59,138) = M1(11,74); M2(59,139) = M1(11,75); M2(59,140) = M1(11,76); M2(59,142) = M1(11,77); M2(59,143) = M1(11,78); M2(59,145) = M1(11,79); M2(59,148) = M1(11,80); M2(59,149) = M1(11,81); M2(59,151) = M1(11,82); M2(59,154) = M1(11,83); 
M2(60,51) = M1(12,12); M2(60,55) = M1(12,15); M2(60,56) = M1(12,16); M2(60,57) = M1(12,17); M2(60,59) = M1(12,18); M2(60,60) = M1(12,19); M2(60,61) = M1(12,20); M2(60,62) = M1(12,21); M2(60,64) = M1(12,22); M2(60,65) = M1(12,23); M2(60,66) = M1(12,24); M2(60,68) = M1(12,25); M2(60,69) = M1(12,26); M2(60,71) = M1(12,27); M2(60,73) = M1(12,28); M2(60,74) = M1(12,29); M2(60,75) = M1(12,30); M2(60,76) = M1(12,31); M2(60,77) = M1(12,32); M2(60,78) = M1(12,33); M2(60,80) = M1(12,34); M2(60,81) = M1(12,35); M2(60,82) = M1(12,36); M2(60,83) = M1(12,37); M2(60,84) = M1(12,38); M2(60,86) = M1(12,39); M2(60,87) = M1(12,40); M2(60,88) = M1(12,41); M2(60,89) = M1(12,42); M2(60,91) = M1(12,43); M2(60,92) = M1(12,44); M2(60,94) = M1(12,45); M2(60,96) = M1(12,46); M2(60,97) = M1(12,47); M2(60,99) = M1(12,48); M2(60,102) = M1(12,49); M2(60,103) = M1(12,50); M2(60,104) = M1(12,51); M2(60,105) = M1(12,52); M2(60,106) = M1(12,53); M2(60,108) = M1(12,54); M2(60,109) = M1(12,55); M2(60,110) = M1(12,56); M2(60,111) = M1(12,57); M2(60,113) = M1(12,58); M2(60,114) = M1(12,59); M2(60,115) = M1(12,60); M2(60,117) = M1(12,61); M2(60,118) = M1(12,62); M2(60,120) = M1(12,63); M2(60,123) = M1(12,64); M2(60,124) = M1(12,65); M2(60,125) = M1(12,66); M2(60,126) = M1(12,67); M2(60,128) = M1(12,68); M2(60,129) = M1(12,69); M2(60,130) = M1(12,70); M2(60,132) = M1(12,71); M2(60,133) = M1(12,72); M2(60,135) = M1(12,73); M2(60,138) = M1(12,74); M2(60,139) = M1(12,75); M2(60,140) = M1(12,76); M2(60,142) = M1(12,77); M2(60,143) = M1(12,78); M2(60,145) = M1(12,79); M2(60,148) = M1(12,80); M2(60,149) = M1(12,81); M2(60,151) = M1(12,82); M2(60,154) = M1(12,83); 
M2(61,53) = M1(13,13); M2(61,55) = M1(13,15); M2(61,56) = M1(13,16); M2(61,57) = M1(13,17); M2(61,59) = M1(13,18); M2(61,60) = M1(13,19); M2(61,61) = M1(13,20); M2(61,62) = M1(13,21); M2(61,64) = M1(13,22); M2(61,65) = M1(13,23); M2(61,66) = M1(13,24); M2(61,68) = M1(13,25); M2(61,69) = M1(13,26); M2(61,71) = M1(13,27); M2(61,73) = M1(13,28); M2(61,74) = M1(13,29); M2(61,75) = M1(13,30); M2(61,76) = M1(13,31); M2(61,77) = M1(13,32); M2(61,78) = M1(13,33); M2(61,80) = M1(13,34); M2(61,81) = M1(13,35); M2(61,82) = M1(13,36); M2(61,83) = M1(13,37); M2(61,84) = M1(13,38); M2(61,86) = M1(13,39); M2(61,87) = M1(13,40); M2(61,88) = M1(13,41); M2(61,89) = M1(13,42); M2(61,91) = M1(13,43); M2(61,92) = M1(13,44); M2(61,94) = M1(13,45); M2(61,96) = M1(13,46); M2(61,97) = M1(13,47); M2(61,99) = M1(13,48); M2(61,102) = M1(13,49); M2(61,103) = M1(13,50); M2(61,104) = M1(13,51); M2(61,105) = M1(13,52); M2(61,106) = M1(13,53); M2(61,108) = M1(13,54); M2(61,109) = M1(13,55); M2(61,110) = M1(13,56); M2(61,111) = M1(13,57); M2(61,113) = M1(13,58); M2(61,114) = M1(13,59); M2(61,115) = M1(13,60); M2(61,117) = M1(13,61); M2(61,118) = M1(13,62); M2(61,120) = M1(13,63); M2(61,123) = M1(13,64); M2(61,124) = M1(13,65); M2(61,125) = M1(13,66); M2(61,126) = M1(13,67); M2(61,128) = M1(13,68); M2(61,129) = M1(13,69); M2(61,130) = M1(13,70); M2(61,132) = M1(13,71); M2(61,133) = M1(13,72); M2(61,135) = M1(13,73); M2(61,138) = M1(13,74); M2(61,139) = M1(13,75); M2(61,140) = M1(13,76); M2(61,142) = M1(13,77); M2(61,143) = M1(13,78); M2(61,145) = M1(13,79); M2(61,148) = M1(13,80); M2(61,149) = M1(13,81); M2(61,151) = M1(13,82); M2(61,154) = M1(13,83); 
M2(62,54) = M1(14,14); M2(62,55) = M1(14,15); M2(62,56) = M1(14,16); M2(62,57) = M1(14,17); M2(62,59) = M1(14,18); M2(62,60) = M1(14,19); M2(62,61) = M1(14,20); M2(62,62) = M1(14,21); M2(62,64) = M1(14,22); M2(62,65) = M1(14,23); M2(62,66) = M1(14,24); M2(62,68) = M1(14,25); M2(62,69) = M1(14,26); M2(62,71) = M1(14,27); M2(62,73) = M1(14,28); M2(62,74) = M1(14,29); M2(62,75) = M1(14,30); M2(62,76) = M1(14,31); M2(62,77) = M1(14,32); M2(62,78) = M1(14,33); M2(62,80) = M1(14,34); M2(62,81) = M1(14,35); M2(62,82) = M1(14,36); M2(62,83) = M1(14,37); M2(62,84) = M1(14,38); M2(62,86) = M1(14,39); M2(62,87) = M1(14,40); M2(62,88) = M1(14,41); M2(62,89) = M1(14,42); M2(62,91) = M1(14,43); M2(62,92) = M1(14,44); M2(62,94) = M1(14,45); M2(62,96) = M1(14,46); M2(62,97) = M1(14,47); M2(62,99) = M1(14,48); M2(62,102) = M1(14,49); M2(62,103) = M1(14,50); M2(62,104) = M1(14,51); M2(62,105) = M1(14,52); M2(62,106) = M1(14,53); M2(62,108) = M1(14,54); M2(62,109) = M1(14,55); M2(62,110) = M1(14,56); M2(62,111) = M1(14,57); M2(62,113) = M1(14,58); M2(62,114) = M1(14,59); M2(62,115) = M1(14,60); M2(62,117) = M1(14,61); M2(62,118) = M1(14,62); M2(62,120) = M1(14,63); M2(62,123) = M1(14,64); M2(62,124) = M1(14,65); M2(62,125) = M1(14,66); M2(62,126) = M1(14,67); M2(62,128) = M1(14,68); M2(62,129) = M1(14,69); M2(62,130) = M1(14,70); M2(62,132) = M1(14,71); M2(62,133) = M1(14,72); M2(62,135) = M1(14,73); M2(62,138) = M1(14,74); M2(62,139) = M1(14,75); M2(62,140) = M1(14,76); M2(62,142) = M1(14,77); M2(62,143) = M1(14,78); M2(62,145) = M1(14,79); M2(62,148) = M1(14,80); M2(62,149) = M1(14,81); M2(62,151) = M1(14,82); M2(62,154) = M1(14,83); 
M2(63,37) = M1(0,0); M2(63,54) = M1(0,15); M2(63,55) = M1(0,16); M2(63,56) = M1(0,17); M2(63,58) = M1(0,18); M2(63,59) = M1(0,19); M2(63,60) = M1(0,20); M2(63,61) = M1(0,21); M2(63,63) = M1(0,22); M2(63,64) = M1(0,23); M2(63,65) = M1(0,24); M2(63,67) = M1(0,25); M2(63,68) = M1(0,26); M2(63,70) = M1(0,27); M2(63,72) = M1(0,28); M2(63,73) = M1(0,29); M2(63,74) = M1(0,30); M2(63,75) = M1(0,31); M2(63,76) = M1(0,32); M2(63,77) = M1(0,33); M2(63,79) = M1(0,34); M2(63,80) = M1(0,35); M2(63,81) = M1(0,36); M2(63,82) = M1(0,37); M2(63,83) = M1(0,38); M2(63,85) = M1(0,39); M2(63,86) = M1(0,40); M2(63,87) = M1(0,41); M2(63,88) = M1(0,42); M2(63,90) = M1(0,43); M2(63,91) = M1(0,44); M2(63,92) = M1(0,45); M2(63,95) = M1(0,46); M2(63,96) = M1(0,47); M2(63,98) = M1(0,48); M2(63,101) = M1(0,49); M2(63,102) = M1(0,50); M2(63,103) = M1(0,51); M2(63,104) = M1(0,52); M2(63,105) = M1(0,53); M2(63,107) = M1(0,54); M2(63,108) = M1(0,55); M2(63,109) = M1(0,56); M2(63,110) = M1(0,57); M2(63,112) = M1(0,58); M2(63,113) = M1(0,59); M2(63,114) = M1(0,60); M2(63,116) = M1(0,61); M2(63,117) = M1(0,62); M2(63,119) = M1(0,63); M2(63,122) = M1(0,64); M2(63,123) = M1(0,65); M2(63,124) = M1(0,66); M2(63,125) = M1(0,67); M2(63,127) = M1(0,68); M2(63,128) = M1(0,69); M2(63,129) = M1(0,70); M2(63,131) = M1(0,71); M2(63,132) = M1(0,72); M2(63,134) = M1(0,73); M2(63,137) = M1(0,74); M2(63,138) = M1(0,75); M2(63,139) = M1(0,76); M2(63,141) = M1(0,77); M2(63,142) = M1(0,78); M2(63,144) = M1(0,79); M2(63,147) = M1(0,80); M2(63,148) = M1(0,81); M2(63,150) = M1(0,82); M2(63,153) = M1(0,83); 
M2(64,38) = M1(1,1); M2(64,54) = M1(1,15); M2(64,55) = M1(1,16); M2(64,56) = M1(1,17); M2(64,58) = M1(1,18); M2(64,59) = M1(1,19); M2(64,60) = M1(1,20); M2(64,61) = M1(1,21); M2(64,63) = M1(1,22); M2(64,64) = M1(1,23); M2(64,65) = M1(1,24); M2(64,67) = M1(1,25); M2(64,68) = M1(1,26); M2(64,70) = M1(1,27); M2(64,72) = M1(1,28); M2(64,73) = M1(1,29); M2(64,74) = M1(1,30); M2(64,75) = M1(1,31); M2(64,76) = M1(1,32); M2(64,77) = M1(1,33); M2(64,79) = M1(1,34); M2(64,80) = M1(1,35); M2(64,81) = M1(1,36); M2(64,82) = M1(1,37); M2(64,83) = M1(1,38); M2(64,85) = M1(1,39); M2(64,86) = M1(1,40); M2(64,87) = M1(1,41); M2(64,88) = M1(1,42); M2(64,90) = M1(1,43); M2(64,91) = M1(1,44); M2(64,92) = M1(1,45); M2(64,95) = M1(1,46); M2(64,96) = M1(1,47); M2(64,98) = M1(1,48); M2(64,101) = M1(1,49); M2(64,102) = M1(1,50); M2(64,103) = M1(1,51); M2(64,104) = M1(1,52); M2(64,105) = M1(1,53); M2(64,107) = M1(1,54); M2(64,108) = M1(1,55); M2(64,109) = M1(1,56); M2(64,110) = M1(1,57); M2(64,112) = M1(1,58); M2(64,113) = M1(1,59); M2(64,114) = M1(1,60); M2(64,116) = M1(1,61); M2(64,117) = M1(1,62); M2(64,119) = M1(1,63); M2(64,122) = M1(1,64); M2(64,123) = M1(1,65); M2(64,124) = M1(1,66); M2(64,125) = M1(1,67); M2(64,127) = M1(1,68); M2(64,128) = M1(1,69); M2(64,129) = M1(1,70); M2(64,131) = M1(1,71); M2(64,132) = M1(1,72); M2(64,134) = M1(1,73); M2(64,137) = M1(1,74); M2(64,138) = M1(1,75); M2(64,139) = M1(1,76); M2(64,141) = M1(1,77); M2(64,142) = M1(1,78); M2(64,144) = M1(1,79); M2(64,147) = M1(1,80); M2(64,148) = M1(1,81); M2(64,150) = M1(1,82); M2(64,153) = M1(1,83); 
M2(65,39) = M1(2,2); M2(65,54) = M1(2,15); M2(65,55) = M1(2,16); M2(65,56) = M1(2,17); M2(65,58) = M1(2,18); M2(65,59) = M1(2,19); M2(65,60) = M1(2,20); M2(65,61) = M1(2,21); M2(65,63) = M1(2,22); M2(65,64) = M1(2,23); M2(65,65) = M1(2,24); M2(65,67) = M1(2,25); M2(65,68) = M1(2,26); M2(65,70) = M1(2,27); M2(65,72) = M1(2,28); M2(65,73) = M1(2,29); M2(65,74) = M1(2,30); M2(65,75) = M1(2,31); M2(65,76) = M1(2,32); M2(65,77) = M1(2,33); M2(65,79) = M1(2,34); M2(65,80) = M1(2,35); M2(65,81) = M1(2,36); M2(65,82) = M1(2,37); M2(65,83) = M1(2,38); M2(65,85) = M1(2,39); M2(65,86) = M1(2,40); M2(65,87) = M1(2,41); M2(65,88) = M1(2,42); M2(65,90) = M1(2,43); M2(65,91) = M1(2,44); M2(65,92) = M1(2,45); M2(65,95) = M1(2,46); M2(65,96) = M1(2,47); M2(65,98) = M1(2,48); M2(65,101) = M1(2,49); M2(65,102) = M1(2,50); M2(65,103) = M1(2,51); M2(65,104) = M1(2,52); M2(65,105) = M1(2,53); M2(65,107) = M1(2,54); M2(65,108) = M1(2,55); M2(65,109) = M1(2,56); M2(65,110) = M1(2,57); M2(65,112) = M1(2,58); M2(65,113) = M1(2,59); M2(65,114) = M1(2,60); M2(65,116) = M1(2,61); M2(65,117) = M1(2,62); M2(65,119) = M1(2,63); M2(65,122) = M1(2,64); M2(65,123) = M1(2,65); M2(65,124) = M1(2,66); M2(65,125) = M1(2,67); M2(65,127) = M1(2,68); M2(65,128) = M1(2,69); M2(65,129) = M1(2,70); M2(65,131) = M1(2,71); M2(65,132) = M1(2,72); M2(65,134) = M1(2,73); M2(65,137) = M1(2,74); M2(65,138) = M1(2,75); M2(65,139) = M1(2,76); M2(65,141) = M1(2,77); M2(65,142) = M1(2,78); M2(65,144) = M1(2,79); M2(65,147) = M1(2,80); M2(65,148) = M1(2,81); M2(65,150) = M1(2,82); M2(65,153) = M1(2,83); 
M2(66,40) = M1(3,3); M2(66,54) = M1(3,15); M2(66,55) = M1(3,16); M2(66,56) = M1(3,17); M2(66,58) = M1(3,18); M2(66,59) = M1(3,19); M2(66,60) = M1(3,20); M2(66,61) = M1(3,21); M2(66,63) = M1(3,22); M2(66,64) = M1(3,23); M2(66,65) = M1(3,24); M2(66,67) = M1(3,25); M2(66,68) = M1(3,26); M2(66,70) = M1(3,27); M2(66,72) = M1(3,28); M2(66,73) = M1(3,29); M2(66,74) = M1(3,30); M2(66,75) = M1(3,31); M2(66,76) = M1(3,32); M2(66,77) = M1(3,33); M2(66,79) = M1(3,34); M2(66,80) = M1(3,35); M2(66,81) = M1(3,36); M2(66,82) = M1(3,37); M2(66,83) = M1(3,38); M2(66,85) = M1(3,39); M2(66,86) = M1(3,40); M2(66,87) = M1(3,41); M2(66,88) = M1(3,42); M2(66,90) = M1(3,43); M2(66,91) = M1(3,44); M2(66,92) = M1(3,45); M2(66,95) = M1(3,46); M2(66,96) = M1(3,47); M2(66,98) = M1(3,48); M2(66,101) = M1(3,49); M2(66,102) = M1(3,50); M2(66,103) = M1(3,51); M2(66,104) = M1(3,52); M2(66,105) = M1(3,53); M2(66,107) = M1(3,54); M2(66,108) = M1(3,55); M2(66,109) = M1(3,56); M2(66,110) = M1(3,57); M2(66,112) = M1(3,58); M2(66,113) = M1(3,59); M2(66,114) = M1(3,60); M2(66,116) = M1(3,61); M2(66,117) = M1(3,62); M2(66,119) = M1(3,63); M2(66,122) = M1(3,64); M2(66,123) = M1(3,65); M2(66,124) = M1(3,66); M2(66,125) = M1(3,67); M2(66,127) = M1(3,68); M2(66,128) = M1(3,69); M2(66,129) = M1(3,70); M2(66,131) = M1(3,71); M2(66,132) = M1(3,72); M2(66,134) = M1(3,73); M2(66,137) = M1(3,74); M2(66,138) = M1(3,75); M2(66,139) = M1(3,76); M2(66,141) = M1(3,77); M2(66,142) = M1(3,78); M2(66,144) = M1(3,79); M2(66,147) = M1(3,80); M2(66,148) = M1(3,81); M2(66,150) = M1(3,82); M2(66,153) = M1(3,83); 
M2(67,41) = M1(4,4); M2(67,54) = M1(4,15); M2(67,55) = M1(4,16); M2(67,56) = M1(4,17); M2(67,58) = M1(4,18); M2(67,59) = M1(4,19); M2(67,60) = M1(4,20); M2(67,61) = M1(4,21); M2(67,63) = M1(4,22); M2(67,64) = M1(4,23); M2(67,65) = M1(4,24); M2(67,67) = M1(4,25); M2(67,68) = M1(4,26); M2(67,70) = M1(4,27); M2(67,72) = M1(4,28); M2(67,73) = M1(4,29); M2(67,74) = M1(4,30); M2(67,75) = M1(4,31); M2(67,76) = M1(4,32); M2(67,77) = M1(4,33); M2(67,79) = M1(4,34); M2(67,80) = M1(4,35); M2(67,81) = M1(4,36); M2(67,82) = M1(4,37); M2(67,83) = M1(4,38); M2(67,85) = M1(4,39); M2(67,86) = M1(4,40); M2(67,87) = M1(4,41); M2(67,88) = M1(4,42); M2(67,90) = M1(4,43); M2(67,91) = M1(4,44); M2(67,92) = M1(4,45); M2(67,95) = M1(4,46); M2(67,96) = M1(4,47); M2(67,98) = M1(4,48); M2(67,101) = M1(4,49); M2(67,102) = M1(4,50); M2(67,103) = M1(4,51); M2(67,104) = M1(4,52); M2(67,105) = M1(4,53); M2(67,107) = M1(4,54); M2(67,108) = M1(4,55); M2(67,109) = M1(4,56); M2(67,110) = M1(4,57); M2(67,112) = M1(4,58); M2(67,113) = M1(4,59); M2(67,114) = M1(4,60); M2(67,116) = M1(4,61); M2(67,117) = M1(4,62); M2(67,119) = M1(4,63); M2(67,122) = M1(4,64); M2(67,123) = M1(4,65); M2(67,124) = M1(4,66); M2(67,125) = M1(4,67); M2(67,127) = M1(4,68); M2(67,128) = M1(4,69); M2(67,129) = M1(4,70); M2(67,131) = M1(4,71); M2(67,132) = M1(4,72); M2(67,134) = M1(4,73); M2(67,137) = M1(4,74); M2(67,138) = M1(4,75); M2(67,139) = M1(4,76); M2(67,141) = M1(4,77); M2(67,142) = M1(4,78); M2(67,144) = M1(4,79); M2(67,147) = M1(4,80); M2(67,148) = M1(4,81); M2(67,150) = M1(4,82); M2(67,153) = M1(4,83); 
M2(68,42) = M1(5,5); M2(68,54) = M1(5,15); M2(68,55) = M1(5,16); M2(68,56) = M1(5,17); M2(68,58) = M1(5,18); M2(68,59) = M1(5,19); M2(68,60) = M1(5,20); M2(68,61) = M1(5,21); M2(68,63) = M1(5,22); M2(68,64) = M1(5,23); M2(68,65) = M1(5,24); M2(68,67) = M1(5,25); M2(68,68) = M1(5,26); M2(68,70) = M1(5,27); M2(68,72) = M1(5,28); M2(68,73) = M1(5,29); M2(68,74) = M1(5,30); M2(68,75) = M1(5,31); M2(68,76) = M1(5,32); M2(68,77) = M1(5,33); M2(68,79) = M1(5,34); M2(68,80) = M1(5,35); M2(68,81) = M1(5,36); M2(68,82) = M1(5,37); M2(68,83) = M1(5,38); M2(68,85) = M1(5,39); M2(68,86) = M1(5,40); M2(68,87) = M1(5,41); M2(68,88) = M1(5,42); M2(68,90) = M1(5,43); M2(68,91) = M1(5,44); M2(68,92) = M1(5,45); M2(68,95) = M1(5,46); M2(68,96) = M1(5,47); M2(68,98) = M1(5,48); M2(68,101) = M1(5,49); M2(68,102) = M1(5,50); M2(68,103) = M1(5,51); M2(68,104) = M1(5,52); M2(68,105) = M1(5,53); M2(68,107) = M1(5,54); M2(68,108) = M1(5,55); M2(68,109) = M1(5,56); M2(68,110) = M1(5,57); M2(68,112) = M1(5,58); M2(68,113) = M1(5,59); M2(68,114) = M1(5,60); M2(68,116) = M1(5,61); M2(68,117) = M1(5,62); M2(68,119) = M1(5,63); M2(68,122) = M1(5,64); M2(68,123) = M1(5,65); M2(68,124) = M1(5,66); M2(68,125) = M1(5,67); M2(68,127) = M1(5,68); M2(68,128) = M1(5,69); M2(68,129) = M1(5,70); M2(68,131) = M1(5,71); M2(68,132) = M1(5,72); M2(68,134) = M1(5,73); M2(68,137) = M1(5,74); M2(68,138) = M1(5,75); M2(68,139) = M1(5,76); M2(68,141) = M1(5,77); M2(68,142) = M1(5,78); M2(68,144) = M1(5,79); M2(68,147) = M1(5,80); M2(68,148) = M1(5,81); M2(68,150) = M1(5,82); M2(68,153) = M1(5,83); 
M2(69,43) = M1(6,6); M2(69,54) = M1(6,15); M2(69,55) = M1(6,16); M2(69,56) = M1(6,17); M2(69,58) = M1(6,18); M2(69,59) = M1(6,19); M2(69,60) = M1(6,20); M2(69,61) = M1(6,21); M2(69,63) = M1(6,22); M2(69,64) = M1(6,23); M2(69,65) = M1(6,24); M2(69,67) = M1(6,25); M2(69,68) = M1(6,26); M2(69,70) = M1(6,27); M2(69,72) = M1(6,28); M2(69,73) = M1(6,29); M2(69,74) = M1(6,30); M2(69,75) = M1(6,31); M2(69,76) = M1(6,32); M2(69,77) = M1(6,33); M2(69,79) = M1(6,34); M2(69,80) = M1(6,35); M2(69,81) = M1(6,36); M2(69,82) = M1(6,37); M2(69,83) = M1(6,38); M2(69,85) = M1(6,39); M2(69,86) = M1(6,40); M2(69,87) = M1(6,41); M2(69,88) = M1(6,42); M2(69,90) = M1(6,43); M2(69,91) = M1(6,44); M2(69,92) = M1(6,45); M2(69,95) = M1(6,46); M2(69,96) = M1(6,47); M2(69,98) = M1(6,48); M2(69,101) = M1(6,49); M2(69,102) = M1(6,50); M2(69,103) = M1(6,51); M2(69,104) = M1(6,52); M2(69,105) = M1(6,53); M2(69,107) = M1(6,54); M2(69,108) = M1(6,55); M2(69,109) = M1(6,56); M2(69,110) = M1(6,57); M2(69,112) = M1(6,58); M2(69,113) = M1(6,59); M2(69,114) = M1(6,60); M2(69,116) = M1(6,61); M2(69,117) = M1(6,62); M2(69,119) = M1(6,63); M2(69,122) = M1(6,64); M2(69,123) = M1(6,65); M2(69,124) = M1(6,66); M2(69,125) = M1(6,67); M2(69,127) = M1(6,68); M2(69,128) = M1(6,69); M2(69,129) = M1(6,70); M2(69,131) = M1(6,71); M2(69,132) = M1(6,72); M2(69,134) = M1(6,73); M2(69,137) = M1(6,74); M2(69,138) = M1(6,75); M2(69,139) = M1(6,76); M2(69,141) = M1(6,77); M2(69,142) = M1(6,78); M2(69,144) = M1(6,79); M2(69,147) = M1(6,80); M2(69,148) = M1(6,81); M2(69,150) = M1(6,82); M2(69,153) = M1(6,83); 
M2(70,45) = M1(7,7); M2(70,54) = M1(7,15); M2(70,55) = M1(7,16); M2(70,56) = M1(7,17); M2(70,58) = M1(7,18); M2(70,59) = M1(7,19); M2(70,60) = M1(7,20); M2(70,61) = M1(7,21); M2(70,63) = M1(7,22); M2(70,64) = M1(7,23); M2(70,65) = M1(7,24); M2(70,67) = M1(7,25); M2(70,68) = M1(7,26); M2(70,70) = M1(7,27); M2(70,72) = M1(7,28); M2(70,73) = M1(7,29); M2(70,74) = M1(7,30); M2(70,75) = M1(7,31); M2(70,76) = M1(7,32); M2(70,77) = M1(7,33); M2(70,79) = M1(7,34); M2(70,80) = M1(7,35); M2(70,81) = M1(7,36); M2(70,82) = M1(7,37); M2(70,83) = M1(7,38); M2(70,85) = M1(7,39); M2(70,86) = M1(7,40); M2(70,87) = M1(7,41); M2(70,88) = M1(7,42); M2(70,90) = M1(7,43); M2(70,91) = M1(7,44); M2(70,92) = M1(7,45); M2(70,95) = M1(7,46); M2(70,96) = M1(7,47); M2(70,98) = M1(7,48); M2(70,101) = M1(7,49); M2(70,102) = M1(7,50); M2(70,103) = M1(7,51); M2(70,104) = M1(7,52); M2(70,105) = M1(7,53); M2(70,107) = M1(7,54); M2(70,108) = M1(7,55); M2(70,109) = M1(7,56); M2(70,110) = M1(7,57); M2(70,112) = M1(7,58); M2(70,113) = M1(7,59); M2(70,114) = M1(7,60); M2(70,116) = M1(7,61); M2(70,117) = M1(7,62); M2(70,119) = M1(7,63); M2(70,122) = M1(7,64); M2(70,123) = M1(7,65); M2(70,124) = M1(7,66); M2(70,125) = M1(7,67); M2(70,127) = M1(7,68); M2(70,128) = M1(7,69); M2(70,129) = M1(7,70); M2(70,131) = M1(7,71); M2(70,132) = M1(7,72); M2(70,134) = M1(7,73); M2(70,137) = M1(7,74); M2(70,138) = M1(7,75); M2(70,139) = M1(7,76); M2(70,141) = M1(7,77); M2(70,142) = M1(7,78); M2(70,144) = M1(7,79); M2(70,147) = M1(7,80); M2(70,148) = M1(7,81); M2(70,150) = M1(7,82); M2(70,153) = M1(7,83); 
M2(71,46) = M1(8,8); M2(71,54) = M1(8,15); M2(71,55) = M1(8,16); M2(71,56) = M1(8,17); M2(71,58) = M1(8,18); M2(71,59) = M1(8,19); M2(71,60) = M1(8,20); M2(71,61) = M1(8,21); M2(71,63) = M1(8,22); M2(71,64) = M1(8,23); M2(71,65) = M1(8,24); M2(71,67) = M1(8,25); M2(71,68) = M1(8,26); M2(71,70) = M1(8,27); M2(71,72) = M1(8,28); M2(71,73) = M1(8,29); M2(71,74) = M1(8,30); M2(71,75) = M1(8,31); M2(71,76) = M1(8,32); M2(71,77) = M1(8,33); M2(71,79) = M1(8,34); M2(71,80) = M1(8,35); M2(71,81) = M1(8,36); M2(71,82) = M1(8,37); M2(71,83) = M1(8,38); M2(71,85) = M1(8,39); M2(71,86) = M1(8,40); M2(71,87) = M1(8,41); M2(71,88) = M1(8,42); M2(71,90) = M1(8,43); M2(71,91) = M1(8,44); M2(71,92) = M1(8,45); M2(71,95) = M1(8,46); M2(71,96) = M1(8,47); M2(71,98) = M1(8,48); M2(71,101) = M1(8,49); M2(71,102) = M1(8,50); M2(71,103) = M1(8,51); M2(71,104) = M1(8,52); M2(71,105) = M1(8,53); M2(71,107) = M1(8,54); M2(71,108) = M1(8,55); M2(71,109) = M1(8,56); M2(71,110) = M1(8,57); M2(71,112) = M1(8,58); M2(71,113) = M1(8,59); M2(71,114) = M1(8,60); M2(71,116) = M1(8,61); M2(71,117) = M1(8,62); M2(71,119) = M1(8,63); M2(71,122) = M1(8,64); M2(71,123) = M1(8,65); M2(71,124) = M1(8,66); M2(71,125) = M1(8,67); M2(71,127) = M1(8,68); M2(71,128) = M1(8,69); M2(71,129) = M1(8,70); M2(71,131) = M1(8,71); M2(71,132) = M1(8,72); M2(71,134) = M1(8,73); M2(71,137) = M1(8,74); M2(71,138) = M1(8,75); M2(71,139) = M1(8,76); M2(71,141) = M1(8,77); M2(71,142) = M1(8,78); M2(71,144) = M1(8,79); M2(71,147) = M1(8,80); M2(71,148) = M1(8,81); M2(71,150) = M1(8,82); M2(71,153) = M1(8,83); 
M2(72,47) = M1(9,9); M2(72,54) = M1(9,15); M2(72,55) = M1(9,16); M2(72,56) = M1(9,17); M2(72,58) = M1(9,18); M2(72,59) = M1(9,19); M2(72,60) = M1(9,20); M2(72,61) = M1(9,21); M2(72,63) = M1(9,22); M2(72,64) = M1(9,23); M2(72,65) = M1(9,24); M2(72,67) = M1(9,25); M2(72,68) = M1(9,26); M2(72,70) = M1(9,27); M2(72,72) = M1(9,28); M2(72,73) = M1(9,29); M2(72,74) = M1(9,30); M2(72,75) = M1(9,31); M2(72,76) = M1(9,32); M2(72,77) = M1(9,33); M2(72,79) = M1(9,34); M2(72,80) = M1(9,35); M2(72,81) = M1(9,36); M2(72,82) = M1(9,37); M2(72,83) = M1(9,38); M2(72,85) = M1(9,39); M2(72,86) = M1(9,40); M2(72,87) = M1(9,41); M2(72,88) = M1(9,42); M2(72,90) = M1(9,43); M2(72,91) = M1(9,44); M2(72,92) = M1(9,45); M2(72,95) = M1(9,46); M2(72,96) = M1(9,47); M2(72,98) = M1(9,48); M2(72,101) = M1(9,49); M2(72,102) = M1(9,50); M2(72,103) = M1(9,51); M2(72,104) = M1(9,52); M2(72,105) = M1(9,53); M2(72,107) = M1(9,54); M2(72,108) = M1(9,55); M2(72,109) = M1(9,56); M2(72,110) = M1(9,57); M2(72,112) = M1(9,58); M2(72,113) = M1(9,59); M2(72,114) = M1(9,60); M2(72,116) = M1(9,61); M2(72,117) = M1(9,62); M2(72,119) = M1(9,63); M2(72,122) = M1(9,64); M2(72,123) = M1(9,65); M2(72,124) = M1(9,66); M2(72,125) = M1(9,67); M2(72,127) = M1(9,68); M2(72,128) = M1(9,69); M2(72,129) = M1(9,70); M2(72,131) = M1(9,71); M2(72,132) = M1(9,72); M2(72,134) = M1(9,73); M2(72,137) = M1(9,74); M2(72,138) = M1(9,75); M2(72,139) = M1(9,76); M2(72,141) = M1(9,77); M2(72,142) = M1(9,78); M2(72,144) = M1(9,79); M2(72,147) = M1(9,80); M2(72,148) = M1(9,81); M2(72,150) = M1(9,82); M2(72,153) = M1(9,83); 
M2(73,48) = M1(10,10); M2(73,54) = M1(10,15); M2(73,55) = M1(10,16); M2(73,56) = M1(10,17); M2(73,58) = M1(10,18); M2(73,59) = M1(10,19); M2(73,60) = M1(10,20); M2(73,61) = M1(10,21); M2(73,63) = M1(10,22); M2(73,64) = M1(10,23); M2(73,65) = M1(10,24); M2(73,67) = M1(10,25); M2(73,68) = M1(10,26); M2(73,70) = M1(10,27); M2(73,72) = M1(10,28); M2(73,73) = M1(10,29); M2(73,74) = M1(10,30); M2(73,75) = M1(10,31); M2(73,76) = M1(10,32); M2(73,77) = M1(10,33); M2(73,79) = M1(10,34); M2(73,80) = M1(10,35); M2(73,81) = M1(10,36); M2(73,82) = M1(10,37); M2(73,83) = M1(10,38); M2(73,85) = M1(10,39); M2(73,86) = M1(10,40); M2(73,87) = M1(10,41); M2(73,88) = M1(10,42); M2(73,90) = M1(10,43); M2(73,91) = M1(10,44); M2(73,92) = M1(10,45); M2(73,95) = M1(10,46); M2(73,96) = M1(10,47); M2(73,98) = M1(10,48); M2(73,101) = M1(10,49); M2(73,102) = M1(10,50); M2(73,103) = M1(10,51); M2(73,104) = M1(10,52); M2(73,105) = M1(10,53); M2(73,107) = M1(10,54); M2(73,108) = M1(10,55); M2(73,109) = M1(10,56); M2(73,110) = M1(10,57); M2(73,112) = M1(10,58); M2(73,113) = M1(10,59); M2(73,114) = M1(10,60); M2(73,116) = M1(10,61); M2(73,117) = M1(10,62); M2(73,119) = M1(10,63); M2(73,122) = M1(10,64); M2(73,123) = M1(10,65); M2(73,124) = M1(10,66); M2(73,125) = M1(10,67); M2(73,127) = M1(10,68); M2(73,128) = M1(10,69); M2(73,129) = M1(10,70); M2(73,131) = M1(10,71); M2(73,132) = M1(10,72); M2(73,134) = M1(10,73); M2(73,137) = M1(10,74); M2(73,138) = M1(10,75); M2(73,139) = M1(10,76); M2(73,141) = M1(10,77); M2(73,142) = M1(10,78); M2(73,144) = M1(10,79); M2(73,147) = M1(10,80); M2(73,148) = M1(10,81); M2(73,150) = M1(10,82); M2(73,153) = M1(10,83); 
M2(74,49) = M1(11,11); M2(74,54) = M1(11,15); M2(74,55) = M1(11,16); M2(74,56) = M1(11,17); M2(74,58) = M1(11,18); M2(74,59) = M1(11,19); M2(74,60) = M1(11,20); M2(74,61) = M1(11,21); M2(74,63) = M1(11,22); M2(74,64) = M1(11,23); M2(74,65) = M1(11,24); M2(74,67) = M1(11,25); M2(74,68) = M1(11,26); M2(74,70) = M1(11,27); M2(74,72) = M1(11,28); M2(74,73) = M1(11,29); M2(74,74) = M1(11,30); M2(74,75) = M1(11,31); M2(74,76) = M1(11,32); M2(74,77) = M1(11,33); M2(74,79) = M1(11,34); M2(74,80) = M1(11,35); M2(74,81) = M1(11,36); M2(74,82) = M1(11,37); M2(74,83) = M1(11,38); M2(74,85) = M1(11,39); M2(74,86) = M1(11,40); M2(74,87) = M1(11,41); M2(74,88) = M1(11,42); M2(74,90) = M1(11,43); M2(74,91) = M1(11,44); M2(74,92) = M1(11,45); M2(74,95) = M1(11,46); M2(74,96) = M1(11,47); M2(74,98) = M1(11,48); M2(74,101) = M1(11,49); M2(74,102) = M1(11,50); M2(74,103) = M1(11,51); M2(74,104) = M1(11,52); M2(74,105) = M1(11,53); M2(74,107) = M1(11,54); M2(74,108) = M1(11,55); M2(74,109) = M1(11,56); M2(74,110) = M1(11,57); M2(74,112) = M1(11,58); M2(74,113) = M1(11,59); M2(74,114) = M1(11,60); M2(74,116) = M1(11,61); M2(74,117) = M1(11,62); M2(74,119) = M1(11,63); M2(74,122) = M1(11,64); M2(74,123) = M1(11,65); M2(74,124) = M1(11,66); M2(74,125) = M1(11,67); M2(74,127) = M1(11,68); M2(74,128) = M1(11,69); M2(74,129) = M1(11,70); M2(74,131) = M1(11,71); M2(74,132) = M1(11,72); M2(74,134) = M1(11,73); M2(74,137) = M1(11,74); M2(74,138) = M1(11,75); M2(74,139) = M1(11,76); M2(74,141) = M1(11,77); M2(74,142) = M1(11,78); M2(74,144) = M1(11,79); M2(74,147) = M1(11,80); M2(74,148) = M1(11,81); M2(74,150) = M1(11,82); M2(74,153) = M1(11,83); 
M2(75,50) = M1(12,12); M2(75,54) = M1(12,15); M2(75,55) = M1(12,16); M2(75,56) = M1(12,17); M2(75,58) = M1(12,18); M2(75,59) = M1(12,19); M2(75,60) = M1(12,20); M2(75,61) = M1(12,21); M2(75,63) = M1(12,22); M2(75,64) = M1(12,23); M2(75,65) = M1(12,24); M2(75,67) = M1(12,25); M2(75,68) = M1(12,26); M2(75,70) = M1(12,27); M2(75,72) = M1(12,28); M2(75,73) = M1(12,29); M2(75,74) = M1(12,30); M2(75,75) = M1(12,31); M2(75,76) = M1(12,32); M2(75,77) = M1(12,33); M2(75,79) = M1(12,34); M2(75,80) = M1(12,35); M2(75,81) = M1(12,36); M2(75,82) = M1(12,37); M2(75,83) = M1(12,38); M2(75,85) = M1(12,39); M2(75,86) = M1(12,40); M2(75,87) = M1(12,41); M2(75,88) = M1(12,42); M2(75,90) = M1(12,43); M2(75,91) = M1(12,44); M2(75,92) = M1(12,45); M2(75,95) = M1(12,46); M2(75,96) = M1(12,47); M2(75,98) = M1(12,48); M2(75,101) = M1(12,49); M2(75,102) = M1(12,50); M2(75,103) = M1(12,51); M2(75,104) = M1(12,52); M2(75,105) = M1(12,53); M2(75,107) = M1(12,54); M2(75,108) = M1(12,55); M2(75,109) = M1(12,56); M2(75,110) = M1(12,57); M2(75,112) = M1(12,58); M2(75,113) = M1(12,59); M2(75,114) = M1(12,60); M2(75,116) = M1(12,61); M2(75,117) = M1(12,62); M2(75,119) = M1(12,63); M2(75,122) = M1(12,64); M2(75,123) = M1(12,65); M2(75,124) = M1(12,66); M2(75,125) = M1(12,67); M2(75,127) = M1(12,68); M2(75,128) = M1(12,69); M2(75,129) = M1(12,70); M2(75,131) = M1(12,71); M2(75,132) = M1(12,72); M2(75,134) = M1(12,73); M2(75,137) = M1(12,74); M2(75,138) = M1(12,75); M2(75,139) = M1(12,76); M2(75,141) = M1(12,77); M2(75,142) = M1(12,78); M2(75,144) = M1(12,79); M2(75,147) = M1(12,80); M2(75,148) = M1(12,81); M2(75,150) = M1(12,82); M2(75,153) = M1(12,83); 
M2(76,52) = M1(13,13); M2(76,54) = M1(13,15); M2(76,55) = M1(13,16); M2(76,56) = M1(13,17); M2(76,58) = M1(13,18); M2(76,59) = M1(13,19); M2(76,60) = M1(13,20); M2(76,61) = M1(13,21); M2(76,63) = M1(13,22); M2(76,64) = M1(13,23); M2(76,65) = M1(13,24); M2(76,67) = M1(13,25); M2(76,68) = M1(13,26); M2(76,70) = M1(13,27); M2(76,72) = M1(13,28); M2(76,73) = M1(13,29); M2(76,74) = M1(13,30); M2(76,75) = M1(13,31); M2(76,76) = M1(13,32); M2(76,77) = M1(13,33); M2(76,79) = M1(13,34); M2(76,80) = M1(13,35); M2(76,81) = M1(13,36); M2(76,82) = M1(13,37); M2(76,83) = M1(13,38); M2(76,85) = M1(13,39); M2(76,86) = M1(13,40); M2(76,87) = M1(13,41); M2(76,88) = M1(13,42); M2(76,90) = M1(13,43); M2(76,91) = M1(13,44); M2(76,92) = M1(13,45); M2(76,95) = M1(13,46); M2(76,96) = M1(13,47); M2(76,98) = M1(13,48); M2(76,101) = M1(13,49); M2(76,102) = M1(13,50); M2(76,103) = M1(13,51); M2(76,104) = M1(13,52); M2(76,105) = M1(13,53); M2(76,107) = M1(13,54); M2(76,108) = M1(13,55); M2(76,109) = M1(13,56); M2(76,110) = M1(13,57); M2(76,112) = M1(13,58); M2(76,113) = M1(13,59); M2(76,114) = M1(13,60); M2(76,116) = M1(13,61); M2(76,117) = M1(13,62); M2(76,119) = M1(13,63); M2(76,122) = M1(13,64); M2(76,123) = M1(13,65); M2(76,124) = M1(13,66); M2(76,125) = M1(13,67); M2(76,127) = M1(13,68); M2(76,128) = M1(13,69); M2(76,129) = M1(13,70); M2(76,131) = M1(13,71); M2(76,132) = M1(13,72); M2(76,134) = M1(13,73); M2(76,137) = M1(13,74); M2(76,138) = M1(13,75); M2(76,139) = M1(13,76); M2(76,141) = M1(13,77); M2(76,142) = M1(13,78); M2(76,144) = M1(13,79); M2(76,147) = M1(13,80); M2(76,148) = M1(13,81); M2(76,150) = M1(13,82); M2(76,153) = M1(13,83); 
M2(77,53) = M1(14,14); M2(77,54) = M1(14,15); M2(77,55) = M1(14,16); M2(77,56) = M1(14,17); M2(77,58) = M1(14,18); M2(77,59) = M1(14,19); M2(77,60) = M1(14,20); M2(77,61) = M1(14,21); M2(77,63) = M1(14,22); M2(77,64) = M1(14,23); M2(77,65) = M1(14,24); M2(77,67) = M1(14,25); M2(77,68) = M1(14,26); M2(77,70) = M1(14,27); M2(77,72) = M1(14,28); M2(77,73) = M1(14,29); M2(77,74) = M1(14,30); M2(77,75) = M1(14,31); M2(77,76) = M1(14,32); M2(77,77) = M1(14,33); M2(77,79) = M1(14,34); M2(77,80) = M1(14,35); M2(77,81) = M1(14,36); M2(77,82) = M1(14,37); M2(77,83) = M1(14,38); M2(77,85) = M1(14,39); M2(77,86) = M1(14,40); M2(77,87) = M1(14,41); M2(77,88) = M1(14,42); M2(77,90) = M1(14,43); M2(77,91) = M1(14,44); M2(77,92) = M1(14,45); M2(77,95) = M1(14,46); M2(77,96) = M1(14,47); M2(77,98) = M1(14,48); M2(77,101) = M1(14,49); M2(77,102) = M1(14,50); M2(77,103) = M1(14,51); M2(77,104) = M1(14,52); M2(77,105) = M1(14,53); M2(77,107) = M1(14,54); M2(77,108) = M1(14,55); M2(77,109) = M1(14,56); M2(77,110) = M1(14,57); M2(77,112) = M1(14,58); M2(77,113) = M1(14,59); M2(77,114) = M1(14,60); M2(77,116) = M1(14,61); M2(77,117) = M1(14,62); M2(77,119) = M1(14,63); M2(77,122) = M1(14,64); M2(77,123) = M1(14,65); M2(77,124) = M1(14,66); M2(77,125) = M1(14,67); M2(77,127) = M1(14,68); M2(77,128) = M1(14,69); M2(77,129) = M1(14,70); M2(77,131) = M1(14,71); M2(77,132) = M1(14,72); M2(77,134) = M1(14,73); M2(77,137) = M1(14,74); M2(77,138) = M1(14,75); M2(77,139) = M1(14,76); M2(77,141) = M1(14,77); M2(77,142) = M1(14,78); M2(77,144) = M1(14,79); M2(77,147) = M1(14,80); M2(77,148) = M1(14,81); M2(77,150) = M1(14,82); M2(77,153) = M1(14,83); 
M2(78,72) = M1(0,0); M2(78,87) = M1(0,15); M2(78,88) = M1(0,16); M2(78,89) = M1(0,17); M2(78,90) = M1(0,18); M2(78,91) = M1(0,19); M2(78,92) = M1(0,20); M2(78,94) = M1(0,21); M2(78,95) = M1(0,22); M2(78,96) = M1(0,23); M2(78,97) = M1(0,24); M2(78,98) = M1(0,25); M2(78,99) = M1(0,26); M2(78,100) = M1(0,27); M2(78,101) = M1(0,28); M2(78,102) = M1(0,29); M2(78,103) = M1(0,30); M2(78,104) = M1(0,31); M2(78,105) = M1(0,32); M2(78,106) = M1(0,33); M2(78,107) = M1(0,34); M2(78,108) = M1(0,35); M2(78,109) = M1(0,36); M2(78,110) = M1(0,37); M2(78,111) = M1(0,38); M2(78,112) = M1(0,39); M2(78,113) = M1(0,40); M2(78,114) = M1(0,41); M2(78,115) = M1(0,42); M2(78,116) = M1(0,43); M2(78,117) = M1(0,44); M2(78,118) = M1(0,45); M2(78,119) = M1(0,46); M2(78,120) = M1(0,47); M2(78,121) = M1(0,48); M2(78,122) = M1(0,49); M2(78,123) = M1(0,50); M2(78,124) = M1(0,51); M2(78,125) = M1(0,52); M2(78,126) = M1(0,53); M2(78,127) = M1(0,54); M2(78,128) = M1(0,55); M2(78,129) = M1(0,56); M2(78,130) = M1(0,57); M2(78,131) = M1(0,58); M2(78,132) = M1(0,59); M2(78,133) = M1(0,60); M2(78,134) = M1(0,61); M2(78,135) = M1(0,62); M2(78,136) = M1(0,63); M2(78,137) = M1(0,64); M2(78,138) = M1(0,65); M2(78,139) = M1(0,66); M2(78,140) = M1(0,67); M2(78,141) = M1(0,68); M2(78,142) = M1(0,69); M2(78,143) = M1(0,70); M2(78,144) = M1(0,71); M2(78,145) = M1(0,72); M2(78,146) = M1(0,73); M2(78,147) = M1(0,74); M2(78,148) = M1(0,75); M2(78,149) = M1(0,76); M2(78,150) = M1(0,77); M2(78,151) = M1(0,78); M2(78,152) = M1(0,79); M2(78,153) = M1(0,80); M2(78,154) = M1(0,81); M2(78,155) = M1(0,82); M2(78,156) = M1(0,83); 
M2(79,73) = M1(1,1); M2(79,87) = M1(1,15); M2(79,88) = M1(1,16); M2(79,89) = M1(1,17); M2(79,90) = M1(1,18); M2(79,91) = M1(1,19); M2(79,92) = M1(1,20); M2(79,94) = M1(1,21); M2(79,95) = M1(1,22); M2(79,96) = M1(1,23); M2(79,97) = M1(1,24); M2(79,98) = M1(1,25); M2(79,99) = M1(1,26); M2(79,100) = M1(1,27); M2(79,101) = M1(1,28); M2(79,102) = M1(1,29); M2(79,103) = M1(1,30); M2(79,104) = M1(1,31); M2(79,105) = M1(1,32); M2(79,106) = M1(1,33); M2(79,107) = M1(1,34); M2(79,108) = M1(1,35); M2(79,109) = M1(1,36); M2(79,110) = M1(1,37); M2(79,111) = M1(1,38); M2(79,112) = M1(1,39); M2(79,113) = M1(1,40); M2(79,114) = M1(1,41); M2(79,115) = M1(1,42); M2(79,116) = M1(1,43); M2(79,117) = M1(1,44); M2(79,118) = M1(1,45); M2(79,119) = M1(1,46); M2(79,120) = M1(1,47); M2(79,121) = M1(1,48); M2(79,122) = M1(1,49); M2(79,123) = M1(1,50); M2(79,124) = M1(1,51); M2(79,125) = M1(1,52); M2(79,126) = M1(1,53); M2(79,127) = M1(1,54); M2(79,128) = M1(1,55); M2(79,129) = M1(1,56); M2(79,130) = M1(1,57); M2(79,131) = M1(1,58); M2(79,132) = M1(1,59); M2(79,133) = M1(1,60); M2(79,134) = M1(1,61); M2(79,135) = M1(1,62); M2(79,136) = M1(1,63); M2(79,137) = M1(1,64); M2(79,138) = M1(1,65); M2(79,139) = M1(1,66); M2(79,140) = M1(1,67); M2(79,141) = M1(1,68); M2(79,142) = M1(1,69); M2(79,143) = M1(1,70); M2(79,144) = M1(1,71); M2(79,145) = M1(1,72); M2(79,146) = M1(1,73); M2(79,147) = M1(1,74); M2(79,148) = M1(1,75); M2(79,149) = M1(1,76); M2(79,150) = M1(1,77); M2(79,151) = M1(1,78); M2(79,152) = M1(1,79); M2(79,153) = M1(1,80); M2(79,154) = M1(1,81); M2(79,155) = M1(1,82); M2(79,156) = M1(1,83); 
M2(80,74) = M1(2,2); M2(80,87) = M1(2,15); M2(80,88) = M1(2,16); M2(80,89) = M1(2,17); M2(80,90) = M1(2,18); M2(80,91) = M1(2,19); M2(80,92) = M1(2,20); M2(80,94) = M1(2,21); M2(80,95) = M1(2,22); M2(80,96) = M1(2,23); M2(80,97) = M1(2,24); M2(80,98) = M1(2,25); M2(80,99) = M1(2,26); M2(80,100) = M1(2,27); M2(80,101) = M1(2,28); M2(80,102) = M1(2,29); M2(80,103) = M1(2,30); M2(80,104) = M1(2,31); M2(80,105) = M1(2,32); M2(80,106) = M1(2,33); M2(80,107) = M1(2,34); M2(80,108) = M1(2,35); M2(80,109) = M1(2,36); M2(80,110) = M1(2,37); M2(80,111) = M1(2,38); M2(80,112) = M1(2,39); M2(80,113) = M1(2,40); M2(80,114) = M1(2,41); M2(80,115) = M1(2,42); M2(80,116) = M1(2,43); M2(80,117) = M1(2,44); M2(80,118) = M1(2,45); M2(80,119) = M1(2,46); M2(80,120) = M1(2,47); M2(80,121) = M1(2,48); M2(80,122) = M1(2,49); M2(80,123) = M1(2,50); M2(80,124) = M1(2,51); M2(80,125) = M1(2,52); M2(80,126) = M1(2,53); M2(80,127) = M1(2,54); M2(80,128) = M1(2,55); M2(80,129) = M1(2,56); M2(80,130) = M1(2,57); M2(80,131) = M1(2,58); M2(80,132) = M1(2,59); M2(80,133) = M1(2,60); M2(80,134) = M1(2,61); M2(80,135) = M1(2,62); M2(80,136) = M1(2,63); M2(80,137) = M1(2,64); M2(80,138) = M1(2,65); M2(80,139) = M1(2,66); M2(80,140) = M1(2,67); M2(80,141) = M1(2,68); M2(80,142) = M1(2,69); M2(80,143) = M1(2,70); M2(80,144) = M1(2,71); M2(80,145) = M1(2,72); M2(80,146) = M1(2,73); M2(80,147) = M1(2,74); M2(80,148) = M1(2,75); M2(80,149) = M1(2,76); M2(80,150) = M1(2,77); M2(80,151) = M1(2,78); M2(80,152) = M1(2,79); M2(80,153) = M1(2,80); M2(80,154) = M1(2,81); M2(80,155) = M1(2,82); M2(80,156) = M1(2,83); 
M2(81,75) = M1(3,3); M2(81,87) = M1(3,15); M2(81,88) = M1(3,16); M2(81,89) = M1(3,17); M2(81,90) = M1(3,18); M2(81,91) = M1(3,19); M2(81,92) = M1(3,20); M2(81,94) = M1(3,21); M2(81,95) = M1(3,22); M2(81,96) = M1(3,23); M2(81,97) = M1(3,24); M2(81,98) = M1(3,25); M2(81,99) = M1(3,26); M2(81,100) = M1(3,27); M2(81,101) = M1(3,28); M2(81,102) = M1(3,29); M2(81,103) = M1(3,30); M2(81,104) = M1(3,31); M2(81,105) = M1(3,32); M2(81,106) = M1(3,33); M2(81,107) = M1(3,34); M2(81,108) = M1(3,35); M2(81,109) = M1(3,36); M2(81,110) = M1(3,37); M2(81,111) = M1(3,38); M2(81,112) = M1(3,39); M2(81,113) = M1(3,40); M2(81,114) = M1(3,41); M2(81,115) = M1(3,42); M2(81,116) = M1(3,43); M2(81,117) = M1(3,44); M2(81,118) = M1(3,45); M2(81,119) = M1(3,46); M2(81,120) = M1(3,47); M2(81,121) = M1(3,48); M2(81,122) = M1(3,49); M2(81,123) = M1(3,50); M2(81,124) = M1(3,51); M2(81,125) = M1(3,52); M2(81,126) = M1(3,53); M2(81,127) = M1(3,54); M2(81,128) = M1(3,55); M2(81,129) = M1(3,56); M2(81,130) = M1(3,57); M2(81,131) = M1(3,58); M2(81,132) = M1(3,59); M2(81,133) = M1(3,60); M2(81,134) = M1(3,61); M2(81,135) = M1(3,62); M2(81,136) = M1(3,63); M2(81,137) = M1(3,64); M2(81,138) = M1(3,65); M2(81,139) = M1(3,66); M2(81,140) = M1(3,67); M2(81,141) = M1(3,68); M2(81,142) = M1(3,69); M2(81,143) = M1(3,70); M2(81,144) = M1(3,71); M2(81,145) = M1(3,72); M2(81,146) = M1(3,73); M2(81,147) = M1(3,74); M2(81,148) = M1(3,75); M2(81,149) = M1(3,76); M2(81,150) = M1(3,77); M2(81,151) = M1(3,78); M2(81,152) = M1(3,79); M2(81,153) = M1(3,80); M2(81,154) = M1(3,81); M2(81,155) = M1(3,82); M2(81,156) = M1(3,83); 
M2(82,76) = M1(4,4); M2(82,87) = M1(4,15); M2(82,88) = M1(4,16); M2(82,89) = M1(4,17); M2(82,90) = M1(4,18); M2(82,91) = M1(4,19); M2(82,92) = M1(4,20); M2(82,94) = M1(4,21); M2(82,95) = M1(4,22); M2(82,96) = M1(4,23); M2(82,97) = M1(4,24); M2(82,98) = M1(4,25); M2(82,99) = M1(4,26); M2(82,100) = M1(4,27); M2(82,101) = M1(4,28); M2(82,102) = M1(4,29); M2(82,103) = M1(4,30); M2(82,104) = M1(4,31); M2(82,105) = M1(4,32); M2(82,106) = M1(4,33); M2(82,107) = M1(4,34); M2(82,108) = M1(4,35); M2(82,109) = M1(4,36); M2(82,110) = M1(4,37); M2(82,111) = M1(4,38); M2(82,112) = M1(4,39); M2(82,113) = M1(4,40); M2(82,114) = M1(4,41); M2(82,115) = M1(4,42); M2(82,116) = M1(4,43); M2(82,117) = M1(4,44); M2(82,118) = M1(4,45); M2(82,119) = M1(4,46); M2(82,120) = M1(4,47); M2(82,121) = M1(4,48); M2(82,122) = M1(4,49); M2(82,123) = M1(4,50); M2(82,124) = M1(4,51); M2(82,125) = M1(4,52); M2(82,126) = M1(4,53); M2(82,127) = M1(4,54); M2(82,128) = M1(4,55); M2(82,129) = M1(4,56); M2(82,130) = M1(4,57); M2(82,131) = M1(4,58); M2(82,132) = M1(4,59); M2(82,133) = M1(4,60); M2(82,134) = M1(4,61); M2(82,135) = M1(4,62); M2(82,136) = M1(4,63); M2(82,137) = M1(4,64); M2(82,138) = M1(4,65); M2(82,139) = M1(4,66); M2(82,140) = M1(4,67); M2(82,141) = M1(4,68); M2(82,142) = M1(4,69); M2(82,143) = M1(4,70); M2(82,144) = M1(4,71); M2(82,145) = M1(4,72); M2(82,146) = M1(4,73); M2(82,147) = M1(4,74); M2(82,148) = M1(4,75); M2(82,149) = M1(4,76); M2(82,150) = M1(4,77); M2(82,151) = M1(4,78); M2(82,152) = M1(4,79); M2(82,153) = M1(4,80); M2(82,154) = M1(4,81); M2(82,155) = M1(4,82); M2(82,156) = M1(4,83); 
M2(83,77) = M1(5,5); M2(83,87) = M1(5,15); M2(83,88) = M1(5,16); M2(83,89) = M1(5,17); M2(83,90) = M1(5,18); M2(83,91) = M1(5,19); M2(83,92) = M1(5,20); M2(83,94) = M1(5,21); M2(83,95) = M1(5,22); M2(83,96) = M1(5,23); M2(83,97) = M1(5,24); M2(83,98) = M1(5,25); M2(83,99) = M1(5,26); M2(83,100) = M1(5,27); M2(83,101) = M1(5,28); M2(83,102) = M1(5,29); M2(83,103) = M1(5,30); M2(83,104) = M1(5,31); M2(83,105) = M1(5,32); M2(83,106) = M1(5,33); M2(83,107) = M1(5,34); M2(83,108) = M1(5,35); M2(83,109) = M1(5,36); M2(83,110) = M1(5,37); M2(83,111) = M1(5,38); M2(83,112) = M1(5,39); M2(83,113) = M1(5,40); M2(83,114) = M1(5,41); M2(83,115) = M1(5,42); M2(83,116) = M1(5,43); M2(83,117) = M1(5,44); M2(83,118) = M1(5,45); M2(83,119) = M1(5,46); M2(83,120) = M1(5,47); M2(83,121) = M1(5,48); M2(83,122) = M1(5,49); M2(83,123) = M1(5,50); M2(83,124) = M1(5,51); M2(83,125) = M1(5,52); M2(83,126) = M1(5,53); M2(83,127) = M1(5,54); M2(83,128) = M1(5,55); M2(83,129) = M1(5,56); M2(83,130) = M1(5,57); M2(83,131) = M1(5,58); M2(83,132) = M1(5,59); M2(83,133) = M1(5,60); M2(83,134) = M1(5,61); M2(83,135) = M1(5,62); M2(83,136) = M1(5,63); M2(83,137) = M1(5,64); M2(83,138) = M1(5,65); M2(83,139) = M1(5,66); M2(83,140) = M1(5,67); M2(83,141) = M1(5,68); M2(83,142) = M1(5,69); M2(83,143) = M1(5,70); M2(83,144) = M1(5,71); M2(83,145) = M1(5,72); M2(83,146) = M1(5,73); M2(83,147) = M1(5,74); M2(83,148) = M1(5,75); M2(83,149) = M1(5,76); M2(83,150) = M1(5,77); M2(83,151) = M1(5,78); M2(83,152) = M1(5,79); M2(83,153) = M1(5,80); M2(83,154) = M1(5,81); M2(83,155) = M1(5,82); M2(83,156) = M1(5,83); 
M2(84,78) = M1(6,6); M2(84,87) = M1(6,15); M2(84,88) = M1(6,16); M2(84,89) = M1(6,17); M2(84,90) = M1(6,18); M2(84,91) = M1(6,19); M2(84,92) = M1(6,20); M2(84,94) = M1(6,21); M2(84,95) = M1(6,22); M2(84,96) = M1(6,23); M2(84,97) = M1(6,24); M2(84,98) = M1(6,25); M2(84,99) = M1(6,26); M2(84,100) = M1(6,27); M2(84,101) = M1(6,28); M2(84,102) = M1(6,29); M2(84,103) = M1(6,30); M2(84,104) = M1(6,31); M2(84,105) = M1(6,32); M2(84,106) = M1(6,33); M2(84,107) = M1(6,34); M2(84,108) = M1(6,35); M2(84,109) = M1(6,36); M2(84,110) = M1(6,37); M2(84,111) = M1(6,38); M2(84,112) = M1(6,39); M2(84,113) = M1(6,40); M2(84,114) = M1(6,41); M2(84,115) = M1(6,42); M2(84,116) = M1(6,43); M2(84,117) = M1(6,44); M2(84,118) = M1(6,45); M2(84,119) = M1(6,46); M2(84,120) = M1(6,47); M2(84,121) = M1(6,48); M2(84,122) = M1(6,49); M2(84,123) = M1(6,50); M2(84,124) = M1(6,51); M2(84,125) = M1(6,52); M2(84,126) = M1(6,53); M2(84,127) = M1(6,54); M2(84,128) = M1(6,55); M2(84,129) = M1(6,56); M2(84,130) = M1(6,57); M2(84,131) = M1(6,58); M2(84,132) = M1(6,59); M2(84,133) = M1(6,60); M2(84,134) = M1(6,61); M2(84,135) = M1(6,62); M2(84,136) = M1(6,63); M2(84,137) = M1(6,64); M2(84,138) = M1(6,65); M2(84,139) = M1(6,66); M2(84,140) = M1(6,67); M2(84,141) = M1(6,68); M2(84,142) = M1(6,69); M2(84,143) = M1(6,70); M2(84,144) = M1(6,71); M2(84,145) = M1(6,72); M2(84,146) = M1(6,73); M2(84,147) = M1(6,74); M2(84,148) = M1(6,75); M2(84,149) = M1(6,76); M2(84,150) = M1(6,77); M2(84,151) = M1(6,78); M2(84,152) = M1(6,79); M2(84,153) = M1(6,80); M2(84,154) = M1(6,81); M2(84,155) = M1(6,82); M2(84,156) = M1(6,83); 
M2(85,79) = M1(7,7); M2(85,87) = M1(7,15); M2(85,88) = M1(7,16); M2(85,89) = M1(7,17); M2(85,90) = M1(7,18); M2(85,91) = M1(7,19); M2(85,92) = M1(7,20); M2(85,94) = M1(7,21); M2(85,95) = M1(7,22); M2(85,96) = M1(7,23); M2(85,97) = M1(7,24); M2(85,98) = M1(7,25); M2(85,99) = M1(7,26); M2(85,100) = M1(7,27); M2(85,101) = M1(7,28); M2(85,102) = M1(7,29); M2(85,103) = M1(7,30); M2(85,104) = M1(7,31); M2(85,105) = M1(7,32); M2(85,106) = M1(7,33); M2(85,107) = M1(7,34); M2(85,108) = M1(7,35); M2(85,109) = M1(7,36); M2(85,110) = M1(7,37); M2(85,111) = M1(7,38); M2(85,112) = M1(7,39); M2(85,113) = M1(7,40); M2(85,114) = M1(7,41); M2(85,115) = M1(7,42); M2(85,116) = M1(7,43); M2(85,117) = M1(7,44); M2(85,118) = M1(7,45); M2(85,119) = M1(7,46); M2(85,120) = M1(7,47); M2(85,121) = M1(7,48); M2(85,122) = M1(7,49); M2(85,123) = M1(7,50); M2(85,124) = M1(7,51); M2(85,125) = M1(7,52); M2(85,126) = M1(7,53); M2(85,127) = M1(7,54); M2(85,128) = M1(7,55); M2(85,129) = M1(7,56); M2(85,130) = M1(7,57); M2(85,131) = M1(7,58); M2(85,132) = M1(7,59); M2(85,133) = M1(7,60); M2(85,134) = M1(7,61); M2(85,135) = M1(7,62); M2(85,136) = M1(7,63); M2(85,137) = M1(7,64); M2(85,138) = M1(7,65); M2(85,139) = M1(7,66); M2(85,140) = M1(7,67); M2(85,141) = M1(7,68); M2(85,142) = M1(7,69); M2(85,143) = M1(7,70); M2(85,144) = M1(7,71); M2(85,145) = M1(7,72); M2(85,146) = M1(7,73); M2(85,147) = M1(7,74); M2(85,148) = M1(7,75); M2(85,149) = M1(7,76); M2(85,150) = M1(7,77); M2(85,151) = M1(7,78); M2(85,152) = M1(7,79); M2(85,153) = M1(7,80); M2(85,154) = M1(7,81); M2(85,155) = M1(7,82); M2(85,156) = M1(7,83); 
M2(86,80) = M1(8,8); M2(86,87) = M1(8,15); M2(86,88) = M1(8,16); M2(86,89) = M1(8,17); M2(86,90) = M1(8,18); M2(86,91) = M1(8,19); M2(86,92) = M1(8,20); M2(86,94) = M1(8,21); M2(86,95) = M1(8,22); M2(86,96) = M1(8,23); M2(86,97) = M1(8,24); M2(86,98) = M1(8,25); M2(86,99) = M1(8,26); M2(86,100) = M1(8,27); M2(86,101) = M1(8,28); M2(86,102) = M1(8,29); M2(86,103) = M1(8,30); M2(86,104) = M1(8,31); M2(86,105) = M1(8,32); M2(86,106) = M1(8,33); M2(86,107) = M1(8,34); M2(86,108) = M1(8,35); M2(86,109) = M1(8,36); M2(86,110) = M1(8,37); M2(86,111) = M1(8,38); M2(86,112) = M1(8,39); M2(86,113) = M1(8,40); M2(86,114) = M1(8,41); M2(86,115) = M1(8,42); M2(86,116) = M1(8,43); M2(86,117) = M1(8,44); M2(86,118) = M1(8,45); M2(86,119) = M1(8,46); M2(86,120) = M1(8,47); M2(86,121) = M1(8,48); M2(86,122) = M1(8,49); M2(86,123) = M1(8,50); M2(86,124) = M1(8,51); M2(86,125) = M1(8,52); M2(86,126) = M1(8,53); M2(86,127) = M1(8,54); M2(86,128) = M1(8,55); M2(86,129) = M1(8,56); M2(86,130) = M1(8,57); M2(86,131) = M1(8,58); M2(86,132) = M1(8,59); M2(86,133) = M1(8,60); M2(86,134) = M1(8,61); M2(86,135) = M1(8,62); M2(86,136) = M1(8,63); M2(86,137) = M1(8,64); M2(86,138) = M1(8,65); M2(86,139) = M1(8,66); M2(86,140) = M1(8,67); M2(86,141) = M1(8,68); M2(86,142) = M1(8,69); M2(86,143) = M1(8,70); M2(86,144) = M1(8,71); M2(86,145) = M1(8,72); M2(86,146) = M1(8,73); M2(86,147) = M1(8,74); M2(86,148) = M1(8,75); M2(86,149) = M1(8,76); M2(86,150) = M1(8,77); M2(86,151) = M1(8,78); M2(86,152) = M1(8,79); M2(86,153) = M1(8,80); M2(86,154) = M1(8,81); M2(86,155) = M1(8,82); M2(86,156) = M1(8,83); 
M2(87,81) = M1(9,9); M2(87,87) = M1(9,15); M2(87,88) = M1(9,16); M2(87,89) = M1(9,17); M2(87,90) = M1(9,18); M2(87,91) = M1(9,19); M2(87,92) = M1(9,20); M2(87,94) = M1(9,21); M2(87,95) = M1(9,22); M2(87,96) = M1(9,23); M2(87,97) = M1(9,24); M2(87,98) = M1(9,25); M2(87,99) = M1(9,26); M2(87,100) = M1(9,27); M2(87,101) = M1(9,28); M2(87,102) = M1(9,29); M2(87,103) = M1(9,30); M2(87,104) = M1(9,31); M2(87,105) = M1(9,32); M2(87,106) = M1(9,33); M2(87,107) = M1(9,34); M2(87,108) = M1(9,35); M2(87,109) = M1(9,36); M2(87,110) = M1(9,37); M2(87,111) = M1(9,38); M2(87,112) = M1(9,39); M2(87,113) = M1(9,40); M2(87,114) = M1(9,41); M2(87,115) = M1(9,42); M2(87,116) = M1(9,43); M2(87,117) = M1(9,44); M2(87,118) = M1(9,45); M2(87,119) = M1(9,46); M2(87,120) = M1(9,47); M2(87,121) = M1(9,48); M2(87,122) = M1(9,49); M2(87,123) = M1(9,50); M2(87,124) = M1(9,51); M2(87,125) = M1(9,52); M2(87,126) = M1(9,53); M2(87,127) = M1(9,54); M2(87,128) = M1(9,55); M2(87,129) = M1(9,56); M2(87,130) = M1(9,57); M2(87,131) = M1(9,58); M2(87,132) = M1(9,59); M2(87,133) = M1(9,60); M2(87,134) = M1(9,61); M2(87,135) = M1(9,62); M2(87,136) = M1(9,63); M2(87,137) = M1(9,64); M2(87,138) = M1(9,65); M2(87,139) = M1(9,66); M2(87,140) = M1(9,67); M2(87,141) = M1(9,68); M2(87,142) = M1(9,69); M2(87,143) = M1(9,70); M2(87,144) = M1(9,71); M2(87,145) = M1(9,72); M2(87,146) = M1(9,73); M2(87,147) = M1(9,74); M2(87,148) = M1(9,75); M2(87,149) = M1(9,76); M2(87,150) = M1(9,77); M2(87,151) = M1(9,78); M2(87,152) = M1(9,79); M2(87,153) = M1(9,80); M2(87,154) = M1(9,81); M2(87,155) = M1(9,82); M2(87,156) = M1(9,83); 
M2(88,82) = M1(10,10); M2(88,87) = M1(10,15); M2(88,88) = M1(10,16); M2(88,89) = M1(10,17); M2(88,90) = M1(10,18); M2(88,91) = M1(10,19); M2(88,92) = M1(10,20); M2(88,94) = M1(10,21); M2(88,95) = M1(10,22); M2(88,96) = M1(10,23); M2(88,97) = M1(10,24); M2(88,98) = M1(10,25); M2(88,99) = M1(10,26); M2(88,100) = M1(10,27); M2(88,101) = M1(10,28); M2(88,102) = M1(10,29); M2(88,103) = M1(10,30); M2(88,104) = M1(10,31); M2(88,105) = M1(10,32); M2(88,106) = M1(10,33); M2(88,107) = M1(10,34); M2(88,108) = M1(10,35); M2(88,109) = M1(10,36); M2(88,110) = M1(10,37); M2(88,111) = M1(10,38); M2(88,112) = M1(10,39); M2(88,113) = M1(10,40); M2(88,114) = M1(10,41); M2(88,115) = M1(10,42); M2(88,116) = M1(10,43); M2(88,117) = M1(10,44); M2(88,118) = M1(10,45); M2(88,119) = M1(10,46); M2(88,120) = M1(10,47); M2(88,121) = M1(10,48); M2(88,122) = M1(10,49); M2(88,123) = M1(10,50); M2(88,124) = M1(10,51); M2(88,125) = M1(10,52); M2(88,126) = M1(10,53); M2(88,127) = M1(10,54); M2(88,128) = M1(10,55); M2(88,129) = M1(10,56); M2(88,130) = M1(10,57); M2(88,131) = M1(10,58); M2(88,132) = M1(10,59); M2(88,133) = M1(10,60); M2(88,134) = M1(10,61); M2(88,135) = M1(10,62); M2(88,136) = M1(10,63); M2(88,137) = M1(10,64); M2(88,138) = M1(10,65); M2(88,139) = M1(10,66); M2(88,140) = M1(10,67); M2(88,141) = M1(10,68); M2(88,142) = M1(10,69); M2(88,143) = M1(10,70); M2(88,144) = M1(10,71); M2(88,145) = M1(10,72); M2(88,146) = M1(10,73); M2(88,147) = M1(10,74); M2(88,148) = M1(10,75); M2(88,149) = M1(10,76); M2(88,150) = M1(10,77); M2(88,151) = M1(10,78); M2(88,152) = M1(10,79); M2(88,153) = M1(10,80); M2(88,154) = M1(10,81); M2(88,155) = M1(10,82); M2(88,156) = M1(10,83); 
M2(89,83) = M1(11,11); M2(89,87) = M1(11,15); M2(89,88) = M1(11,16); M2(89,89) = M1(11,17); M2(89,90) = M1(11,18); M2(89,91) = M1(11,19); M2(89,92) = M1(11,20); M2(89,94) = M1(11,21); M2(89,95) = M1(11,22); M2(89,96) = M1(11,23); M2(89,97) = M1(11,24); M2(89,98) = M1(11,25); M2(89,99) = M1(11,26); M2(89,100) = M1(11,27); M2(89,101) = M1(11,28); M2(89,102) = M1(11,29); M2(89,103) = M1(11,30); M2(89,104) = M1(11,31); M2(89,105) = M1(11,32); M2(89,106) = M1(11,33); M2(89,107) = M1(11,34); M2(89,108) = M1(11,35); M2(89,109) = M1(11,36); M2(89,110) = M1(11,37); M2(89,111) = M1(11,38); M2(89,112) = M1(11,39); M2(89,113) = M1(11,40); M2(89,114) = M1(11,41); M2(89,115) = M1(11,42); M2(89,116) = M1(11,43); M2(89,117) = M1(11,44); M2(89,118) = M1(11,45); M2(89,119) = M1(11,46); M2(89,120) = M1(11,47); M2(89,121) = M1(11,48); M2(89,122) = M1(11,49); M2(89,123) = M1(11,50); M2(89,124) = M1(11,51); M2(89,125) = M1(11,52); M2(89,126) = M1(11,53); M2(89,127) = M1(11,54); M2(89,128) = M1(11,55); M2(89,129) = M1(11,56); M2(89,130) = M1(11,57); M2(89,131) = M1(11,58); M2(89,132) = M1(11,59); M2(89,133) = M1(11,60); M2(89,134) = M1(11,61); M2(89,135) = M1(11,62); M2(89,136) = M1(11,63); M2(89,137) = M1(11,64); M2(89,138) = M1(11,65); M2(89,139) = M1(11,66); M2(89,140) = M1(11,67); M2(89,141) = M1(11,68); M2(89,142) = M1(11,69); M2(89,143) = M1(11,70); M2(89,144) = M1(11,71); M2(89,145) = M1(11,72); M2(89,146) = M1(11,73); M2(89,147) = M1(11,74); M2(89,148) = M1(11,75); M2(89,149) = M1(11,76); M2(89,150) = M1(11,77); M2(89,151) = M1(11,78); M2(89,152) = M1(11,79); M2(89,153) = M1(11,80); M2(89,154) = M1(11,81); M2(89,155) = M1(11,82); M2(89,156) = M1(11,83); 
M2(90,84) = M1(12,12); M2(90,87) = M1(12,15); M2(90,88) = M1(12,16); M2(90,89) = M1(12,17); M2(90,90) = M1(12,18); M2(90,91) = M1(12,19); M2(90,92) = M1(12,20); M2(90,94) = M1(12,21); M2(90,95) = M1(12,22); M2(90,96) = M1(12,23); M2(90,97) = M1(12,24); M2(90,98) = M1(12,25); M2(90,99) = M1(12,26); M2(90,100) = M1(12,27); M2(90,101) = M1(12,28); M2(90,102) = M1(12,29); M2(90,103) = M1(12,30); M2(90,104) = M1(12,31); M2(90,105) = M1(12,32); M2(90,106) = M1(12,33); M2(90,107) = M1(12,34); M2(90,108) = M1(12,35); M2(90,109) = M1(12,36); M2(90,110) = M1(12,37); M2(90,111) = M1(12,38); M2(90,112) = M1(12,39); M2(90,113) = M1(12,40); M2(90,114) = M1(12,41); M2(90,115) = M1(12,42); M2(90,116) = M1(12,43); M2(90,117) = M1(12,44); M2(90,118) = M1(12,45); M2(90,119) = M1(12,46); M2(90,120) = M1(12,47); M2(90,121) = M1(12,48); M2(90,122) = M1(12,49); M2(90,123) = M1(12,50); M2(90,124) = M1(12,51); M2(90,125) = M1(12,52); M2(90,126) = M1(12,53); M2(90,127) = M1(12,54); M2(90,128) = M1(12,55); M2(90,129) = M1(12,56); M2(90,130) = M1(12,57); M2(90,131) = M1(12,58); M2(90,132) = M1(12,59); M2(90,133) = M1(12,60); M2(90,134) = M1(12,61); M2(90,135) = M1(12,62); M2(90,136) = M1(12,63); M2(90,137) = M1(12,64); M2(90,138) = M1(12,65); M2(90,139) = M1(12,66); M2(90,140) = M1(12,67); M2(90,141) = M1(12,68); M2(90,142) = M1(12,69); M2(90,143) = M1(12,70); M2(90,144) = M1(12,71); M2(90,145) = M1(12,72); M2(90,146) = M1(12,73); M2(90,147) = M1(12,74); M2(90,148) = M1(12,75); M2(90,149) = M1(12,76); M2(90,150) = M1(12,77); M2(90,151) = M1(12,78); M2(90,152) = M1(12,79); M2(90,153) = M1(12,80); M2(90,154) = M1(12,81); M2(90,155) = M1(12,82); M2(90,156) = M1(12,83); 
M2(91,85) = M1(13,13); M2(91,87) = M1(13,15); M2(91,88) = M1(13,16); M2(91,89) = M1(13,17); M2(91,90) = M1(13,18); M2(91,91) = M1(13,19); M2(91,92) = M1(13,20); M2(91,94) = M1(13,21); M2(91,95) = M1(13,22); M2(91,96) = M1(13,23); M2(91,97) = M1(13,24); M2(91,98) = M1(13,25); M2(91,99) = M1(13,26); M2(91,100) = M1(13,27); M2(91,101) = M1(13,28); M2(91,102) = M1(13,29); M2(91,103) = M1(13,30); M2(91,104) = M1(13,31); M2(91,105) = M1(13,32); M2(91,106) = M1(13,33); M2(91,107) = M1(13,34); M2(91,108) = M1(13,35); M2(91,109) = M1(13,36); M2(91,110) = M1(13,37); M2(91,111) = M1(13,38); M2(91,112) = M1(13,39); M2(91,113) = M1(13,40); M2(91,114) = M1(13,41); M2(91,115) = M1(13,42); M2(91,116) = M1(13,43); M2(91,117) = M1(13,44); M2(91,118) = M1(13,45); M2(91,119) = M1(13,46); M2(91,120) = M1(13,47); M2(91,121) = M1(13,48); M2(91,122) = M1(13,49); M2(91,123) = M1(13,50); M2(91,124) = M1(13,51); M2(91,125) = M1(13,52); M2(91,126) = M1(13,53); M2(91,127) = M1(13,54); M2(91,128) = M1(13,55); M2(91,129) = M1(13,56); M2(91,130) = M1(13,57); M2(91,131) = M1(13,58); M2(91,132) = M1(13,59); M2(91,133) = M1(13,60); M2(91,134) = M1(13,61); M2(91,135) = M1(13,62); M2(91,136) = M1(13,63); M2(91,137) = M1(13,64); M2(91,138) = M1(13,65); M2(91,139) = M1(13,66); M2(91,140) = M1(13,67); M2(91,141) = M1(13,68); M2(91,142) = M1(13,69); M2(91,143) = M1(13,70); M2(91,144) = M1(13,71); M2(91,145) = M1(13,72); M2(91,146) = M1(13,73); M2(91,147) = M1(13,74); M2(91,148) = M1(13,75); M2(91,149) = M1(13,76); M2(91,150) = M1(13,77); M2(91,151) = M1(13,78); M2(91,152) = M1(13,79); M2(91,153) = M1(13,80); M2(91,154) = M1(13,81); M2(91,155) = M1(13,82); M2(91,156) = M1(13,83); 
M2(92,86) = M1(14,14); M2(92,87) = M1(14,15); M2(92,88) = M1(14,16); M2(92,89) = M1(14,17); M2(92,90) = M1(14,18); M2(92,91) = M1(14,19); M2(92,92) = M1(14,20); M2(92,94) = M1(14,21); M2(92,95) = M1(14,22); M2(92,96) = M1(14,23); M2(92,97) = M1(14,24); M2(92,98) = M1(14,25); M2(92,99) = M1(14,26); M2(92,100) = M1(14,27); M2(92,101) = M1(14,28); M2(92,102) = M1(14,29); M2(92,103) = M1(14,30); M2(92,104) = M1(14,31); M2(92,105) = M1(14,32); M2(92,106) = M1(14,33); M2(92,107) = M1(14,34); M2(92,108) = M1(14,35); M2(92,109) = M1(14,36); M2(92,110) = M1(14,37); M2(92,111) = M1(14,38); M2(92,112) = M1(14,39); M2(92,113) = M1(14,40); M2(92,114) = M1(14,41); M2(92,115) = M1(14,42); M2(92,116) = M1(14,43); M2(92,117) = M1(14,44); M2(92,118) = M1(14,45); M2(92,119) = M1(14,46); M2(92,120) = M1(14,47); M2(92,121) = M1(14,48); M2(92,122) = M1(14,49); M2(92,123) = M1(14,50); M2(92,124) = M1(14,51); M2(92,125) = M1(14,52); M2(92,126) = M1(14,53); M2(92,127) = M1(14,54); M2(92,128) = M1(14,55); M2(92,129) = M1(14,56); M2(92,130) = M1(14,57); M2(92,131) = M1(14,58); M2(92,132) = M1(14,59); M2(92,133) = M1(14,60); M2(92,134) = M1(14,61); M2(92,135) = M1(14,62); M2(92,136) = M1(14,63); M2(92,137) = M1(14,64); M2(92,138) = M1(14,65); M2(92,139) = M1(14,66); M2(92,140) = M1(14,67); M2(92,141) = M1(14,68); M2(92,142) = M1(14,69); M2(92,143) = M1(14,70); M2(92,144) = M1(14,71); M2(92,145) = M1(14,72); M2(92,146) = M1(14,73); M2(92,147) = M1(14,74); M2(92,148) = M1(14,75); M2(92,149) = M1(14,76); M2(92,150) = M1(14,77); M2(92,151) = M1(14,78); M2(92,152) = M1(14,79); M2(92,153) = M1(14,80); M2(92,154) = M1(14,81); M2(92,155) = M1(14,82); M2(92,156) = M1(14,83); 

Eigen::PartialPivLU< Eigen::Matrix<floatPrec,93,93> > lu(M2.template block<93,93>(0,0));
Eigen::Matrix<floatPrec,93,64> M3 = lu.solve(M2.template block<93,64>(0,93));
Action = Eigen::Matrix<floatPrec,64,64>::Zero();
Action.row(0) -= M3.template block<1,64>(36,0);
Action.row(1) -= M3.template block<1,64>(66,0);
Action.row(2) -= M3.template block<1,64>(67,0);
Action.row(3) -= M3.template block<1,64>(68,0);
Action.row(4) -= M3.template block<1,64>(69,0);
Action.row(5) -= M3.template block<1,64>(70,0);
Action.row(6) -= M3.template block<1,64>(71,0);
Action(7,0) = 1.0;
Action.row(8) -= M3.template block<1,64>(79,0);
Action.row(9) -= M3.template block<1,64>(80,0);
Action.row(10) -= M3.template block<1,64>(81,0);
Action.row(11) -= M3.template block<1,64>(82,0);
Action.row(12) -= M3.template block<1,64>(83,0);
Action.row(13) -= M3.template block<1,64>(84,0);
Action.row(14) -= M3.template block<1,64>(85,0);
Action.row(15) -= M3.template block<1,64>(86,0);
Action.row(16) -= M3.template block<1,64>(87,0);
Action.row(17) -= M3.template block<1,64>(88,0);
Action.row(18) -= M3.template block<1,64>(89,0);
Action.row(19) -= M3.template block<1,64>(90,0);
Action.row(20) -= M3.template block<1,64>(91,0);
Action.row(21) -= M3.template block<1,64>(92,0);
Action(22,1) = 1.0;
Action(23,2) = 1.0;
Action(24,3) = 1.0;
Action(25,4) = 1.0;
Action(26,5) = 1.0;
Action(27,6) = 1.0;
Action(28,7) = 1.0;
Action(29,14) = 1.0;
Action(30,15) = 1.0;
Action(31,16) = 1.0;
Action(32,17) = 1.0;
Action(33,18) = 1.0;
Action(34,19) = 1.0;
Action(35,20) = 1.0;
Action(36,21) = 1.0;
Action(37,22) = 1.0;
Action(38,23) = 1.0;
Action(39,24) = 1.0;
Action(40,25) = 1.0;
Action(41,26) = 1.0;
Action(42,27) = 1.0;
Action(43,28) = 1.0;
Action(44,34) = 1.0;
Action(45,35) = 1.0;
Action(46,36) = 1.0;
Action(47,37) = 1.0;
Action(48,38) = 1.0;
Action(49,39) = 1.0;
Action(50,40) = 1.0;
Action(51,41) = 1.0;
Action(52,42) = 1.0;
Action(53,43) = 1.0;
Action(54,48) = 1.0;
Action(55,49) = 1.0;
Action(56,50) = 1.0;
Action(57,51) = 1.0;
Action(58,52) = 1.0;
Action(59,53) = 1.0;
Action(60,57) = 1.0;
Action(61,58) = 1.0;
Action(62,59) = 1.0;
Action(63,62) = 1.0;
//columns of Action mean:
// x_3^7 x_2^3*x_3^3 x_1^2*x_3^4 x_1*x_2*x_3^4 x_2^2*x_3^4 x_1*x_3^5 x_2*x_3^5 x_3^6 x_1^5 x_1^4*x_2 x_1^3*x_2^2 x_1^2*x_2^3 x_1*x_2^4 x_2^5 x_1^4*x_3 x_1^3*x_2*x_3 x_1^2*x_2^2*x_3 x_1*x_2^3*x_3 x_2^4*x_3 x_1^3*x_3^2 x_1^2*x_2*x_3^2 x_1*x_2^2*x_3^2 x_2^3*x_3^2 x_1^2*x_3^3 x_1*x_2*x_3^3 x_2^2*x_3^3 x_1*x_3^4 x_2*x_3^4 x_3^5 x_1^4 x_1^3*x_2 x_1^2*x_2^2 x_1*x_2^3 x_2^4 x_1^3*x_3 x_1^2*x_2*x_3 x_1*x_2^2*x_3 x_2^3*x_3 x_1^2*x_3^2 x_1*x_2*x_3^2 x_2^2*x_3^2 x_1*x_3^3 x_2*x_3^3 x_3^4 x_1^3 x_1^2*x_2 x_1*x_2^2 x_2^3 x_1^2*x_3 x_1*x_2*x_3 x_2^2*x_3 x_1*x_3^2 x_2*x_3^2 x_3^3 x_1^2 x_1*x_2 x_2^2 x_1*x_3 x_2*x_3 x_3^2 x_1 x_2 x_3 1
}